

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::Li
          (VolPathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Transform *this_00;
  undefined1 *puVar1;
  Vector3f *pVVar2;
  long lVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 uVar13;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [32];
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Tuple2<pbrt::Point2,_float> TVar20;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  pointer pLVar21;
  uintptr_t uVar22;
  size_t sVar23;
  bool bVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined8 uVar70;
  LightSampleContext LVar71;
  LightSampleContext LVar72;
  LightSampleContext LVar73;
  LightSampleContext LVar74;
  undefined1 auVar75 [24];
  undefined1 auVar76 [40];
  undefined1 auVar77 [48];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [48];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  Interval<float> IVar88;
  uint64_t uVar89;
  Interval<float> IVar90;
  Interval<float> IVar91;
  optional<pbrt::MediumInteraction> *poVar92;
  undefined4 uVar93;
  undefined8 *puVar94;
  undefined8 *puVar95;
  int i;
  uint uVar96;
  undefined4 extraout_var;
  ulong uVar97;
  BSSRDFProbeSegment *pBVar98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar99;
  BSSRDFAdapter *bxdf;
  byte bVar100;
  ulong uVar101;
  SampledWavelengths *pSVar102;
  float *pfVar103;
  DenselySampledSpectrum *this_01;
  DebugMLTSampler *pDVar104;
  ExhaustiveLightSampler *pEVar105;
  size_t *psVar106;
  long lVar107;
  BSDF *pBVar108;
  undefined4 *puVar109;
  Interval<float> *pIVar110;
  uint64_t oldstate;
  pointer pLVar111;
  PrimitiveHandle *this_02;
  float fVar112;
  long in_FS_OFFSET;
  bool bVar113;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar114;
  int iVar115;
  undefined1 auVar121 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  Float m;
  Float FVar138;
  float fVar139;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> i_05;
  Interval<float> IVar141;
  Interval<float> i_06;
  Interval<float> i_07;
  float fVar140;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar206;
  undefined1 auVar144 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar208 [56];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined8 uVar207;
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  float extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd_05;
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  float extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd_06;
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  float extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 auVar205 [64];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar209;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar255 [56];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  Float m_1;
  float fVar256;
  undefined4 uVar257;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar289;
  undefined1 auVar290 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  Float t1;
  undefined1 auVar323 [16];
  undefined1 auVar324 [64];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar331;
  float fVar333;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar332 [4];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [64];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  Float t0;
  undefined1 in_XMM17 [16];
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  Vector3f wiRender;
  SampledSpectrum SVar347;
  bool specularBounce;
  bool anyNonSpecularBounces;
  bool terminated;
  bool scattered;
  BSSRDFHandle bssrdf;
  int depth;
  SampledSpectrum pdfUni;
  SampledSpectrum beta;
  SampledSpectrum Le;
  LightSampleContext prevIntrContext;
  BSDFSample bs;
  SampledSpectrum pdfNEE;
  BSDFSample bs_1;
  SampledSpectrum rrBeta;
  BSSRDFProbeSegment probeSeg;
  float deltaT [3];
  float nextCrossingT [3];
  RNG rng;
  BSDF bsdf;
  int step [3];
  optional<pbrt::ShapeIntersection> si;
  optional<pbrt::MediumInteraction> prevMediumIntr;
  undefined1 auVar348 [12];
  bool local_90c;
  bool local_90b;
  bool local_90a;
  bool local_909;
  undefined1 local_908 [8];
  float fStack_900;
  float fStack_8fc;
  SampledWavelengths *local_8f0;
  undefined1 local_8e8 [20];
  float fStack_8d4;
  uint uStack_8d0;
  uint uStack_8cc;
  undefined1 local_8c8 [8];
  undefined8 uStack_8c0;
  undefined1 local_8b8 [16];
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_8a0;
  SampledSpectrum local_898;
  PrimitiveHandle *local_880;
  SampledSpectrum local_878;
  undefined1 local_868 [4];
  float afStack_864 [5];
  Tuple2<pbrt::Point2,_float> *local_850;
  undefined1 local_848 [16];
  SampledSpectrum local_838;
  undefined1 local_828 [4];
  float fStack_824;
  Interval<float> IStack_820;
  Interval<float> IStack_818;
  SampledSpectrum *pSStack_810;
  undefined8 uStack_808;
  float fStack_800;
  float fStack_7fc;
  SampledSpectrum *pSStack_7f8;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 uStack_7e8;
  Tuple2<pbrt::Point2,_float> *pTStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  aligned_storage_t<sizeof(pbrt::SurfaceInteraction),_alignof(pbrt::SurfaceInteraction)> *local_7c8;
  bool *local_7c0;
  bool *local_7b8;
  bool *local_7b0;
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  BSDFSample local_778;
  SampledSpectrum local_748;
  undefined1 local_738 [16];
  undefined1 local_728 [16];
  BSDFSample local_718;
  undefined1 local_6e8 [8];
  Interval<float> IStack_6e0;
  Interval<float> aIStack_6d8 [14];
  undefined8 uStack_668;
  undefined4 uStack_660;
  undefined8 uStack_65c;
  undefined8 local_650 [7];
  undefined8 auStack_618 [6];
  bool local_5e8;
  BSSRDFProbeSegment local_5d8;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [16];
  undefined1 local_598 [32];
  float fStack_578;
  Tuple3<pbrt::Vector3,_float> TStack_574;
  SampledSpectrum *pSStack_568;
  float fStack_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  Tuple2<pbrt::Point2,_float> *pTStack_550;
  float fStack_548;
  Tuple3<pbrt::Vector3,_float> TStack_544;
  Point3fi local_538;
  SampledSpectrum *pSStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  SampledSpectrum *pSStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  Tuple2<pbrt::Point2,_float> *pTStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  ScratchBuffer *local_4c0;
  undefined1 local_4b8 [96];
  BSDF local_458;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  bool *local_3c0;
  undefined1 (*local_3b8) [32];
  uchar *local_3b0;
  undefined1 local_3a8 [8];
  undefined4 auStack_3a0 [2];
  Interval<float> IStack_398;
  Float FStack_390;
  undefined1 auStack_38c [32];
  undefined4 uStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 *local_320;
  undefined1 (*local_318) [32];
  Tuple2<pbrt::Point2,_float> local_310;
  undefined1 local_308 [8];
  Tuple2<pbrt::Point2,_float> local_300;
  Tuple2<pbrt::Point2,_float> local_2f8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_2f0;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_2e8;
  undefined8 local_1e8;
  aligned_storage_t<sizeof(pbrt::SurfaceInteraction),_alignof(pbrt::SurfaceInteraction)> local_1d8;
  char local_e0;
  optional<pbrt::MediumInteraction> local_d0;
  undefined1 auVar135 [64];
  undefined1 auVar123 [64];
  undefined1 auVar127 [64];
  undefined1 auVar131 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_29 [56];
  undefined1 extraout_var_30 [56];
  undefined1 extraout_var_31 [56];
  undefined1 extraout_var_32 [56];
  undefined1 extraout_var_33 [56];
  
  local_878.values.values[2] = 1.0;
  local_878.values.values[0] = 1.0;
  local_878.values.values[1] = 1.0;
  local_878.values.values[3] = 1.0;
  local_4c0 = scratchBuffer;
  this_02 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  local_850 = (Tuple2<pbrt::Point2,_float> *)sampler;
  local_8a0.bits = (uintptr_t)this;
  local_838.values.values = (array<float,_4>)ZEXT816(0);
  local_880 = this_02;
  local_358 = SUB6416(ZEXT464(0x3f800000),0);
  local_898.values.values = local_878.values.values;
  local_748.values.values = local_878.values.values;
  local_90b = false;
  local_90c = false;
  local_e0 = '\0';
  local_d0.set = false;
  local_8e8._12_4_ = 0.0;
  local_3c8 = &uStack_668;
  local_3b0 = local_1d8.__data + 0x80;
  local_3b8 = (undefined1 (*) [32])(local_1d8.__data + 0xd0);
  local_318 = (undefined1 (*) [32])(local_2e8.__data + 0xd0);
  local_320 = auStack_618;
  local_3d0 = &uStack_65c;
  local_3c0 = &ray->hasDifferentials;
  local_3d8 = local_650;
  local_8f0 = lambda;
  do {
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((this_02->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      auVar118 = ZEXT816(0);
      local_2e8._64_16_ = auVar118 << 0x40;
      in_ZmmResult = ZEXT1664(local_2e8._64_16_);
      local_1e8 = 0;
      local_2e8._192_64_ = in_ZmmResult;
      local_2e8._128_4_ = local_2e8._64_4_;
      local_2e8._128_4_ = 0;
      local_2e8._132_4_ = local_2e8._68_4_;
      local_2e8._132_4_ = 0;
      local_2e8._136_4_ = auVar118._0_4_;
      local_2e8._136_4_ = 0.0;
      local_2e8._140_4_ = auVar118._4_4_;
      local_2e8._140_4_ = 0;
      local_2e8._144_8_ = 0;
      local_2e8._152_8_ = 0;
      local_2e8._160_8_ = 0;
      local_2e8._168_8_ = 0;
      local_2e8._176_8_ = 0;
      local_2e8._184_8_ = 0;
      local_2e8._80_48_ = (undefined1  [48])0x0;
      local_2e8._0_64_ = in_ZmmResult;
    }
    else {
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      PrimitiveHandle::Intersect
                ((optional<pbrt::ShapeIntersection> *)&local_2e8.__align,this_02,&ray->super_Ray,
                 INFINITY);
    }
    local_909 = false;
    local_90a = false;
    if (((ray->super_Ray).medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits & 0xffffffffffff) == 0) {
LAB_0044a68a:
      bVar113 = false;
      if (local_909 == false) {
        *(long *)(in_FS_OFFSET + -0x330) = *(long *)(in_FS_OFFSET + -0x330) + 1;
        if ((0 < (int)local_8e8._12_4_) && ((bool)local_e0 == local_d0.set)) {
          LogFatal<char_const(&)[57]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                     ,0x43f,"Check failed: %s",
                     (char (*) [57])"prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value()");
        }
        if ((byte)local_1e8 == '\0') {
          bVar113 = true;
          pLVar21 = *(pointer *)(local_8a0.bits + 0x30);
          pSVar102 = local_8f0;
          for (pLVar111 = (((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           (local_8a0.bits + 0x28))->
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)
                          ._M_impl.super__Vector_impl_data._M_start; this_02 = local_880,
              pLVar111 != pLVar21; pLVar111 = pLVar111 + 1) {
            uVar97 = (pLVar111->
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     ).bits;
            auVar118 = ZEXT816(0) << 0x40;
            auVar119 = ZEXT816(0) << 0x40;
            uVar96 = (uint)(ushort)(uVar97 >> 0x30);
            uVar89 = local_4b8._8_8_;
            if (6 < uVar96) {
              uVar96 = uVar96 - 6;
              auVar118 = in_ZMM4._0_16_;
              if (uVar96 < 2) {
                auVar255 = ZEXT856(0);
                auVar208 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar118);
                SVar347 = UniformInfiniteLight::Le
                                    ((UniformInfiniteLight *)(uVar97 & 0xffffffffffff),
                                     &ray->super_Ray,pSVar102);
                auVar250._0_8_ = SVar347.values.values._8_8_;
                auVar250._8_56_ = auVar208;
                auVar119 = auVar250._0_16_;
                auVar177._0_8_ = SVar347.values.values._0_8_;
                auVar177._8_56_ = auVar255;
                auVar118 = auVar177._0_16_;
                pSVar102 = local_8f0;
                uVar89 = local_4b8._8_8_;
              }
              else if (uVar96 == 2) {
                auVar255 = ZEXT856(0);
                auVar208 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar118);
                SVar347 = ImageInfiniteLight::Le
                                    ((ImageInfiniteLight *)(uVar97 & 0xffffffffffff),&ray->super_Ray
                                     ,pSVar102);
                auVar251._0_8_ = SVar347.values.values._8_8_;
                auVar251._8_56_ = auVar208;
                auVar119 = auVar251._0_16_;
                auVar178._0_8_ = SVar347.values.values._0_8_;
                auVar178._8_56_ = auVar255;
                auVar118 = auVar178._0_16_;
                pSVar102 = local_8f0;
                uVar89 = local_4b8._8_8_;
              }
              else {
                auVar255 = ZEXT856(0);
                auVar208 = ZEXT856(0);
                in_ZMM4 = ZEXT1664(auVar118);
                SVar347 = PortalImageInfiniteLight::Le
                                    ((PortalImageInfiniteLight *)(uVar97 & 0xffffffffffff),
                                     &ray->super_Ray,pSVar102);
                auVar252._0_8_ = SVar347.values.values._8_8_;
                auVar252._8_56_ = auVar208;
                auVar119 = auVar252._0_16_;
                auVar179._0_8_ = SVar347.values.values._0_8_;
                auVar179._8_56_ = auVar255;
                auVar118 = auVar179._0_16_;
                pSVar102 = local_8f0;
                uVar89 = local_4b8._8_8_;
              }
            }
            local_4b8._12_4_ = (undefined4)(uVar89 >> 0x20);
            auVar239._16_48_ = in_ZmmResult._16_48_;
            auVar119 = vmovlhps_avx(auVar118,auVar119);
            local_598._0_4_ = auVar119._0_4_;
            local_598._4_4_ = auVar119._4_4_;
            local_598._8_4_ = auVar119._8_4_;
            local_598._12_4_ = auVar119._12_4_;
            if ((auVar118._0_4_ != 0.0) || (NAN(auVar118._0_4_))) {
LAB_0044a836:
              if (((float)local_8e8._12_4_ == 0.0) || (local_90c == true)) {
                lVar107 = 1;
                auVar155._0_4_ = (float)local_598._0_4_ * local_878.values.values[0];
                auVar155._4_4_ = (float)local_598._4_4_ * local_878.values.values[1];
                auVar155._8_4_ = (float)local_598._8_4_ * local_878.values.values[2];
                auVar155._12_4_ = (float)local_598._12_4_ * local_878.values.values[3];
                fVar210 = local_898.values.values[0];
                do {
                  fVar210 = fVar210 + local_898.values.values[lVar107];
                  lVar107 = lVar107 + 1;
                } while (lVar107 != 4);
              }
              else {
                uStack_808._0_4_ = 0.0;
                uStack_808._4_4_ = 0.0;
                fStack_800 = 0.0;
                fStack_7fc = 0.0;
                local_828 = (undefined1  [4])0x0;
                fStack_824 = 0.0;
                IStack_820.low = 0.0;
                IStack_820.high = 0.0;
                IStack_818.low = 0.0;
                IStack_818.high = 0.0;
                pSStack_810 = (SampledSpectrum *)0x0;
                local_4b8._8_8_ = uVar89;
                if (local_e0 == '\x01') {
                  aIStack_6d8[0].low = (float)local_1d8._16_8_;
                  aIStack_6d8[0].high = (float)((ulong)local_1d8._16_8_ >> 0x20);
                  aIStack_6d8[3].high = *(float *)(local_3b0 + 8);
                  local_6e8._0_4_ = local_1d8.__align._0_4_;
                  local_6e8._4_4_ = local_1d8.__align._4_4_;
                  IStack_6e0.low = (float)local_1d8._8_8_;
                  IStack_6e0.high = (float)((ulong)local_1d8._8_8_ >> 0x20);
                  aIStack_6d8[2].low = (float)local_1d8._48_4_;
                  aIStack_6d8[1].low = (float)local_1d8._40_8_;
                  aIStack_6d8[1].high = (float)((ulong)local_1d8._40_8_ >> 0x20);
                  aIStack_6d8[2].high = (float)*(undefined8 *)local_3b0;
                  aIStack_6d8[3].low = (float)((ulong)*(undefined8 *)local_3b0 >> 0x20);
                }
                else {
                  if (local_d0.set == false) {
                    LogFatal<char_const(&)[4]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                               ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
                  }
                  aIStack_6d8[0].low = (float)local_d0.optionalValue._16_8_;
                  aIStack_6d8[0].high = (float)((ulong)local_d0.optionalValue._16_8_ >> 0x20);
                  local_6e8._0_4_ = local_d0.optionalValue.__align._0_4_;
                  local_6e8._4_4_ = local_d0.optionalValue.__align._4_4_;
                  IStack_6e0.low = (float)local_d0.optionalValue._8_8_;
                  IStack_6e0.high = (float)((ulong)local_d0.optionalValue._8_8_ >> 0x20);
                  aIStack_6d8[1].low = 0.0;
                  aIStack_6d8[3].low = 0.0;
                  aIStack_6d8[3].high = 0.0;
                  aIStack_6d8[1].high = 0.0;
                  aIStack_6d8[2].low = 0.0;
                  aIStack_6d8[2].high = 0.0;
                }
                IStack_818.low = aIStack_6d8[0].low;
                IStack_818.high = aIStack_6d8[0].high;
                uStack_808._0_4_ = aIStack_6d8[2].low;
                uStack_808._4_4_ = aIStack_6d8[2].high;
                local_828 = (undefined1  [4])local_6e8._0_4_;
                fStack_824 = (float)local_6e8._4_4_;
                IStack_820.low = IStack_6e0.low;
                IStack_820.high = IStack_6e0.high;
                pSStack_810 = (SampledSpectrum *)CONCAT44(aIStack_6d8[1].high,aIStack_6d8[1].low);
                fStack_800 = aIStack_6d8[3].low;
                fStack_7fc = aIStack_6d8[3].high;
                uVar22 = (pLVar111->
                         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                         ).bits;
                uVar97 = (((LightSamplerHandle *)(local_8a0.bits + 0x70))->
                         super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                         ).bits;
                pEVar105 = (ExhaustiveLightSampler *)(uVar97 & 0xffffffffffff);
                auVar118 = in_ZMM4._0_16_;
                local_6e8._0_4_ = (undefined4)uVar22;
                local_6e8._4_4_ = (undefined4)(uVar22 >> 0x20);
                if (uVar97 < 0x3000000000000) {
                  if ((uVar97 & 0x3000000000000) == 0x2000000000000) {
                    in_ZMM4 = ZEXT1664(auVar118);
                    local_908._0_4_ =
                         PowerLightSampler::PDF
                                   ((PowerLightSampler *)pEVar105,(LightSampleContext *)local_828,
                                    (LightHandle *)local_6e8);
                    local_908._4_4_ = extraout_XMM0_Db;
                    fStack_900 = (float)extraout_XMM0_Dc;
                    fStack_8fc = (float)extraout_XMM0_Dd;
                  }
                  else {
                    sVar23 = (pEVar105->lights).nStored;
                    auVar118 = vcvtusi2ss_avx512f(in_XMM17,sVar23);
                    fVar210 = 1.0 / auVar118._0_4_;
                    auVar239._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar239._0_4_ = fVar210;
                    auVar134._4_60_ = auVar239._4_60_;
                    auVar134._0_4_ = (uint)(sVar23 != 0) * (int)fVar210;
                    _local_908 = auVar134._0_16_;
                  }
                }
                else if ((uVar97 & 0xfffe000000000000) == 0x2000000000000) {
                  in_ZMM4 = ZEXT1664(auVar118);
                  local_908._0_4_ =
                       BVHLightSampler::PDF
                                 ((BVHLightSampler *)pEVar105,(LightSampleContext *)local_828,
                                  (LightHandle *)local_6e8);
                  local_908._4_4_ = extraout_XMM0_Db_00;
                  fStack_900 = (float)extraout_XMM0_Dc_00;
                  fStack_8fc = (float)extraout_XMM0_Dd_00;
                }
                else {
                  in_ZMM4 = ZEXT1664(auVar118);
                  local_908._0_4_ =
                       ExhaustiveLightSampler::PDF
                                 (pEVar105,(LightSampleContext *)local_828,(LightHandle *)local_6e8)
                  ;
                  local_908._4_4_ = extraout_XMM0_Db_01;
                  fStack_900 = (float)extraout_XMM0_Dc_01;
                  fStack_8fc = (float)extraout_XMM0_Dd_01;
                }
                local_538.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = (Interval<float>)local_6e8;
                aIStack_6d8[2].low = (float)uStack_808;
                aIStack_6d8[2].high = uStack_808._4_4_;
                aIStack_6d8[3].low = fStack_800;
                aIStack_6d8[3].high = fStack_7fc;
                local_6e8._0_4_ = local_828;
                local_6e8._4_4_ = fStack_824;
                IStack_6e0.low = IStack_820.low;
                IStack_6e0.high = IStack_820.high;
                aIStack_6d8[0].low = IStack_818.low;
                aIStack_6d8[0].high = IStack_818.high;
                aIStack_6d8[1].low = SUB84(pSStack_810,0);
                aIStack_6d8[1].high = (float)((ulong)pSStack_810 >> 0x20);
                pVVar2 = &(ray->super_Ray).d;
                local_538.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = (Interval<float>)local_4b8;
                local_458.eta = 0.0;
                local_538.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)&local_458;
                local_4b8._0_4_ = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).x;
                local_4b8._4_4_ = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).y;
                local_4b8._8_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                uVar97 = (pLVar111->
                         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                         ).bits;
                uVar96 = (uint)(ushort)(uVar97 >> 0x30);
                auVar118 = in_ZMM4._0_16_;
                if (uVar97 < 0x5000000000000) {
                  fVar210 = 0.0;
                  if (0x2ffffffffffff < uVar97) {
                    if ((uVar96 & 6) == 2) {
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_824;
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_828;
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_820.high;
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_820.low;
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_818.high;
                      LVar71.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_818.low;
                      auVar78._4_4_ = IStack_818.high;
                      auVar78._0_4_ = IStack_818.low;
                      auVar78._8_8_ = pSStack_810;
                      auVar78._16_4_ = (float)uStack_808;
                      auVar78._20_4_ = uStack_808._4_4_;
                      auVar78._24_4_ = fStack_800;
                      auVar78._28_4_ = fStack_7fc;
                      in_ZMM4 = ZEXT1664(auVar118);
                      LVar71.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_810;
                      auVar348 = SUB1612(auVar78._16_16_,4);
                      LVar71.n.super_Tuple3<pbrt::Normal3,_float>.z =
                           (float)SUB164(auVar78._16_16_,0);
                      LVar71.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar348._0_4_;
                      LVar71.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar348._4_4_;
                      LVar71.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar348._8_4_;
                      fVar210 = ProjectionLight::PDF_Li
                                          ((ProjectionLight *)(uVar97 & 0xffffffffffff),LVar71,
                                           (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,
                                           WithMIS);
                    }
                    else {
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_824;
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_828;
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_820.high;
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_820.low;
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_818.high;
                      LVar72.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_818.low;
                      auVar16._4_4_ = IStack_818.high;
                      auVar16._0_4_ = IStack_818.low;
                      auVar16._8_8_ = pSStack_810;
                      auVar16._16_4_ = (float)uStack_808;
                      auVar16._20_4_ = uStack_808._4_4_;
                      auVar16._24_4_ = fStack_800;
                      auVar16._28_4_ = fStack_7fc;
                      in_ZMM4 = ZEXT1664(auVar118);
                      LVar72.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_810;
                      auVar348 = SUB1612(auVar16._16_16_,4);
                      LVar72.n.super_Tuple3<pbrt::Normal3,_float>.z =
                           (float)SUB164(auVar16._16_16_,0);
                      LVar72.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar348._0_4_;
                      LVar72.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar348._4_4_;
                      LVar72.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar348._8_4_;
                      fVar210 = GoniometricLight::PDF_Li
                                          ((GoniometricLight *)(uVar97 & 0xffffffffffff),LVar72,
                                           (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,
                                           WithMIS);
                    }
                  }
                }
                else {
                  local_3a8 = (undefined1  [8])uVar97;
                  in_ZMM4 = ZEXT1664(auVar118);
                  fVar210 = detail::DispatchSplit<5>::operator()
                                      ((DispatchSplit<5> *)&local_778,local_3a8,uVar96 - 4);
                }
                uVar89 = CONCAT44(local_4b8._12_4_,local_4b8._8_4_);
                fVar210 = fVar210 * (float)local_908._0_4_;
                lVar107 = 1;
                local_748.values.values[0] = fVar210 * local_748.values.values[0];
                local_748.values.values[1] = fVar210 * local_748.values.values[1];
                local_748.values.values[2] = fVar210 * local_748.values.values[2];
                local_748.values.values[3] = fVar210 * local_748.values.values[3];
                auVar155._0_4_ = (float)local_598._0_4_ * local_878.values.values[0];
                auVar155._4_4_ = (float)local_598._4_4_ * local_878.values.values[1];
                auVar155._8_4_ = (float)local_598._8_4_ * local_878.values.values[2];
                auVar155._12_4_ = (float)local_598._12_4_ * local_878.values.values[3];
                fVar210 = local_748.values.values[0] + local_898.values.values[0];
                local_6e8._0_4_ = fVar210;
                local_6e8._4_4_ = local_748.values.values[1] + local_898.values.values[1];
                IStack_6e0.low = local_748.values.values[2] + local_898.values.values[2];
                IStack_6e0.high = local_748.values.values[3] + local_898.values.values[3];
                do {
                  fVar210 = fVar210 + *(float *)(local_6e8 + lVar107 * 4);
                  lVar107 = lVar107 + 1;
                  pSVar102 = local_8f0;
                } while (lVar107 != 4);
              }
              fVar210 = fVar210 * 0.25;
              auVar226._0_4_ = fVar210 * (pSVar102->pdf).values[0];
              auVar226._4_4_ = fVar210 * (pSVar102->pdf).values[1];
              auVar226._8_4_ = fVar210 * (pSVar102->pdf).values[2];
              auVar226._12_4_ = fVar210 * (pSVar102->pdf).values[3];
              uVar97 = vcmpps_avx512vl(auVar226,_DAT_00601010,4);
              auVar118 = vdivps_avx512vl(auVar155,auVar226);
              fVar140 = (float)((uint)((byte)uVar97 & 1) * auVar118._0_4_);
              fVar210 = (float)((uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_);
              in_ZmmResult._4_4_ = fVar210;
              in_ZmmResult._0_4_ = fVar140;
              fVar139 = (float)((uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_);
              in_ZmmResult._8_4_ = fVar139;
              fVar206 = (float)((uint)((byte)(uVar97 >> 3) & 1) * auVar118._12_4_);
              in_ZmmResult._12_4_ = fVar206;
              in_ZmmResult._16_48_ = auVar239._16_48_;
              local_838.values.values[1] = fVar210 + local_838.values.values[1];
              local_838.values.values[0] = fVar140 + local_838.values.values[0];
              local_838.values.values[2] = fVar139 + local_838.values.values[2];
              local_838.values.values[3] = fVar206 + local_838.values.values[3];
            }
            else {
              uVar97 = 0xffffffffffffffff;
              do {
                if (uVar97 == 2) goto LAB_0044aca8;
                lVar107 = uVar97 * 4;
                uVar97 = uVar97 + 1;
              } while ((*(float *)(local_598 + lVar107 + 8) == 0.0) &&
                      (!NAN(*(float *)(local_598 + lVar107 + 8))));
              if (uVar97 < 3) goto LAB_0044a836;
            }
LAB_0044aca8:
            local_4b8._8_8_ = uVar89;
          }
        }
        else {
          uVar12._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar12._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar153._0_8_ = uVar12 ^ 0x8000000080000000;
          auVar153._8_4_ = 0x80000000;
          auVar153._12_4_ = 0x80000000;
          auVar224._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar224._4_4_ = 0x80000000;
          auVar224._8_4_ = 0x80000000;
          auVar224._12_4_ = 0x80000000;
          uVar207 = vmovlps_avx(auVar153);
          local_6e8._0_4_ = (undefined4)uVar207;
          local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
          auVar255 = ZEXT856(auVar153._8_8_);
          auVar208 = ZEXT856(auVar224._8_8_);
          auVar119 = in_ZMM4._0_16_;
          IStack_6e0.low = auVar224._0_4_;
          SVar347 = SurfaceInteraction::Le
                              ((SurfaceInteraction *)&local_2e8.__align,(Vector3f *)local_6e8,
                               local_8f0);
          auVar239 = local_2e8._192_64_;
          auVar136._16_48_ = in_ZmmResult._16_48_;
          auVar249._0_8_ = SVar347.values.values._8_8_;
          auVar249._8_56_ = auVar208;
          auVar176._0_8_ = SVar347.values.values._0_8_;
          auVar176._8_56_ = auVar255;
          _local_868 = vmovlhps_avx(auVar176._0_16_,auVar249._0_16_);
          auVar118 = _local_868;
          if ((SVar347.values.values[0] != 0.0) || (NAN(SVar347.values.values[0]))) {
LAB_0044a737:
            if (((float)local_8e8._12_4_ == 0.0) || (local_90c == true)) {
              lVar107 = 1;
              auVar154._0_4_ = (float)local_868 * local_878.values.values[0];
              auVar154._4_4_ = afStack_864[0] * local_878.values.values[1];
              auVar154._8_4_ = afStack_864[1] * local_878.values.values[2];
              auVar154._12_4_ = afStack_864[2] * local_878.values.values[3];
              fVar210 = local_898.values.values[0];
              do {
                fVar210 = fVar210 + local_898.values.values[lVar107];
                lVar107 = lVar107 + 1;
              } while (lVar107 != 4);
              fVar210 = fVar210 * 0.25;
              auVar225._0_4_ = fVar210 * (local_8f0->pdf).values[0];
              auVar225._4_4_ = fVar210 * (local_8f0->pdf).values[1];
              auVar225._8_4_ = fVar210 * (local_8f0->pdf).values[2];
              auVar225._12_4_ = fVar210 * (local_8f0->pdf).values[3];
              _local_868 = auVar118;
            }
            else {
              uVar207 = local_2e8._200_8_;
              uStack_808._0_4_ = 0.0;
              uStack_808._4_4_ = 0.0;
              fStack_800 = 0.0;
              fStack_7fc = 0.0;
              local_828 = (undefined1  [4])0x0;
              fStack_824 = 0.0;
              IStack_820.low = 0.0;
              IStack_820.high = 0.0;
              IStack_818.low = 0.0;
              IStack_818.high = 0.0;
              pSStack_810 = (SampledSpectrum *)0x0;
              if (local_e0 == '\x01') {
                aIStack_6d8[0].low = (float)local_1d8._16_8_;
                aIStack_6d8[0].high = (float)((ulong)local_1d8._16_8_ >> 0x20);
                aIStack_6d8[3].high = *(float *)(local_3b0 + 8);
                local_6e8._0_4_ = local_1d8.__align._0_4_;
                local_6e8._4_4_ = local_1d8.__align._4_4_;
                IStack_6e0.low = (float)local_1d8._8_8_;
                IStack_6e0.high = (float)((ulong)local_1d8._8_8_ >> 0x20);
                aIStack_6d8[2].low = (float)local_1d8._48_4_;
                aIStack_6d8[1].low = (float)local_1d8._40_8_;
                aIStack_6d8[1].high = (float)((ulong)local_1d8._40_8_ >> 0x20);
                aIStack_6d8[2].high = (float)*(undefined8 *)local_3b0;
                aIStack_6d8[3].low = (float)((ulong)*(undefined8 *)local_3b0 >> 0x20);
              }
              else {
                if (local_d0.set == false) {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
                }
                aIStack_6d8[0].low = (float)local_d0.optionalValue._16_8_;
                aIStack_6d8[0].high = (float)((ulong)local_d0.optionalValue._16_8_ >> 0x20);
                local_6e8._0_4_ = local_d0.optionalValue.__align._0_4_;
                local_6e8._4_4_ = local_d0.optionalValue.__align._4_4_;
                IStack_6e0.low = (float)local_d0.optionalValue._8_8_;
                IStack_6e0.high = (float)((ulong)local_d0.optionalValue._8_8_ >> 0x20);
                aIStack_6d8[1].low = 0.0;
                aIStack_6d8[3].low = 0.0;
                aIStack_6d8[3].high = 0.0;
                aIStack_6d8[1].high = 0.0;
                aIStack_6d8[2].low = 0.0;
                aIStack_6d8[2].high = 0.0;
              }
              IStack_818.low = aIStack_6d8[0].low;
              IStack_818.high = aIStack_6d8[0].high;
              fStack_800 = aIStack_6d8[3].low;
              fStack_7fc = aIStack_6d8[3].high;
              uStack_808._0_4_ = aIStack_6d8[2].low;
              uStack_808._4_4_ = aIStack_6d8[2].high;
              pSStack_810 = (SampledSpectrum *)CONCAT44(aIStack_6d8[1].high,aIStack_6d8[1].low);
              local_828 = (undefined1  [4])local_6e8._0_4_;
              fStack_824 = (float)local_6e8._4_4_;
              IStack_820.low = IStack_6e0.low;
              IStack_820.high = IStack_6e0.high;
              uVar97 = (((LightSamplerHandle *)(local_8a0.bits + 0x70))->
                       super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                       ).bits;
              pEVar105 = (ExhaustiveLightSampler *)(uVar97 & 0xffffffffffff);
              local_6e8._0_4_ = local_2e8._200_4_;
              local_6e8._4_4_ = local_2e8._204_4_;
              if (uVar97 < 0x3000000000000) {
                if ((uVar97 & 0x3000000000000) == 0x2000000000000) {
                  local_908._0_4_ =
                       PowerLightSampler::PDF
                                 ((PowerLightSampler *)pEVar105,(LightSampleContext *)local_828,
                                  (LightHandle *)local_6e8);
                  local_908._4_4_ = extraout_XMM0_Db_02;
                  fStack_900 = (float)extraout_XMM0_Dc_02;
                  fStack_8fc = (float)extraout_XMM0_Dd_02;
                }
                else {
                  sVar23 = (pEVar105->lights).nStored;
                  auVar118 = vcvtusi2ss_avx512f(in_XMM17,sVar23);
                  fVar210 = 1.0 / auVar118._0_4_;
                  auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar136._0_4_ = fVar210;
                  auVar135._4_60_ = auVar136._4_60_;
                  auVar135._0_4_ = (uint)(sVar23 != 0) * (int)fVar210;
                  _local_908 = auVar135._0_16_;
                }
              }
              else if ((uVar97 & 0xfffe000000000000) == 0x2000000000000) {
                local_908._0_4_ =
                     BVHLightSampler::PDF
                               ((BVHLightSampler *)pEVar105,(LightSampleContext *)local_828,
                                (LightHandle *)local_6e8);
                local_908._4_4_ = extraout_XMM0_Db_03;
                fStack_900 = (float)extraout_XMM0_Dc_03;
                fStack_8fc = (float)extraout_XMM0_Dd_03;
              }
              else {
                local_908._0_4_ =
                     ExhaustiveLightSampler::PDF
                               (pEVar105,(LightSampleContext *)local_828,(LightHandle *)local_6e8);
                local_908._4_4_ = extraout_XMM0_Db_04;
                fStack_900 = (float)extraout_XMM0_Dc_04;
                fStack_8fc = (float)extraout_XMM0_Dd_04;
              }
              local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = (Interval<float>)local_6e8;
              aIStack_6d8[2].low = (float)uStack_808;
              aIStack_6d8[2].high = uStack_808._4_4_;
              aIStack_6d8[3].low = fStack_800;
              aIStack_6d8[3].high = fStack_7fc;
              local_6e8._0_4_ = local_828;
              local_6e8._4_4_ = fStack_824;
              IStack_6e0.low = IStack_820.low;
              IStack_6e0.high = IStack_820.high;
              aIStack_6d8[0].low = IStack_818.low;
              aIStack_6d8[0].high = IStack_818.high;
              aIStack_6d8[1].low = SUB84(pSStack_810,0);
              aIStack_6d8[1].high = (float)((ulong)pSStack_810 >> 0x20);
              pVVar2 = &(ray->super_Ray).d;
              uVar6 = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).x;
              uVar14 = (pVVar2->super_Tuple3<pbrt::Vector3,_float>).y;
              local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = (Interval<float>)local_598;
              auVar87._60_4_ = 0;
              auVar87._0_60_ = stack0xfffffffffffffc5c;
              _local_3a8 = auVar87 << 0x20;
              local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)local_3a8;
              local_598._0_4_ = uVar6;
              local_598._4_4_ = uVar14;
              local_598._8_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              if ((ulong)uVar207 < 0x5000000000000) {
                fVar210 = 0.0;
                if (0x2ffffffffffff < (ulong)uVar207) {
                  if ((auVar239._14_2_ & 6) == 2) {
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_824;
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_828;
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_820.high;
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_820.low;
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_818.high;
                    LVar73.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_818.low;
                    auVar79._4_4_ = IStack_818.high;
                    auVar79._0_4_ = IStack_818.low;
                    auVar79._8_8_ = pSStack_810;
                    auVar79._16_4_ = (float)uStack_808;
                    auVar79._20_4_ = uStack_808._4_4_;
                    auVar79._24_4_ = fStack_800;
                    auVar79._28_4_ = fStack_7fc;
                    LVar73.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_810;
                    auVar348 = SUB1612(auVar79._16_16_,4);
                    LVar73.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar79._16_16_,0)
                    ;
                    LVar73.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar348._0_4_;
                    LVar73.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar348._4_4_;
                    LVar73.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar348._8_4_;
                    fVar210 = ProjectionLight::PDF_Li
                                        ((ProjectionLight *)(uVar207 & 0xffffffffffff),LVar73,
                                         (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,
                                         WithMIS);
                  }
                  else {
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = fStack_824;
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_828;
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = IStack_820.high;
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_820.low;
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = IStack_818.high;
                    LVar74.pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = IStack_818.low;
                    auVar80._4_4_ = IStack_818.high;
                    auVar80._0_4_ = IStack_818.low;
                    auVar80._8_8_ = pSStack_810;
                    auVar80._16_4_ = (float)uStack_808;
                    auVar80._20_4_ = uStack_808._4_4_;
                    auVar80._24_4_ = fStack_800;
                    auVar80._28_4_ = fStack_7fc;
                    LVar74.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = pSStack_810;
                    auVar348 = SUB1612(auVar80._16_16_,4);
                    LVar74.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)SUB164(auVar80._16_16_,0)
                    ;
                    LVar74.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)auVar348._0_4_;
                    LVar74.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)auVar348._4_4_;
                    LVar74.ns.super_Tuple3<pbrt::Normal3,_float>.z = (float)auVar348._8_4_;
                    fVar210 = GoniometricLight::PDF_Li
                                        ((GoniometricLight *)(uVar207 & 0xffffffffffff),LVar74,
                                         (Vector3f)pVVar2->super_Tuple3<pbrt::Vector3,_float>,
                                         WithMIS);
                  }
                }
              }
              else {
                local_4b8._0_8_ = uVar207;
                fVar210 = detail::DispatchSplit<5>::operator()
                                    ((DispatchSplit<5> *)&local_458,local_4b8,auVar239._14_2_ - 4);
              }
              fVar210 = fVar210 * (float)local_908._0_4_;
              lVar107 = 1;
              local_748.values.values[0] = fVar210 * local_748.values.values[0];
              local_748.values.values[1] = fVar210 * local_748.values.values[1];
              local_748.values.values[2] = fVar210 * local_748.values.values[2];
              local_748.values.values[3] = fVar210 * local_748.values.values[3];
              auVar154._0_4_ = (float)local_868 * local_878.values.values[0];
              auVar154._4_4_ = afStack_864[0] * local_878.values.values[1];
              auVar154._8_4_ = afStack_864[1] * local_878.values.values[2];
              auVar154._12_4_ = afStack_864[2] * local_878.values.values[3];
              fVar210 = local_748.values.values[0] + local_898.values.values[0];
              local_6e8._0_4_ = fVar210;
              local_6e8._4_4_ = local_748.values.values[1] + local_898.values.values[1];
              IStack_6e0.low = local_748.values.values[2] + local_898.values.values[2];
              IStack_6e0.high = local_748.values.values[3] + local_898.values.values[3];
              do {
                fVar210 = fVar210 + *(float *)(local_6e8 + lVar107 * 4);
                lVar107 = lVar107 + 1;
              } while (lVar107 != 4);
              fVar210 = fVar210 * 0.25;
              auVar225._0_4_ = fVar210 * (local_8f0->pdf).values[0];
              auVar225._4_4_ = fVar210 * (local_8f0->pdf).values[1];
              auVar225._8_4_ = fVar210 * (local_8f0->pdf).values[2];
              auVar225._12_4_ = fVar210 * (local_8f0->pdf).values[3];
            }
            uVar97 = vcmpps_avx512vl(auVar225,_DAT_00601010,4);
            auVar118 = vdivps_avx512vl(auVar154,auVar225);
            fVar210 = (float)((uint)((byte)uVar97 & 1) * auVar118._0_4_);
            fVar206 = (float)((uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_);
            in_ZmmResult._4_4_ = fVar206;
            in_ZmmResult._0_4_ = fVar210;
            fVar139 = (float)((uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_);
            in_ZmmResult._8_4_ = fVar139;
            fVar140 = (float)((uint)((byte)(uVar97 >> 3) & 1) * auVar118._12_4_);
            in_ZmmResult._12_4_ = fVar140;
            in_ZmmResult._16_48_ = auVar136._16_48_;
            local_838.values.values[1] = fVar206 + local_838.values.values[1];
            local_838.values.values[0] = fVar210 + local_838.values.values[0];
            local_838.values.values[2] = fVar139 + local_838.values.values[2];
            local_838.values.values[3] = fVar140 + local_838.values.values[3];
          }
          else {
            uVar97 = 0xffffffffffffffff;
            do {
              if (uVar97 == 2) goto LAB_0044b118;
              lVar107 = uVar97 * 4;
              uVar97 = uVar97 + 1;
            } while ((*(float *)(local_868 + lVar107 + 8) == 0.0) &&
                    (!NAN(*(float *)(local_868 + lVar107 + 8))));
            if (uVar97 < 3) goto LAB_0044a737;
          }
LAB_0044b118:
          local_2f0.bits =
               (((CameraHandle *)(local_8a0.bits + 0x58))->
               super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               ).bits;
          local_2f8 = *(Tuple2<pbrt::Point2,_float> *)sampler;
          in_ZMM4 = ZEXT1664(auVar119);
          SurfaceInteraction::GetBSDF
                    (&local_458,(SurfaceInteraction *)&local_2e8.__align,ray,local_8f0,
                     (CameraHandle *)&local_2f0,local_4c0,(SamplerHandle *)&local_2f8);
          uVar257 = local_8e8._12_4_;
          if ((int6)local_458.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits == 0) {
            if ((byte)local_1e8 == '\0') {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
            }
            bVar113 = false;
            SurfaceInteraction::SkipIntersection
                      ((SurfaceInteraction *)&local_2e8.__align,ray,(Float)local_2e8._248_4_);
          }
          else {
            in_ZMM4 = ZEXT1664(local_2e8._64_16_);
            bVar113 = local_d0.set == true;
            in_ZmmResult._48_4_ = local_2e8._128_4_;
            in_ZmmResult._0_48_ = local_2e8._80_48_;
            in_ZmmResult._52_4_ = local_2e8._132_4_;
            in_ZmmResult._56_4_ = local_2e8._136_4_;
            in_ZmmResult._60_4_ = local_2e8._140_4_;
            local_1d8.__align = (anon_struct_8_0_00000001_for___align)local_2e8.__align;
            local_1d8._8_8_ = local_2e8._8_8_;
            local_1d8._16_8_ = local_2e8._16_8_;
            local_1d8._24_8_ = local_2e8._24_8_;
            local_1d8._32_8_ = local_2e8._32_8_;
            local_1d8._40_8_ = local_2e8._40_8_;
            local_1d8._48_8_ = local_2e8._48_8_;
            local_1d8._56_8_ = local_2e8._56_8_;
            local_1d8._64_16_ = local_2e8._64_16_;
            local_1d8._144_8_ = local_2e8._144_8_;
            local_1d8._152_8_ = local_2e8._152_8_;
            local_1d8._160_8_ = local_2e8._160_8_;
            local_1d8._168_8_ = local_2e8._168_8_;
            local_1d8._176_8_ = local_2e8._176_8_;
            local_1d8._184_8_ = local_2e8._184_8_;
            auVar16 = *local_318;
            uVar97 = auVar16._8_8_;
            local_1d8._80_64_ = in_ZmmResult;
            local_1d8._192_16_ = local_2e8._192_16_;
            *(undefined8 *)local_3b8[1] = *(undefined8 *)local_318[1];
            *local_3b8 = auVar16;
            local_e0 = '\x01';
            if (bVar113) {
              local_d0.set = false;
            }
            bVar113 = true;
            local_8e8._12_4_ = local_8e8._12_4_ + 1;
            if ((int)uVar257 < *(int *)(local_8a0.bits + 0x68)) {
              auVar118 = local_2e8._64_16_;
              uVar207 = local_2e8._8_8_;
              if ((*(bool *)(local_8a0.bits + 0x78) == true) && (local_90b == true)) {
                *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
                BSDF::Regularize(&local_458);
              }
              *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
              auVar255 = ZEXT856((ulong)uVar207);
              auVar208 = ZEXT856(uVar97);
              in_ZMM4 = ZEXT1664(auVar118);
              bVar113 = BSDF::IsNonSpecular(&local_458);
              pSVar102 = local_8f0;
              auVar239._16_48_ = in_ZmmResult._16_48_;
              if (bVar113) {
                local_300 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                SVar347 = SampleLd((VolPathIntegrator *)local_8a0.bits,
                                   (Interaction *)&local_2e8.__align,&local_458,local_8f0,
                                   (SamplerHandle *)&local_300,&local_878,&local_898);
                auVar253._0_8_ = SVar347.values.values._8_8_;
                auVar253._8_56_ = auVar208;
                auVar180._0_8_ = SVar347.values.values._0_8_;
                auVar180._8_56_ = auVar255;
                auVar118 = *(undefined1 (*) [16])(pSVar102->pdf).values;
                auVar119 = vmovlhps_avx(auVar180._0_16_,auVar253._0_16_);
                uVar97 = vcmpps_avx512vl(auVar118,_DAT_00601010,4);
                auVar118 = vdivps_avx512vl(auVar119,auVar118);
                fVar210 = (float)((uint)((byte)uVar97 & 1) * auVar118._0_4_);
                fVar206 = (float)((uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_);
                in_ZmmResult._4_4_ = fVar206;
                in_ZmmResult._0_4_ = fVar210;
                fVar139 = (float)((uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_);
                in_ZmmResult._8_4_ = fVar139;
                fVar140 = (float)((uint)((byte)(uVar97 >> 3) & 1) * auVar118._12_4_);
                in_ZmmResult._12_4_ = fVar140;
                in_ZmmResult._16_48_ = auVar239._16_48_;
                local_838.values.values[1] = fVar206 + local_838.values.values[1];
                local_838.values.values[0] = fVar210 + local_838.values.values[0];
                local_838.values.values[2] = fVar139 + local_838.values.values[2];
                local_838.values.values[3] = fVar140 + local_838.values.values[3];
              }
              uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
              uVar15 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
              local_908._4_4_ = uVar15;
              local_908._0_4_ = uVar7;
              TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
              _fStack_900 = 0;
              local_6e8._0_4_ = TVar20.x;
              local_6e8._4_4_ = TVar20.y;
              register0x00001200 =
                   ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z);
              FVar138 = detail::DispatchSplit<8>::operator()
                                  ((DispatchSplit<8> *)local_828,local_6e8,(ulong)TVar20 >> 0x30);
              local_8b8._0_4_ = FVar138;
              TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
              uVar96 = (uint)TVar20.y._2_2_;
              if ((ulong)TVar20 < 0x5000000000000) {
                if ((ulong)TVar20 < 0x3000000000000) {
                  if (uVar96 == 2) {
                    auVar181._0_8_ =
                         PaddedSobolSampler::Get2D
                                   ((PaddedSobolSampler *)((ulong)TVar20 & 0xffffffffffff));
                    auVar181._8_56_ = extraout_var_13;
                    auVar118 = auVar181._0_16_;
                  }
                  else {
                    auVar185._0_8_ =
                         HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar20 & 0xffffffffffff));
                    auVar185._8_56_ = extraout_var_17;
                    auVar118 = auVar185._0_16_;
                  }
                }
                else if ((uVar96 & 6) == 2) {
                  auVar183._0_8_ =
                       PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar20 & 0xffffffffffff));
                  auVar183._8_56_ = extraout_var_15;
                  auVar118 = auVar183._0_16_;
                }
                else {
                  auVar187._0_8_ =
                       RandomSampler::Get2D((RandomSampler *)((ulong)TVar20 & 0xffffffffffff));
                  auVar187._8_56_ = extraout_var_19;
                  auVar118 = auVar187._0_16_;
                }
              }
              else {
                uVar96 = uVar96 - 4;
                if (uVar96 < 3) {
                  if (uVar96 == 2) {
                    auVar182._0_8_ =
                         StratifiedSampler::Get2D
                                   ((StratifiedSampler *)((ulong)TVar20 & 0xffffffffffff));
                    auVar182._8_56_ = extraout_var_14;
                    auVar118 = auVar182._0_16_;
                  }
                  else {
                    auVar186._0_8_ =
                         SobolSampler::Get2D((SobolSampler *)((ulong)TVar20 & 0xffffffffffff));
                    auVar186._8_56_ = extraout_var_18;
                    auVar118 = auVar186._0_16_;
                  }
                }
                else {
                  pDVar104 = (DebugMLTSampler *)((ulong)TVar20 & 0xffffffffffff);
                  if ((uVar96 & 0x7ffffffe) == 2) {
                    auVar184._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar104);
                    auVar184._8_56_ = extraout_var_16;
                    auVar118 = auVar184._0_16_;
                  }
                  else {
                    local_8c8._0_4_ = DebugMLTSampler::Get1D(pDVar104);
                    local_8c8._4_4_ = extraout_XMM0_Db_05;
                    uStack_8c0._0_4_ = (float)extraout_XMM0_Dc_05;
                    uStack_8c0._4_4_ = (float)extraout_XMM0_Dd_05;
                    auVar188._0_4_ = DebugMLTSampler::Get1D(pDVar104);
                    auVar188._4_60_ = extraout_var_01;
                    auVar118 = vinsertps_avx(_local_8c8,auVar188._0_16_,0x10);
                  }
                }
              }
              uVar207 = vmovlps_avx(auVar118);
              local_6e8._0_4_ = (undefined4)uVar207;
              local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
              auVar279._0_8_ = local_908 ^ 0x8000000080000000;
              auVar279._8_4_ = local_908._8_4_ ^ 0x80000000;
              auVar279._12_4_ = local_908._12_4_ ^ 0x80000000;
              woRender.super_Tuple3<pbrt::Vector3,_float>.z = -local_8e8._16_4_;
              auVar227._0_8_ = local_8e8._16_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = local_8e8._24_4_ ^ 0x80000000;
              auVar227._12_4_ = local_8e8._28_4_ ^ 0x80000000;
              woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar279._0_8_;
              woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(auVar279._0_8_ >> 0x20);
              _local_908 = auVar279;
              unique0x1000fa05 = auVar227;
              BSDF::Sample_f(&local_778,&local_458,woRender,(Float)local_8b8._0_4_,
                             (Point2f *)local_6e8,Radiance,All);
              auVar118 = _local_908;
              bVar113 = true;
              if (0.0 < local_778.pdf) {
                auVar116 = ZEXT416((uint)local_778.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                auVar119 = vfmadd132ss_fma(ZEXT416((uint)local_2e8._132_4_),
                                           ZEXT416((uint)((float)local_2e8._136_4_ *
                                                         local_778.wi.
                                                         super_Tuple3<pbrt::Vector3,_float>.z)),
                                           ZEXT416((uint)local_778.wi.
                                                         super_Tuple3<pbrt::Vector3,_float>.y));
                auVar294 = vfmsub213ss_fma(ZEXT416((uint)local_2e8._136_4_),
                                           ZEXT416((uint)local_778.wi.
                                                         super_Tuple3<pbrt::Vector3,_float>.z),
                                           ZEXT416((uint)((float)local_2e8._136_4_ *
                                                         local_778.wi.
                                                         super_Tuple3<pbrt::Vector3,_float>.z)));
                auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ + auVar294._0_4_)),
                                           ZEXT416((uint)local_2e8._128_4_),
                                           ZEXT416((uint)local_778.wi.
                                                         super_Tuple3<pbrt::Vector3,_float>.x));
                uVar257 = auVar119._0_4_;
                auVar228._4_4_ = uVar257;
                auVar228._0_4_ = uVar257;
                auVar228._8_4_ = uVar257;
                auVar228._12_4_ = uVar257;
                auVar38._8_4_ = 0x7fffffff;
                auVar38._0_8_ = 0x7fffffff7fffffff;
                auVar38._12_4_ = 0x7fffffff;
                auVar239._16_48_ = in_ZmmResult._16_48_;
                auVar119 = vandps_avx512vl(auVar228,auVar38);
                local_748.values.values = local_898.values.values;
                local_878.values.values[1] =
                     auVar119._4_4_ * local_778.f.values.values[1] * local_878.values.values[1];
                local_878.values.values[0] =
                     auVar119._0_4_ * local_778.f.values.values[0] * local_878.values.values[0];
                local_878.values.values[2] =
                     auVar119._8_4_ * local_778.f.values.values[2] * local_878.values.values[2];
                local_878.values.values[3] =
                     auVar119._12_4_ * local_778.f.values.values[3] * local_878.values.values[3];
                FVar138 = local_778.pdf;
                if (local_458.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits._6_2_ - 3 < 2) {
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                       local_778.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                       local_778.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                  woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_8e8._16_4_;
                  woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_908._0_4_;
                  woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_908._4_4_;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                       local_778.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar116 = ZEXT416((uint)local_778.wi.super_Tuple3<pbrt::Vector3,_float>.z);
                  _local_908 = auVar118;
                  FVar138 = BSDF::PDF(&local_458,woRender_00,wiRender,Radiance,All);
                  fVar210 = FVar138 / local_778.pdf;
                  local_878.values.values[1] = fVar210 * local_878.values.values[1];
                  local_878.values.values[0] = fVar210 * local_878.values.values[0];
                  local_878.values.values[2] = fVar210 * local_878.values.values[2];
                  local_878.values.values[3] = fVar210 * local_878.values.values[3];
                }
                local_898.values.values[1] = FVar138 * local_898.values.values[1];
                local_898.values.values[0] = FVar138 * local_898.values.values[0];
                local_898.values.values[2] = FVar138 * local_898.values.values[2];
                local_898.values.values[3] = FVar138 * local_898.values.values[3];
                rescale(&local_878,&local_898,&local_748);
                local_90b = (bool)(local_90b | (local_778.flags & Specular) == Unset);
                bVar113 = (local_778.flags & Transmission) == Unset;
                local_90c = SUB41((local_778.flags & Specular) >> 4,0);
                local_908._0_4_ = local_458.eta;
                SurfaceInteraction::SpawnRay
                          ((RayDifferential *)local_6e8,(SurfaceInteraction *)&local_2e8.__align,ray
                           ,&local_458,&local_778.wi,local_778.flags);
                (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = IStack_6e0.high;
                (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = aIStack_6d8[0].low;
                *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                     CONCAT44(aIStack_6d8[1].low,aIStack_6d8[0].high);
                (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_6e8._0_4_;
                (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_6e8._4_4_;
                *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                     CONCAT44(IStack_6e0.high,IStack_6e0.low);
                (ray->super_Ray).medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits = CONCAT44(aIStack_6d8[2].high,aIStack_6d8[2].low);
                *(ulong *)(local_3c0 + 0x14) = CONCAT44(aIStack_6d8[6].low,aIStack_6d8[5].high);
                (((Vector3f *)(local_3c0 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).x =
                     aIStack_6d8[6].high;
                (((Vector3f *)(local_3c0 + 0x1c))->super_Tuple3<pbrt::Vector3,_float>).y =
                     aIStack_6d8[7].low;
                *(ulong *)(local_3c0 + 0x24) = CONCAT44(aIStack_6d8[8].low,aIStack_6d8[7].high);
                *(ulong *)(local_3c0 + 0x2c) = CONCAT44(aIStack_6d8[9].low,aIStack_6d8[8].high);
                *(ulong *)local_3c0 = CONCAT44(aIStack_6d8[3].high,aIStack_6d8[3].low);
                *(ulong *)(local_3c0 + 8) = CONCAT44(aIStack_6d8[4].high,aIStack_6d8[4].low);
                (((Point3f *)(local_3c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                     aIStack_6d8[5].low;
                (((Point3f *)(local_3c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                     aIStack_6d8[5].high;
                *(ulong *)(local_3c0 + 0x18) = CONCAT44(aIStack_6d8[6].high,aIStack_6d8[6].low);
                local_308 = (undefined1  [8])
                            (((CameraHandle *)(local_8a0.bits + 0x58))->
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            ).bits;
                auVar324 = ZEXT1664(auVar116);
                in_ZMM4 = ZEXT1664(auVar294);
                SurfaceInteraction::GetBSSRDF
                          ((SurfaceInteraction *)local_8e8,(RayDifferential *)&local_2e8.__align,
                           (SampledWavelengths *)ray,(CameraHandle *)local_8f0,
                           (ScratchBuffer *)local_308);
                this_02 = local_880;
                fVar210 = local_358._0_4_ * (float)local_908._0_4_ * (float)local_908._0_4_;
                auVar137._16_48_ = auVar239._16_48_;
                auVar137._0_16_ = ZEXT416((uint)fVar210);
                in_ZmmResult._4_60_ = auVar137._4_60_;
                in_ZmmResult._0_4_ =
                     (float)((uint)bVar113 * (int)local_358._0_4_ + (uint)!bVar113 * (int)fVar210);
                local_358 = in_ZmmResult._0_16_;
                if (((CONCAT44(local_8e8._4_4_,local_8e8._0_4_) & 0xffffffffffff) == 0) ||
                   ((local_778.flags & Transmission) == Unset)) {
LAB_0044b740:
                  if ((local_878.values.values[0] == 0.0) && (!NAN(local_878.values.values[0]))) {
                    uVar97 = 0xffffffffffffffff;
                    do {
                      bVar113 = true;
                      if (uVar97 == 2) goto LAB_0044bdc0;
                      fVar210 = local_878.values.values[uVar97 + 2];
                      uVar97 = uVar97 + 1;
                    } while ((fVar210 == 0.0) && (!NAN(fVar210)));
                    if (2 < uVar97) goto LAB_0044bdc0;
                  }
                  lVar107 = 1;
                  auVar156._0_4_ = (float)local_358._0_4_ * local_878.values.values[0];
                  auVar156._4_4_ = (float)local_358._0_4_ * local_878.values.values[1];
                  auVar156._8_4_ = (float)local_358._0_4_ * local_878.values.values[2];
                  auVar156._12_4_ = (float)local_358._0_4_ * local_878.values.values[3];
                  fVar210 = local_898.values.values[0];
                  do {
                    fVar210 = fVar210 + local_898.values.values[lVar107];
                    lVar107 = lVar107 + 1;
                  } while (lVar107 != 4);
                  fVar210 = fVar210 * 0.25;
                  lVar107 = 1;
                  auVar229._4_4_ = fVar210;
                  auVar229._0_4_ = fVar210;
                  auVar229._8_4_ = fVar210;
                  auVar229._12_4_ = fVar210;
                  auVar118 = vdivps_avx(auVar156,auVar229);
                  local_6e8._0_4_ = auVar118._0_4_;
                  local_6e8._4_4_ = auVar118._4_4_;
                  IStack_6e0.low = auVar118._8_4_;
                  IStack_6e0.high = auVar118._12_4_;
                  auVar119 = auVar118;
                  do {
                    lVar3 = lVar107 * 4;
                    lVar107 = lVar107 + 1;
                    auVar119 = vmaxss_avx(ZEXT416(*(uint *)(local_6e8 + lVar3)),auVar119);
                  } while (lVar107 != 4);
                  bVar113 = false;
                  if ((auVar119._0_4_ < *(Float *)(local_8a0.bits + 0x6c)) &&
                     (1 < (int)local_8e8._12_4_)) {
                    lVar107 = 1;
                    _local_908 = auVar118;
                    do {
                      lVar3 = lVar107 * 4;
                      lVar107 = lVar107 + 1;
                      _local_908 = vmaxss_avx(ZEXT416(*(uint *)(local_6e8 + lVar3)),_local_908);
                    } while (lVar107 != 4);
                    TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                    local_828 = (undefined1  [4])TVar20.x;
                    fStack_824 = TVar20.y;
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    FVar138 = detail::DispatchSplit<8>::operator()
                                        ((DispatchSplit<8> *)&local_538,local_828,
                                         (ulong)TVar20 >> 0x30);
                    IVar88.high = fStack_824;
                    IVar88.low = (float)local_828;
                    bVar113 = true;
                    auVar118 = vmaxss_avx(ZEXT416((uint)(1.0 - (float)local_908._0_4_)),ZEXT416(0));
                    if (auVar118._0_4_ <= FVar138) {
                      bVar113 = false;
                      fVar210 = 1.0 - auVar118._0_4_;
                      local_898.values.values[0] = fVar210 * local_898.values.values[0];
                      local_898.values.values[1] = fVar210 * local_898.values.values[1];
                      local_898.values.values[2] = fVar210 * local_898.values.values[2];
                      local_898.values.values[3] = fVar210 * local_898.values.values[3];
                      local_748.values.values[1] = fVar210 * local_748.values.values[1];
                      local_748.values.values[0] = fVar210 * local_748.values.values[0];
                      local_748.values.values[2] = fVar210 * local_748.values.values[2];
                      local_748.values.values[3] = fVar210 * local_748.values.values[3];
                      _local_828 = IVar88;
                    }
                  }
                }
                else {
                  TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                  local_6e8._0_4_ = TVar20.x;
                  local_6e8._4_4_ = TVar20.y;
                  FVar138 = detail::DispatchSplit<8>::operator()
                                      ((DispatchSplit<8> *)local_828,local_6e8,(ulong)TVar20 >> 0x30
                                      );
                  local_908._0_4_ = FVar138;
                  TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                  uVar96 = (uint)TVar20.y._2_2_;
                  if ((ulong)TVar20 < 0x5000000000000) {
                    if ((ulong)TVar20 < 0x3000000000000) {
                      if (uVar96 == 2) {
                        auVar189._0_8_ =
                             PaddedSobolSampler::Get2D
                                       ((PaddedSobolSampler *)((ulong)TVar20 & 0xffffffffffff));
                        auVar189._8_56_ = extraout_var_20;
                        auVar118 = auVar189._0_16_;
                      }
                      else {
                        auVar193._0_8_ =
                             HaltonSampler::Get2D((HaltonSampler *)((ulong)TVar20 & 0xffffffffffff))
                        ;
                        auVar193._8_56_ = extraout_var_24;
                        auVar118 = auVar193._0_16_;
                      }
                    }
                    else if ((uVar96 & 6) == 2) {
                      auVar191._0_8_ =
                           PMJ02BNSampler::Get2D((PMJ02BNSampler *)((ulong)TVar20 & 0xffffffffffff))
                      ;
                      auVar191._8_56_ = extraout_var_22;
                      auVar118 = auVar191._0_16_;
                    }
                    else {
                      auVar195._0_8_ =
                           RandomSampler::Get2D((RandomSampler *)((ulong)TVar20 & 0xffffffffffff));
                      auVar195._8_56_ = extraout_var_26;
                      auVar118 = auVar195._0_16_;
                    }
                  }
                  else {
                    uVar96 = uVar96 - 4;
                    if (uVar96 < 3) {
                      if (uVar96 == 2) {
                        auVar190._0_8_ =
                             StratifiedSampler::Get2D
                                       ((StratifiedSampler *)((ulong)TVar20 & 0xffffffffffff));
                        auVar190._8_56_ = extraout_var_21;
                        auVar118 = auVar190._0_16_;
                      }
                      else {
                        auVar194._0_8_ =
                             SobolSampler::Get2D((SobolSampler *)((ulong)TVar20 & 0xffffffffffff));
                        auVar194._8_56_ = extraout_var_25;
                        auVar118 = auVar194._0_16_;
                      }
                    }
                    else {
                      pDVar104 = (DebugMLTSampler *)((ulong)TVar20 & 0xffffffffffff);
                      if ((uVar96 & 0x7ffffffe) == 2) {
                        auVar192._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar104);
                        auVar192._8_56_ = extraout_var_23;
                        auVar118 = auVar192._0_16_;
                      }
                      else {
                        local_8e8._16_4_ = DebugMLTSampler::Get1D(pDVar104);
                        fStack_8d4 = extraout_XMM0_Db_06;
                        uStack_8d0 = extraout_XMM0_Dc_06;
                        uStack_8cc = extraout_XMM0_Dd_06;
                        auVar196._0_4_ = DebugMLTSampler::Get1D(pDVar104);
                        auVar196._4_60_ = extraout_var_02;
                        auVar118 = vinsertps_avx(stack0xfffffffffffff728,auVar196._0_16_,0x10);
                      }
                    }
                  }
                  uVar207 = vmovlps_avx(auVar118);
                  local_6e8._0_4_ = (undefined4)uVar207;
                  local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
                  TabulatedBSSRDF::Sample
                            (&local_5d8,
                             (TabulatedBSSRDF *)
                             (CONCAT44(local_8e8._4_4_,local_8e8._0_4_) & 0xffffffffffff),
                             (Float)local_908._0_4_,(Point2f *)local_6e8);
                  if (local_5d8.valid != false) {
                    TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                    local_6e8._0_4_ = TVar20.x;
                    local_6e8._4_4_ = TVar20.y;
                    FVar138 = detail::DispatchSplit<8>::operator()
                                        ((DispatchSplit<8> *)local_828,local_6e8,
                                         (ulong)TVar20 >> 0x30);
                    auVar239 = _local_3a8;
                    auVar157._4_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                    auVar157._0_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                    auVar157._8_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                    auVar157._12_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                    auVar230._4_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                    auVar230._0_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                    auVar230._8_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                    auVar230._12_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.y;
                    uStack_4f8 = 0;
                    pTStack_4f0 = (Tuple2<pbrt::Point2,_float> *)0x0;
                    uStack_4e8 = 0;
                    uStack_4e0 = 0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = 0.0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
                    local_538.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
                    pSStack_520 = (SampledSpectrum *)0x0;
                    uStack_518 = 0;
                    uStack_510 = 0;
                    pSStack_508 = (SampledSpectrum *)0x0;
                    uStack_500 = 0;
                    uVar97 = (ulong)((uint)FVar138 >> 0x1f ^ (uint)FVar138) * 0x7fb5d329728ea185;
                    uVar97 = (uVar97 >> 0x1b ^ uVar97) * -0x7e25210b43d22bb3;
                    _local_3a8 = vmovlhps_avx(auVar157,auVar230);
                    auVar231._4_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar231._0_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar231._8_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                    auVar231._12_4_ = local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.z;
                    uVar101 = uVar97 >> 0x21 ^ uVar97;
                    uVar97 = (uVar97 >> 0x1f ^ uVar101) * 0x7fb5d329728ea185;
                    IVar141 = (Interval<float>)vmovlps_avx(auVar231);
                    IStack_398.low = IVar141.low;
                    IStack_398.high = IVar141.high;
                    FStack_390 = local_5d8.time;
                    uVar97 = (uVar97 >> 0x1b ^ uVar97) * -0x7e25210b43d22bb3;
                    uVar97 = ((uVar97 >> 0x21 ^ uVar97) + 1) * 0x5851f42d4c957f2d +
                             uVar101 * -0x4f5c17a566d501a4 + 1;
                    uStack_36c = auVar239._60_4_;
                    auStack_38c = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_368 = ZEXT816(0) << 0x20;
                    _local_908 = ZEXT816(0) << 0x20;
                    in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
                    while( true ) {
                      auVar324 = ZEXT1664(auVar324._0_16_);
                      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                      Interaction::SpawnRayTo
                                ((Ray *)local_598,(Interaction *)local_3a8,&local_5d8.p1);
                      if ((((((float)local_598._12_4_ == 0.0) && ((float)local_598._16_4_ == 0.0))
                           && ((float)local_598._20_4_ == 0.0)) && (!NAN((float)local_598._20_4_)))
                         || (*(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1
                            , ((local_880->
                               super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                               ).bits & 0xffffffffffff) == 0)) break;
                      PrimitiveHandle::Intersect
                                ((optional<pbrt::ShapeIntersection> *)local_6e8,local_880,
                                 (Ray *)local_598,1.0);
                      if ((local_5e8 & 1U) == 0) break;
                      local_3a8._4_4_ = local_6e8._4_4_;
                      local_3a8._0_4_ = local_6e8._0_4_;
                      unique0x10006fe7 = IStack_6e0.low;
                      unique0x10006feb = IStack_6e0.high;
                      IStack_398.low = aIStack_6d8[0].low;
                      IStack_398.high = aIStack_6d8[0].high;
                      FStack_390 = aIStack_6d8[1].low;
                      unique0x10006ffb = aIStack_6d8[1].high;
                      unique0x10006fff = aIStack_6d8[2].low;
                      unique0x10007003 = aIStack_6d8[2].high;
                      unique0x10007007 = aIStack_6d8[3].low;
                      unique0x1000700b = aIStack_6d8[3].high;
                      unique0x1000700f = aIStack_6d8[4].low;
                      unique0x10007013 = aIStack_6d8[4].high;
                      unique0x10007017 = aIStack_6d8[5].low;
                      uStack_36c = aIStack_6d8[5].high;
                      local_368._4_4_ = aIStack_6d8[6].high;
                      local_368._0_4_ = aIStack_6d8[6].low;
                      local_368._8_4_ = aIStack_6d8[7].low;
                      local_368._12_4_ = aIStack_6d8[7].high;
                      in_ZmmResult = _local_3a8;
                      if (local_650[5] == local_2e8._192_8_) {
                        IStack_818.high = aIStack_6d8[0].high;
                        IStack_818.low = aIStack_6d8[0].low;
                        fStack_824 = (float)local_6e8._4_4_;
                        local_828 = (undefined1  [4])local_6e8._0_4_;
                        IStack_820.high = IStack_6e0.high;
                        IStack_820.low = IStack_6e0.low;
                        pSStack_810 = (SampledSpectrum *)
                                      CONCAT44(aIStack_6d8[3].high,aIStack_6d8[3].low);
                        fStack_7fc = aIStack_6d8[9].low;
                        fVar210 = (float)local_908._0_4_ + 1.0;
                        _local_908 = ZEXT416((uint)fVar210);
                        uStack_808 = CONCAT44(aIStack_6d8[8].low,aIStack_6d8[4].low);
                        fStack_800 = aIStack_6d8[8].high;
                        fStack_7f0 = aIStack_6d8[10].high;
                        pSStack_7f8 = (SampledSpectrum *)
                                      CONCAT44(aIStack_6d8[10].low,aIStack_6d8[9].high);
                        fStack_7ec = (float)*local_3c8;
                        uStack_7e8._0_4_ = (float)((ulong)*local_3c8 >> 0x20);
                        uStack_7e8 = (RNG *)CONCAT44(*(undefined4 *)(local_3c8 + 1),
                                                     (float)uStack_7e8);
                        pTStack_7e0 = (Tuple2<pbrt::Point2,_float> *)*local_3d0;
                        uStack_7d8._4_4_ = (float)*local_3d8;
                        uStack_7d8 = (RayDifferential *)
                                     CONCAT44(uStack_7d8._4_4_,*(undefined4 *)(local_3d0 + 1));
                        uStack_7d0._0_4_ = (float)((ulong)*local_3d8 >> 0x20);
                        uStack_7d0 = (optional<pbrt::MediumInteraction> *)
                                     CONCAT44(*(undefined4 *)(local_3d8 + 1),(float)uStack_7d0);
                        uVar96 = (uint)(uVar97 >> 0x2d) ^ (uint)(uVar97 >> 0x1b);
                        bVar100 = (byte)(uVar97 >> 0x3b);
                        auVar118 = vcvtusi2ss_avx512f(auVar324._0_16_,
                                                      uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
                        auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),
                                              ZEXT416(0x3f7fffff));
                        if (auVar118._0_4_ < 1.0 / fVar210) {
                          uStack_4f8 = CONCAT44(*(undefined4 *)(local_3c8 + 1),(float)uStack_7e8);
                          uStack_4e8 = CONCAT44(uStack_7d8._4_4_,*(undefined4 *)(local_3d0 + 1));
                          uStack_4e0 = CONCAT44(*(undefined4 *)(local_3d8 + 1),(float)uStack_7d0);
                          auVar75._4_4_ = local_6e8._4_4_;
                          auVar75._0_4_ = local_6e8._0_4_;
                          auVar75._8_4_ = IStack_6e0.low;
                          auVar75._12_4_ = IStack_6e0.high;
                          auVar75._16_4_ = aIStack_6d8[0].low;
                          auVar75._20_4_ = aIStack_6d8[0].high;
                          auVar76._24_8_ = pSStack_810;
                          auVar76._0_24_ = auVar75;
                          auVar76._32_4_ = aIStack_6d8[4].low;
                          auVar76._36_4_ = aIStack_6d8[8].low;
                          auVar77._40_4_ = aIStack_6d8[8].high;
                          auVar77._0_40_ = auVar76;
                          auVar77._44_4_ = aIStack_6d8[9].low;
                          in_ZmmResult._48_8_ = pSStack_7f8;
                          in_ZmmResult._0_48_ = auVar77;
                          in_ZmmResult._56_4_ = aIStack_6d8[10].high;
                          in_ZmmResult._60_4_ = fStack_7ec;
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
                               (float)local_6e8._0_4_;
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
                               (float)local_6e8._4_4_;
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = IStack_6e0.low;
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
                               IStack_6e0.high;
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = auVar75._16_8_;
                          uStack_518 = auVar76._32_8_;
                          uStack_510 = auVar77._40_8_;
                          uStack_500 = in_ZmmResult._56_8_;
                          pSStack_520 = pSStack_810;
                          pSStack_508 = pSStack_7f8;
                          pTStack_4f0 = pTStack_7e0;
                        }
                        uVar97 = uVar97 * 0x5851f42d4c957f2d + uVar101 * 2 + 1;
                      }
                    }
                    this_02 = local_880;
                    if (0.0 < (float)local_908._0_4_) {
                      auVar85._8_8_ = uStack_510;
                      auVar85._0_8_ = uStack_518;
                      auVar85._16_8_ = pSStack_508;
                      auVar85._24_8_ = uStack_500;
                      auVar85._32_8_ = uStack_4f8;
                      auVar85._40_8_ = pTStack_4f0;
                      auVar85._48_8_ = uStack_4e8;
                      auVar85._56_8_ = uStack_4e0;
                      auVar84._4_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                      auVar84._0_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                      auVar84._8_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                      auVar84._12_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                      auVar84._16_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                      auVar84._20_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                      auVar84._24_8_ = pSStack_520;
                      auVar84._32_8_ = uStack_518;
                      auVar84._40_8_ = uStack_510;
                      in_ZmmResult._48_8_ = pSStack_508;
                      in_ZmmResult._0_48_ = auVar84;
                      in_ZmmResult._56_8_ = uStack_500;
                      uVar97 = CONCAT44(local_8e8._4_4_,local_8e8._0_4_);
                      fStack_558 = (float)uStack_4f8;
                      fStack_554 = (float)((ulong)uStack_4f8 >> 0x20);
                      pTStack_550 = pTStack_4f0;
                      fStack_548 = (float)uStack_4e8;
                      TStack_544._0_8_ = auVar85._52_8_;
                      TStack_544.z = (float)((ulong)uStack_4e0 >> 0x20);
                      local_598._0_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                      local_598._4_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                      local_598._8_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                      local_598._12_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                      local_598._16_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
                      local_598._20_4_ =
                           local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
                      local_598._24_8_ = pSStack_520;
                      fStack_578 = (float)uStack_518;
                      TStack_574._0_8_ = auVar84._36_8_;
                      TStack_574.z = (float)((ulong)uStack_510 >> 0x20);
                      pSStack_568 = pSStack_508;
                      fStack_560 = (float)uStack_500;
                      fStack_55c = (float)((ulong)uStack_500 >> 0x20);
                      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                      bxdf = (BSSRDFAdapter *)ScratchBuffer::Alloc(local_4c0,4,4);
                      TabulatedBSSRDF::ProbeIntersectionToSample
                                ((BSSRDFSample *)local_828,
                                 (TabulatedBSSRDF *)(uVar97 & 0xffffffffffff),
                                 (SubsurfaceInteraction *)local_598,bxdf);
                      puVar94 = local_3c8;
                      puVar95 = local_3d0;
                      fVar210 = fStack_554;
                      IVar91.high = local_538.super_Point3<pbrt::Interval<float>_>.
                                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
                      IVar91.low = local_538.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
                      IVar90.high = local_538.super_Point3<pbrt::Interval<float>_>.
                                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
                      IVar90.low = local_538.super_Point3<pbrt::Interval<float>_>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
                      bVar113 = true;
                      if (((float)local_828 == 0.0) && (!NAN((float)local_828))) {
                        uVar97 = 0;
                        while (uVar101 = uVar97, uVar101 != 3) {
                          if ((*(float *)(local_828 + uVar101 * 4 + 4) != 0.0) ||
                             (uVar97 = uVar101 + 1, NAN(*(float *)(local_828 + uVar101 * 4 + 4))))
                          break;
                        }
                        bVar113 = uVar101 < 3;
                      }
                      if ((bVar113) &&
                         ((IStack_818.low != 0.0 ||
                          (local_538.super_Point3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x = IVar90,
                          local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y = IVar91,
                          NAN(IStack_818.low))))) {
                        auVar158._4_4_ = IStack_818.low;
                        auVar158._0_4_ = IStack_818.low;
                        auVar158._8_4_ = IStack_818.low;
                        auVar158._12_4_ = IStack_818.low;
                        local_90b = true;
                        auVar232._0_4_ = (float)local_908._0_4_ * (float)local_828;
                        auVar232._4_4_ = (float)local_908._0_4_ * fStack_824;
                        auVar232._8_4_ = (float)local_908._0_4_ * IStack_820.low;
                        auVar232._12_4_ = (float)local_908._0_4_ * IStack_820.high;
                        auVar118 = vdivps_avx(auVar232,auVar158);
                        local_878.values.values[1] = auVar118._4_4_ * local_878.values.values[1];
                        local_878.values.values[0] = auVar118._0_4_ * local_878.values.values[0];
                        local_878.values.values[2] = auVar118._8_4_ * local_878.values.values[2];
                        local_878.values.values[3] = auVar118._12_4_ * local_878.values.values[3];
                        uStack_668._0_4_ = 0;
                        aIStack_6d8[6].low = (float)(undefined4)uStack_668;
                        local_650[5] = 0;
                        local_650[6] = 0;
                        auStack_618[0] = 0;
                        auStack_618[1] = 0;
                        auStack_618[2] = 0;
                        auStack_618[3] = 0;
                        auStack_618[4] = 0;
                        uStack_668._4_4_ = 0;
                        aIStack_6d8[6].high = (float)uStack_668._4_4_;
                        uStack_660 = 0.0;
                        aIStack_6d8[7].low = (float)uStack_660;
                        uStack_65c._0_4_ = 0.0;
                        aIStack_6d8[7].high = (float)(undefined4)uStack_65c;
                        local_650[0]._0_1_ = false;
                        local_650[0]._1_7_ = 0;
                        local_650[1]._0_4_ = 0.0;
                        local_650[1]._4_4_ = 0.0;
                        local_650[2]._0_4_ = 0.0;
                        local_650[2]._4_4_ = 0.0;
                        local_650[3] = 0;
                        local_650[4] = 0;
                        aIStack_6d8[0xd] = (Interval<float>)local_650[4];
                        aIStack_6d8[0xb].low = 0.0;
                        aIStack_6d8[0xb].high = 0.0;
                        aIStack_6d8[0xc].low = 0.0;
                        aIStack_6d8[0xc].high = 0.0;
                        aIStack_6d8[5].low = 0.0;
                        aIStack_6d8[1].low = 0.0;
                        aIStack_6d8[4].high = 0.0;
                        aIStack_6d8[0].low = (float)local_598._16_4_;
                        aIStack_6d8[0].high = (float)local_598._20_4_;
                        local_6e8._0_4_ = local_598._0_4_;
                        local_6e8._4_4_ = local_598._4_4_;
                        IStack_6e0.low = (float)local_598._8_4_;
                        IStack_6e0.high = (float)local_598._12_4_;
                        aIStack_6d8[3].low = (float)local_598._24_8_;
                        aIStack_6d8[3].high = SUB84(local_598._24_8_,4);
                        aIStack_6d8[4].low = fStack_578;
                        aIStack_6d8[9].low = TStack_574.z;
                        aIStack_6d8[8].low = TStack_574.x;
                        aIStack_6d8[8].high = TStack_574.y;
                        aIStack_6d8[10].high = fStack_560;
                        aIStack_6d8[9].high = SUB84(pSStack_568,0);
                        aIStack_6d8[10].low = (float)((ulong)pSStack_568 >> 0x20);
                        unique0x1000fb19 = local_650[6];
                        *local_3c8 = CONCAT44(fStack_558,fStack_55c);
                        fVar206 = fStack_548;
                        *(float *)(puVar94 + 1) = fVar210;
                        puVar94 = local_3d8;
                        *(float *)(puVar95 + 1) = fVar206;
                        *puVar95 = pTStack_550;
                        *(float *)(puVar94 + 1) = TStack_544.z;
                        *puVar94 = TStack_544._0_8_;
                        aIStack_6d8[2].high = local_7c8._0_4_;
                        if (*(bool *)(local_8a0.bits + 0x78) == true) {
                          *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
                          aIStack_6d8._12_8_ = uStack_7d0;
                          BSDF::Regularize((BSDF *)&pSStack_810);
                          poVar92 = (optional<pbrt::MediumInteraction> *)aIStack_6d8._12_8_;
                        }
                        else {
                          *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
                          poVar92 = uStack_7d0;
                        }
                        auVar118 = aIStack_6d8._88_16_;
                        pSVar102 = local_8f0;
                        aIStack_6d8[2].low = (float)((ulong)poVar92 >> 0x20);
                        aIStack_6d8[1].high = SUB84(poVar92,0);
                        local_1d8._4_4_ = local_6e8._4_4_;
                        local_1d8._0_4_ = local_6e8._0_4_;
                        local_1d8._8_8_ = CONCAT44(IStack_6e0.high,IStack_6e0.low);
                        local_1d8._16_8_ = CONCAT44(aIStack_6d8[0].high,aIStack_6d8[0].low);
                        local_1d8._24_8_ = CONCAT44(aIStack_6d8[1].high,aIStack_6d8[1].low);
                        local_1d8._32_8_ = CONCAT44(aIStack_6d8[2].high,aIStack_6d8[2].low);
                        local_1d8._40_8_ = CONCAT44(aIStack_6d8[3].high,aIStack_6d8[3].low);
                        local_1d8._48_8_ = CONCAT44(aIStack_6d8[4].high,aIStack_6d8[4].low);
                        local_1d8._56_8_ = CONCAT44(aIStack_6d8[5].high,aIStack_6d8[5].low);
                        local_1d8._68_4_ = aIStack_6d8[6].high;
                        local_1d8._64_4_ = aIStack_6d8[6].low;
                        local_1d8._72_4_ = aIStack_6d8[7].low;
                        local_1d8._76_4_ = aIStack_6d8[7].high;
                        bVar113 = local_d0.set == true;
                        local_1d8._152_8_ = CONCAT71(local_650[0]._1_7_,(undefined1)local_650[0]);
                        local_1d8._160_8_ = CONCAT44(local_650[1]._4_4_,(undefined4)local_650[1]);
                        local_1d8._168_8_ = CONCAT44(local_650[2]._4_4_,(undefined4)local_650[2]);
                        local_1d8._84_4_ = aIStack_6d8[8].high;
                        local_1d8._80_4_ = aIStack_6d8[8].low;
                        local_1d8._88_4_ = aIStack_6d8[9].low;
                        local_1d8._92_4_ = aIStack_6d8[9].high;
                        local_1d8._96_4_ = aIStack_6d8[10].low;
                        local_1d8._100_4_ = aIStack_6d8[10].high;
                        local_1d8._104_4_ = aIStack_6d8[0xb].low;
                        local_1d8._108_4_ = aIStack_6d8[0xb].high;
                        local_1d8._112_4_ = aIStack_6d8[0xc].low;
                        local_1d8._116_4_ = aIStack_6d8[0xc].high;
                        local_1d8._120_4_ = aIStack_6d8[0xd].low;
                        local_1d8._124_4_ = aIStack_6d8[0xd].high;
                        local_1d8._128_4_ = (undefined4)uStack_668;
                        local_1d8._132_4_ = uStack_668._4_4_;
                        local_1d8._136_4_ = uStack_660;
                        local_1d8._140_4_ = (undefined4)uStack_65c;
                        auVar239._16_48_ = local_1d8._96_48_;
                        local_1d8._144_8_ = stack0xfffffffffffff9a8;
                        local_1d8._176_8_ = local_650[3];
                        local_1d8._184_8_ = local_650[4];
                        uVar207 = *local_320;
                        uVar97 = local_320[1];
                        uVar28 = local_320[2];
                        uVar70 = local_320[3];
                        local_1d8._200_8_ = local_650[6];
                        local_1d8._192_8_ = local_650[5];
                        *(undefined8 *)local_3b8[1] = local_320[4];
                        *(undefined8 *)*local_3b8 = uVar207;
                        *(ulong *)(*local_3b8 + 8) = uVar97;
                        *(undefined8 *)(*local_3b8 + 0x10) = uVar28;
                        *(undefined8 *)(*local_3b8 + 0x18) = uVar70;
                        local_e0 = '\x01';
                        aIStack_6d8._88_16_ = auVar118;
                        aIStack_6d8._12_8_ = poVar92;
                        if (bVar113) {
                          LogFatal<char_const(&)[28]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                                     ,0x4d8,"Check failed: %s",
                                     (char (*) [28])"!prevMediumIntr.has_value()");
                        }
                        local_310 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                        auVar255 = ZEXT856((ulong)local_1d8._8_8_);
                        auVar208 = ZEXT856(uVar97);
                        in_ZMM4 = ZEXT1664(local_1d8._64_16_);
                        SVar347 = SampleLd((VolPathIntegrator *)local_8a0.bits,
                                           (Interaction *)local_6e8,(BSDF *)&pSStack_810,local_8f0,
                                           (SamplerHandle *)&local_310,&local_878,&local_898);
                        auVar254._0_8_ = SVar347.values.values._8_8_;
                        auVar254._8_56_ = auVar208;
                        auVar197._0_8_ = SVar347.values.values._0_8_;
                        auVar197._8_56_ = auVar255;
                        auVar118 = *(undefined1 (*) [16])(pSVar102->pdf).values;
                        auVar119 = vmovlhps_avx(auVar197._0_16_,auVar254._0_16_);
                        uVar97 = vcmpps_avx512vl(auVar118,_DAT_00601010,4);
                        auVar118 = vdivps_avx512vl(auVar119,auVar118);
                        fVar206 = (float)((uint)((byte)uVar97 & 1) * auVar118._0_4_);
                        fVar210 = (float)((uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_);
                        in_ZmmResult._4_4_ = fVar210;
                        in_ZmmResult._0_4_ = fVar206;
                        fVar139 = (float)((uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_);
                        in_ZmmResult._8_4_ = fVar139;
                        fVar140 = (float)((uint)((byte)(uVar97 >> 3) & 1) * auVar118._12_4_);
                        in_ZmmResult._12_4_ = fVar140;
                        in_ZmmResult._16_48_ = auVar239._16_48_;
                        local_838.values.values[0] = fVar206 + local_838.values.values[0];
                        local_838.values.values[1] = fVar210 + local_838.values.values[1];
                        local_838.values.values[2] = fVar139 + local_838.values.values[2];
                        local_838.values.values[3] = fVar140 + local_838.values.values[3];
                        local_4b8._0_8_ = *sampler;
                        FVar138 = detail::DispatchSplit<8>::operator()
                                            ((DispatchSplit<8> *)&local_718,local_4b8,
                                             (ulong)local_4b8._0_8_ >> 0x30);
                        local_908._0_4_ = FVar138;
                        TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
                        _uStack_8d0 = 0;
                        local_8e8._16_4_ = aIStack_6d8[1].high;
                        fStack_8d4 = aIStack_6d8[2].low;
                        local_8b8._0_4_ = aIStack_6d8[2].high;
                        uVar96 = (uint)TVar20.y._2_2_;
                        if ((ulong)TVar20 < 0x5000000000000) {
                          if ((ulong)TVar20 < 0x3000000000000) {
                            if (uVar96 == 2) {
                              auVar198._0_8_ =
                                   PaddedSobolSampler::Get2D
                                             ((PaddedSobolSampler *)((ulong)TVar20 & 0xffffffffffff)
                                             );
                              auVar198._8_56_ = extraout_var_27;
                              auVar118 = auVar198._0_16_;
                            }
                            else {
                              auVar202._0_8_ =
                                   HaltonSampler::Get2D
                                             ((HaltonSampler *)((ulong)TVar20 & 0xffffffffffff));
                              auVar202._8_56_ = extraout_var_31;
                              auVar118 = auVar202._0_16_;
                            }
                          }
                          else if ((uVar96 & 6) == 2) {
                            auVar200._0_8_ =
                                 PMJ02BNSampler::Get2D
                                           ((PMJ02BNSampler *)((ulong)TVar20 & 0xffffffffffff));
                            auVar200._8_56_ = extraout_var_29;
                            auVar118 = auVar200._0_16_;
                          }
                          else {
                            auVar204._0_8_ =
                                 RandomSampler::Get2D
                                           ((RandomSampler *)((ulong)TVar20 & 0xffffffffffff));
                            auVar204._8_56_ = extraout_var_33;
                            auVar118 = auVar204._0_16_;
                          }
                        }
                        else {
                          uVar96 = uVar96 - 4;
                          if (uVar96 < 3) {
                            if (uVar96 == 2) {
                              auVar199._0_8_ =
                                   StratifiedSampler::Get2D
                                             ((StratifiedSampler *)((ulong)TVar20 & 0xffffffffffff))
                              ;
                              auVar199._8_56_ = extraout_var_28;
                              auVar118 = auVar199._0_16_;
                            }
                            else {
                              auVar203._0_8_ =
                                   SobolSampler::Get2D((SobolSampler *)
                                                       ((ulong)TVar20 & 0xffffffffffff));
                              auVar203._8_56_ = extraout_var_32;
                              auVar118 = auVar203._0_16_;
                            }
                          }
                          else {
                            pDVar104 = (DebugMLTSampler *)((ulong)TVar20 & 0xffffffffffff);
                            if ((uVar96 & 0x7ffffffe) == 2) {
                              auVar201._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar104);
                              auVar201._8_56_ = extraout_var_30;
                              auVar118 = auVar201._0_16_;
                            }
                            else {
                              local_8c8._0_4_ = DebugMLTSampler::Get1D(pDVar104);
                              local_8c8._4_4_ = extraout_XMM0_Db_07;
                              uStack_8c0._0_4_ = (float)extraout_XMM0_Dc_07;
                              uStack_8c0._4_4_ = (float)extraout_XMM0_Dd_07;
                              auVar205._0_4_ = DebugMLTSampler::Get1D(pDVar104);
                              auVar205._4_60_ = extraout_var_03;
                              auVar118 = vinsertps_avx(_local_8c8,auVar205._0_16_,0x10);
                            }
                          }
                        }
                        auVar119 = stack0xfffffffffffff728;
                        local_4b8._0_8_ = vmovlps_avx(auVar118);
                        woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_8b8._0_4_;
                        woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_8e8._16_4_;
                        woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_8d4;
                        unique0x1000fa15 = auVar119;
                        BSDF::Sample_f(&local_718,(BSDF *)&pSStack_810,woRender_01,
                                       (Float)local_908._0_4_,(Point2f *)local_4b8,Radiance,All);
                        SVar347.values.values = local_898.values.values;
                        if (0.0 < local_718.pdf) {
                          local_90c = (bool)((byte)(undefined1)local_718.flags >> 4 & 1);
                          auVar118 = vfmadd132ss_fma(ZEXT416((uint)uStack_668._4_4_),
                                                     ZEXT416((uint)((float)uStack_660 *
                                                                   local_718.wi.
                                                                                                                                      
                                                  super_Tuple3<pbrt::Vector3,_float>.z)),
                                                  ZEXT416((uint)local_718.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                         ));
                          auVar119 = vfmsub213ss_fma(ZEXT416((uint)local_718.wi.
                                                                                                                                      
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                  ZEXT416((uint)uStack_660),
                                                  ZEXT416((uint)((float)uStack_660 *
                                                                local_718.wi.
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                                )));
                          in_ZMM4 = ZEXT1664(auVar119);
                          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar118._0_4_ + auVar119._0_4_)
                                                            ),ZEXT416((uint)(undefined4)uStack_668),
                                                     ZEXT416((uint)local_718.wi.
                                                                                                                                      
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
                          uVar257 = auVar118._0_4_;
                          auVar233._4_4_ = uVar257;
                          auVar233._0_4_ = uVar257;
                          auVar233._8_4_ = uVar257;
                          auVar233._12_4_ = uVar257;
                          auVar39._8_4_ = 0x7fffffff;
                          auVar39._0_8_ = 0x7fffffff7fffffff;
                          auVar39._12_4_ = 0x7fffffff;
                          in_ZmmResult._0_16_ = vandps_avx512vl(auVar233,auVar39);
                          local_898.values.values[1] = local_718.pdf * local_898.values.values[1];
                          local_898.values.values[0] = local_718.pdf * local_898.values.values[0];
                          local_898.values.values[2] = local_718.pdf * local_898.values.values[2];
                          local_898.values.values[3] = local_718.pdf * local_898.values.values[3];
                          local_748.values.values = SVar347.values.values;
                          local_878.values.values[1] =
                               in_ZmmResult._4_4_ * local_718.f.values.values[1] *
                               local_878.values.values[1];
                          local_878.values.values[0] =
                               in_ZmmResult._0_4_ * local_718.f.values.values[0] *
                               local_878.values.values[0];
                          local_878.values.values[2] =
                               in_ZmmResult._8_4_ * local_718.f.values.values[2] *
                               local_878.values.values[2];
                          local_878.values.values[3] =
                               in_ZmmResult._12_4_ * local_718.f.values.values[3] *
                               local_878.values.values[3];
                          Interaction::SpawnRay
                                    ((RayDifferential *)local_4b8,(Interaction *)local_6e8,
                                     &local_718.wi);
                          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)local_4b8._12_4_;
                          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)local_4b8._16_4_;
                          *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                               local_4b8._20_8_;
                          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
                               (float)local_4b8._0_4_;
                          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
                               (float)local_4b8._4_4_;
                          *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                               local_4b8._8_8_;
                          (ray->super_Ray).medium.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits = local_4b8._32_8_;
                          auVar86._4_8_ = local_4b8._64_8_;
                          auVar86._0_4_ = local_4b8._60_4_;
                          auVar86._12_20_ = local_4b8._72_20_;
                          *(undefined1 (*) [32])(local_3c0 + 0x14) = auVar86;
                          *(undefined8 *)local_3c0 = local_4b8._40_8_;
                          *(undefined8 *)(local_3c0 + 8) = local_4b8._48_8_;
                          (((Point3f *)(local_3c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).x =
                               (float)local_4b8._56_4_;
                          (((Point3f *)(local_3c0 + 0x10))->super_Tuple3<pbrt::Point3,_float>).y =
                               (float)local_4b8._60_4_;
                          *(undefined8 *)(local_3c0 + 0x18) = local_4b8._64_8_;
                          goto LAB_0044b740;
                        }
                      }
                    }
                  }
                  bVar113 = true;
                }
              }
            }
          }
        }
      }
    }
    else {
      TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
      local_6e8._0_4_ = TVar20.x;
      local_6e8._4_4_ = TVar20.y;
      register0x00001200 =
           ZEXT416((uint)((byte)local_1e8 & 1) * local_2e8._248_4_ +
                   (uint)!(bool)((byte)local_1e8 & 1) * 0x7f800000);
      in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
      FVar138 = detail::DispatchSplit<8>::operator()
                          ((DispatchSplit<8> *)local_828,local_6e8,(ulong)TVar20 >> 0x30);
      local_908._0_4_ = FVar138;
      TVar20 = *(Tuple2<pbrt::Point2,_float> *)sampler;
      local_6e8._0_4_ = TVar20.x;
      local_6e8._4_4_ = TVar20.y;
      FVar138 = detail::DispatchSplit<8>::operator()
                          ((DispatchSplit<8> *)local_828,local_6e8,(ulong)TVar20 >> 0x30);
      IVar141 = aIStack_6d8[7];
      auVar239._16_48_ = in_ZmmResult._16_48_;
      uVar97 = (CONCAT44(extraout_var,local_908._0_4_) ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
      uVar101 = (uVar97 >> 0x2f ^ uVar97) * -0x395b586ca42e166b;
      uVar97 = uVar101 >> 0x2f ^ uVar101;
      local_4b8._8_8_ = uVar97 * 2 + 1;
      uVar101 = (CONCAT44((int)(uVar101 >> 0x20),FVar138) ^ 0x1a929e4d6f47a654) *
                -0x395b586ca42e166b;
      uVar101 = (uVar101 >> 0x2f ^ uVar101) * -0x395b586ca42e166b;
      local_4b8._0_8_ =
           ((uVar101 >> 0x2f ^ uVar101) + 1) * 0x5851f42d4c957f2d + uVar97 * -0x4f5c17a566d501a4 + 1
      ;
      uVar97 = (ray->super_Ray).medium.
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               .bits;
      this_01 = (DenselySampledSpectrum *)(uVar97 & 0xffffffffffff);
      this_00 = (Transform *)(this_01 + 3);
      auVar255 = (undefined1  [56])0x0;
      fStack_800 = (float)local_8a0.bits;
      fStack_7fc = (float)(local_8a0.bits >> 0x20);
      fStack_7f0 = SUB84(local_8f0,0);
      fStack_7ec = (float)((ulong)local_8f0 >> 0x20);
      aIStack_6d8[7].low = (float)uVar97;
      fVar210 = aIStack_6d8[7].low;
      aIStack_6d8[7].high = (float)(uVar97 >> 0x20);
      fVar206 = aIStack_6d8[7].high;
      pTStack_7e0 = (Tuple2<pbrt::Point2,_float> *)sampler;
      aIStack_6d8[7] = IVar141;
      uStack_7d8 = ray;
      if (uVar97 < 0x3000000000000) {
        _local_828 = (Interval<float>)&local_878;
        if ((uVar97 & 0x3000000000000) == 0x2000000000000) {
          IStack_820 = (Interval<float>)&local_90a;
          IStack_818 = (Interval<float>)&local_898;
          uStack_7e8 = (RNG *)local_4b8;
          pSStack_810 = &local_748;
          uStack_808 = (long)local_8e8 + 0xc;
          pSStack_7f8 = &local_838;
          uStack_7d0 = &local_d0;
          local_7c8 = &local_1d8;
          local_7b0 = &local_90b;
          local_7c0 = &local_909;
          local_7b8 = &local_90c;
          uVar8._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar8._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar211._8_8_ = 0;
          auVar211._0_8_ = uVar8;
          fVar139 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_598._8_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar17 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          uVar24 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar258._0_4_ = (float)(undefined4)uVar8 * (float)(undefined4)uVar8;
          auVar258._4_4_ = (float)uVar8._4_4_ * (float)uVar8._4_4_;
          auVar258._8_8_ = 0;
          auVar118 = vmovshdup_avx(auVar258);
          auVar118 = vfmadd231ss_fma(auVar118,auVar211,auVar211);
          auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
          local_8b8 = vsqrtss_avx(auVar118,auVar118);
          fVar140 = local_8b8._0_4_;
          auVar259._4_4_ = fVar140;
          auVar259._0_4_ = fVar140;
          auVar259._8_4_ = fVar140;
          auVar259._12_4_ = fVar140;
          local_908._0_4_ = fVar139 / fVar140;
          register0x00001204 = SUB6012((undefined1  [60])0x0,0);
          auVar118 = vdivps_avx(auVar211,auVar259);
          uVar207 = vmovlps_avx(auVar118);
          local_598._12_4_ = (undefined4)uVar207;
          local_598._16_4_ = (undefined4)((ulong)uVar207 >> 0x20);
          auVar142._4_4_ = uVar17;
          auVar142._0_4_ = uVar17;
          auVar142._8_4_ = uVar17;
          auVar142._12_4_ = uVar17;
          auVar212._4_4_ = uVar24;
          auVar212._0_4_ = uVar24;
          auVar212._8_4_ = uVar24;
          auVar212._12_4_ = uVar24;
          auVar260._4_4_ = local_598._8_4_;
          auVar260._0_4_ = local_598._8_4_;
          auVar260._8_4_ = local_598._8_4_;
          auVar260._12_4_ = local_598._8_4_;
          local_8c8._4_4_ = local_598._12_4_;
          local_8c8._0_4_ = local_598._8_4_;
          uStack_8c0._4_4_ = (float)local_908._0_4_;
          uStack_8c0._0_4_ = (float)local_598._16_4_;
          auVar118 = vmovlhps_avx(auVar142,auVar212);
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar118._0_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar118._4_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar118._8_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar118._12_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)vmovlps_avx(auVar260);
          local_598._0_4_ = uVar17;
          local_598._4_4_ = uVar24;
          local_598._20_4_ = local_908._0_4_;
          Transform::operator()((Point3fi *)local_6e8,this_00,&local_538);
          auVar118 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_max),
                                   ZEXT416(*(uint *)((long)&this_01[3].values.ptr + 4)),0x10);
          auVar119 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_min),
                                   ZEXT416(*(uint *)&this_01[3].values.ptr),0x10);
          fVar139 = (float)local_8b8._0_4_ * (float)local_8e8._16_4_;
          auVar294 = vinsertps_avx(ZEXT416(*(uint *)&this_01[3].values.alloc.memoryResource),
                                   ZEXT416((uint)this_01[3].values.nAlloc),0x10);
          auVar267 = vshufpd_avx(_local_8c8,_local_8c8,1);
          auVar116 = vmovshdup_avx(_local_8c8);
          auVar268 = vshufps_avx(_local_8c8,_local_8c8,0xaa);
          auVar261._0_4_ = auVar268._0_4_ * auVar118._0_4_;
          auVar261._4_4_ = auVar268._4_4_ * auVar118._4_4_;
          auVar261._8_4_ = auVar268._8_4_ * auVar118._8_4_;
          auVar261._12_4_ = auVar268._12_4_ * auVar118._12_4_;
          auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar267._0_4_ *
                                                   *(float *)((long)&this_01[3].values.nStored + 4))
                                            ),auVar116,ZEXT416((uint)this_01[3].values.nStored));
          auVar118 = vfmadd213ps_fma(auVar119,auVar116,auVar261);
          local_7a8 = vfmadd231ss_fma(auVar267,_local_908,ZEXT416((uint)this_01[4].lambda_min));
          uVar257 = local_908._0_4_;
          auVar325._4_4_ = uVar257;
          auVar325._0_4_ = uVar257;
          auVar325._8_4_ = uVar257;
          auVar325._12_4_ = uVar257;
          local_738 = vfmadd213ps_fma(auVar325,auVar294,auVar118);
          _local_5b8 = vmovshdup_avx(local_738);
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_5b8._0_4_ * local_5b8._0_4_)),local_738,
                                     local_738);
          auVar118 = vfmadd231ss_fma(auVar118,local_7a8,local_7a8);
          if (auVar118._0_4_ <= 0.0) {
            auVar146._4_4_ = aIStack_6d8[0].high;
            auVar146._0_4_ = aIStack_6d8[0].low;
            auVar146._8_8_ = 0;
          }
          else {
            auVar280._8_4_ = 0x7fffffff;
            auVar280._0_8_ = 0x7fffffff7fffffff;
            auVar280._12_4_ = 0x7fffffff;
            local_848._0_4_ = fVar139;
            auVar119 = vandps_avx(_local_5b8,auVar280);
            auVar294 = vandps_avx(local_738,auVar280);
            auVar116 = vandps_avx(local_7a8,auVar280);
            auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ * 0.0)),ZEXT816(0) << 0x20,
                                       auVar294);
            auVar119 = vfmadd231ss_fma(auVar119,ZEXT816(0) << 0x20,auVar116);
            fVar139 = auVar119._0_4_ / auVar118._0_4_;
            local_908._0_4_ = fVar139;
            fVar139 = local_738._0_4_ * fVar139;
            i_00.high = fVar139;
            i_00.low = fVar139;
            auVar159._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_6e8,i_00);
            auVar159._8_56_ = extraout_var_04;
            uVar207 = vmovlps_avx(auVar159._0_16_);
            local_6e8._0_4_ = (undefined4)uVar207;
            local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
            i_01.high = (float)local_908._0_4_ * (float)local_5b8._0_4_;
            i_01.low = (float)local_908._0_4_ * (float)local_5b8._0_4_;
            auVar160._0_8_ = Interval<float>::operator+<float>(&IStack_6e0,i_01);
            auVar160._8_56_ = extraout_var_05;
            uVar207 = vmovlps_avx(auVar160._0_16_);
            IStack_6e0.low = (float)uVar207;
            IStack_6e0.high = (float)((ulong)uVar207 >> 0x20);
            i_02.high = (float)local_908._0_4_ * (float)local_7a8._0_4_;
            i_02.low = (float)local_908._0_4_ * (float)local_7a8._0_4_;
            auVar161._0_8_ = Interval<float>::operator+<float>(aIStack_6d8,i_02);
            auVar161._8_56_ = extraout_var_06;
            auVar146 = auVar161._0_16_;
            fVar139 = (float)local_848._0_4_ - (float)local_908._0_4_;
          }
          auVar324 = ZEXT464((uint)fVar139);
          auVar81._4_4_ = local_6e8._4_4_;
          auVar81._0_4_ = local_6e8._0_4_;
          auVar81._8_4_ = IStack_6e0.low;
          auVar81._12_4_ = IStack_6e0.high;
          auVar118 = vhaddps_avx(auVar146,auVar146);
          fVar139 = auVar118._0_4_ * 0.5;
          auVar119 = ZEXT816(0) << 0x40;
          bVar113 = false;
          uVar96 = 0;
          auVar118 = vinsertps_avx(auVar81,ZEXT416((uint)IStack_6e0.high),0x10);
          fVar140 = 1.0 / local_5b8._0_4_;
          auVar216._0_4_ = (float)local_6e8._4_4_ + auVar118._0_4_;
          auVar216._4_4_ = IStack_6e0.low + auVar118._4_4_;
          auVar216._8_4_ = auVar118._8_4_ + 0.0;
          auVar216._12_4_ = auVar118._12_4_ + 0.0;
          auVar29._8_4_ = 0x3f000000;
          auVar29._0_8_ = 0x3f0000003f000000;
          auVar29._12_4_ = 0x3f000000;
          in_ZmmResult._0_16_ = vmulps_avx512vl(auVar216,auVar29);
          in_ZmmResult._16_48_ = auVar239._16_48_;
          fVar256 = 1.0 / local_738._0_4_;
          fVar289 = 1.0 / local_7a8._0_4_;
          in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar289));
          local_798._0_4_ = fVar139;
          auVar118 = vmovshdup_avx(in_ZmmResult._0_16_);
          auVar255 = (undefined1  [56])0x0;
          do {
            auVar294 = ZEXT416((uint)(fVar256 *
                                     (*(float *)&(this_01->values).alloc.memoryResource -
                                     in_ZmmResult._0_4_)));
            psVar106 = (size_t *)((long)&(this_01->values).ptr + 4);
            fVar112 = in_ZmmResult._0_4_;
            fVar209 = fVar256;
            if ((uVar96 != 0) &&
               (auVar294 = ZEXT416((uint)(fVar140 *
                                         (*(float *)((long)&(this_01->values).alloc.memoryResource +
                                                    4) - auVar118._0_4_))),
               psVar106 = &(this_01->values).nAlloc, fVar112 = auVar118._0_4_, fVar209 = fVar140,
               uVar96 != 1)) {
              auVar294 = ZEXT416((uint)(fVar289 * (*(float *)&(this_01->values).ptr - fVar139)));
              psVar106 = (size_t *)((long)&(this_01->values).nAlloc + 4);
              fVar112 = fVar139;
              fVar209 = fVar289;
            }
            auVar267 = ZEXT416((uint)((*(float *)psVar106 - fVar112) * fVar209));
            auVar116 = vminss_avx(auVar267,auVar294);
            auVar294 = vmaxss_avx(auVar294,auVar267);
            auVar119 = vmaxss_avx(auVar116,auVar119);
            auVar294 = vminss_avx(ZEXT416((uint)(auVar294._0_4_ * 1.0000004)),auVar324._0_16_);
            auVar324 = ZEXT1664(auVar294);
            if (auVar294._0_4_ < auVar119._0_4_) {
              if (!bVar113) goto LAB_0044a67a;
              break;
            }
            bVar113 = 1 < uVar96;
            uVar96 = uVar96 + 1;
          } while (uVar96 != 3);
          uVar207 = 0;
          local_848._0_4_ = auVar294._0_4_;
          _local_908 = ZEXT416((uint)this_01[2].values.nStored);
          unique0x1000f9e5 = auVar119;
          _local_4d8 = in_ZmmResult._0_16_;
          _local_408 = auVar118;
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,local_8f0);
          auVar237._0_8_ = SVar347.values.values._8_8_;
          auVar237._8_56_ = auVar255;
          local_8b8._8_8_ = uVar207;
          local_8b8._0_8_ = SVar347.values.values._0_8_;
          _local_8c8 = auVar237._0_16_;
          auVar208 = (undefined1  [56])0x0;
          local_788 = ZEXT416((uint)this_01[2].values.nStored);
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,local_8f0);
          auVar218 = stack0xfffffffffffff728;
          auVar238._0_8_ = SVar347.values.values._8_8_;
          auVar238._8_56_ = auVar255;
          auVar168._0_8_ = SVar347.values.values._0_8_;
          auVar168._8_56_ = auVar208;
          fVar139 = *(float *)&(this_01->values).ptr;
          auVar294 = vpcmpeqd_avx(auVar294,auVar294);
          auVar150 = ZEXT816(0) << 0x40;
          uVar93 = local_908._0_4_;
          lVar107 = 0;
          local_908 = (undefined1  [8])&this_01[10].values;
          fVar256 = *(float *)((long)&(this_01->values).nAlloc + 4) - fVar139;
          auVar295._0_4_ = local_7a8._0_4_ / fVar256;
          auVar295._4_12_ = local_7a8._4_12_;
          local_8e8._0_4_ = auVar295._0_4_;
          auVar269._8_8_ = 0;
          auVar269._0_8_ = (this_01->values).alloc.memoryResource;
          auVar286._8_8_ = 0;
          auVar286._0_8_ = *(ulong *)((long)&(this_01->values).ptr + 4);
          iVar114 = *(int *)&this_01[10].values.ptr;
          auVar119 = vsubps_avx(auVar286,auVar269);
          auVar118 = vsubps_avx(_local_4d8,auVar269);
          auVar118 = vdivps_avx(auVar118,auVar119);
          auVar119 = vdivps_avx(local_738,auVar119);
          auVar116 = vbroadcastss_avx512vl(stack0xfffffffffffff728);
          local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x = auVar119._0_4_;
          uVar257 = vextractps_avx(auVar119,1);
          local_868 = (undefined1  [4])uVar257;
          auVar270._0_4_ = auVar118._0_4_ + auVar116._0_4_ * auVar119._0_4_;
          auVar270._4_4_ = auVar118._4_4_ + auVar116._4_4_ * auVar119._4_4_;
          auVar270._8_4_ = auVar118._8_4_ + auVar116._8_4_ * auVar119._8_4_;
          auVar270._12_4_ = auVar118._12_4_ + auVar116._12_4_ * auVar119._12_4_;
          auVar301._8_8_ = 0;
          auVar301._0_8_ = this_01[10].values.alloc.memoryResource;
          auVar118 = vcvtdq2ps_avx(auVar301);
          auVar119 = vpaddd_avx(auVar294,auVar301);
          auVar119 = vcvtdq2ps_avx(auVar119);
          fVar140 = auVar118._0_4_;
          auVar308._0_4_ = auVar270._0_4_ * fVar140;
          auVar308._4_4_ = auVar270._4_4_ * auVar118._4_4_;
          auVar308._8_4_ = auVar270._8_4_ * auVar118._8_4_;
          auVar308._12_4_ = auVar270._12_4_ * auVar118._12_4_;
          auVar116 = vmovshdup_avx(auVar119);
          uVar97 = vcmpps_avx512vl(auVar119,auVar308,1);
          auVar267 = vmovshdup_avx(auVar308);
          uVar207 = vcmpss_avx512f(auVar267,auVar150,1);
          bVar100 = (byte)(uVar97 >> 1);
          auVar294 = vmovlhps_avx(auVar168._0_16_,auVar238._0_16_);
          auVar268 = vunpcklpd_avx(local_8b8,_local_8c8);
          local_418._0_4_ = (float)uVar93 * auVar268._0_4_;
          local_418._4_4_ = (float)uVar93 * auVar268._4_4_;
          fStack_410 = (float)uVar93 * auVar268._8_4_;
          fStack_40c = (float)uVar93 * auVar268._12_4_;
          local_338 = (float)local_788._0_4_ * auVar294._0_4_;
          fStack_334 = (float)local_788._0_4_ * auVar294._4_4_;
          fStack_330 = (float)local_788._0_4_ * auVar294._8_4_;
          fStack_32c = (float)local_788._0_4_ * auVar294._12_4_;
          auVar117 = vmulss_avx512f(stack0xfffffffffffff728,auVar295);
          auVar294 = vmovshdup_avx(auVar118);
          auVar268 = vmovshdup_avx(auVar270);
          local_348._0_4_ = (float)local_418._0_4_ + local_338;
          local_348._4_4_ = (float)local_418._4_4_ + fStack_334;
          local_348._8_4_ = fStack_410 + fStack_330;
          local_348._12_4_ = fStack_40c + fStack_32c;
          auVar324 = ZEXT1664(local_348);
          fVar139 = ((float)local_798._0_4_ - fVar139) / fVar256 + auVar117._0_4_;
          auVar118 = vcvtsi2ss_avx512f(in_XMM17,iVar114);
          uVar28 = vcmpss_avx512f(auVar308,auVar150,1);
          auVar117 = vcvtsi2ss_avx512f(in_XMM17,iVar114 + -1);
          fVar112 = (float)(int)(float)((uint)!(bool)((byte)uVar207 & 1) *
                                       ((uint)(bVar100 & 1) * auVar116._0_4_ +
                                       (uint)!(bool)(bVar100 & 1) * auVar267._0_4_));
          fVar289 = (float)(int)(float)((uint)!(bool)((byte)uVar28 & 1) *
                                       ((uint)((byte)uVar97 & 1) * auVar119._0_4_ +
                                       (uint)!(bool)((byte)uVar97 & 1) * (int)auVar308._0_4_));
          fVar209 = auVar118._0_4_;
          auVar118 = vminss_avx(auVar117,ZEXT416((uint)(fVar139 * fVar209)));
          uVar207 = vcmpss_avx512f(ZEXT416((uint)(fVar139 * fVar209)),auVar150,1);
          auVar123._16_48_ = auVar239._16_48_;
          auVar123._0_16_ = auVar118;
          fVar256 = (float)((uint)!(bool)((byte)uVar207 & 1) * auVar118._0_4_);
          auVar122._4_60_ = auVar123._4_60_;
          auVar122._0_4_ = fVar256;
          fVar256 = (float)(int)fVar256;
          fVar333 = auVar294._0_4_;
          do {
            pBVar98 = &local_5d8;
            iVar114 = (int)lVar107;
            if (iVar114 != 0) {
              if (iVar114 == 1) {
                pBVar98 = (BSSRDFProbeSegment *)local_868;
              }
              else {
                pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              }
            }
            fVar4 = (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x;
            if ((fVar4 == 0.0) && (!NAN(fVar4))) {
              pBVar98 = &local_5d8;
              if (iVar114 != 0) {
                if (iVar114 == 1) {
                  pBVar98 = (BSSRDFProbeSegment *)local_868;
                }
                else {
                  pBVar98 = (BSSRDFProbeSegment *)local_8e8;
                }
              }
              (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
            }
            fVar4 = aIStack_6d8[8].high;
            sampler = (SamplerHandle *)local_850;
            if (iVar114 == 1) {
              local_778.f.values.values[1] = fVar112;
              pBVar108 = (BSDF *)&local_458.field_0x4;
              puVar109 = (undefined4 *)(local_3a8 + 4);
              pfVar103 = (float *)(local_598 + 4);
              pIVar110 = (Interval<float> *)
                         &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              pBVar98 = (BSSRDFProbeSegment *)local_868;
              fVar331 = fVar112;
            }
            else if (iVar114 == 0) {
              local_778.f.values.values[lVar107] = fVar289;
              pBVar108 = &local_458;
              puVar109 = (undefined4 *)local_3a8;
              pfVar103 = (float *)local_598;
              pIVar110 = (Interval<float> *)&local_538;
              pBVar98 = &local_5d8;
              fVar331 = fVar289;
            }
            else {
              pBVar108 = (BSDF *)&local_458.bxdf;
              puVar109 = auStack_3a0;
              pfVar103 = (float *)(local_598 + 8);
              pIVar110 = &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              local_778.f.values.values[lVar107] = fVar256;
              fVar331 = fVar256;
            }
            if (0.0 <= (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x) {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,(int)fVar331 + 1);
              fVar331 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar335._0_4_ = (fVar331 / fVar333 - auVar268._0_4_) / (float)local_868;
                auVar335._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar122._0_16_ = vaddss_avx512f(auVar218,auVar335);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar122._0_4_;
                fVar331 = (1.0 / fVar333) / (float)local_868;
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&this_01[10].values.alloc.memoryResource + 4);
              }
              else if (iVar114 == 0) {
                auVar334._0_4_ =
                     (fVar331 / fVar140 - auVar270._0_4_) /
                     local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                auVar334._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar122._0_16_ = vaddss_avx512f(auVar218,auVar334);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar122._0_4_;
                fVar331 = (1.0 / fVar140) / local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                pvVar99 = &this_01[10].values;
              }
              else {
                auVar336._0_4_ = (fVar331 / fVar209 - fVar139) / (float)local_8e8._0_4_;
                auVar336._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar122._0_16_ = vaddss_avx512f(auVar218,auVar336);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar122._0_4_;
                fVar331 = (1.0 / fVar209) / (float)local_8e8._0_4_;
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          &this_01[10].values.ptr;
              }
              *pfVar103 = fVar331;
              *puVar109 = 1;
              FVar138 = *(Float *)&(pvVar99->alloc).memoryResource;
            }
            else {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,fVar331);
              fVar331 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar118 = ZEXT416((uint)(fVar331 / fVar333 - auVar268._0_4_));
                auVar332 = local_868;
                fVar331 = -(1.0 / fVar333);
              }
              else if (iVar114 == 0) {
                auVar118 = ZEXT416((uint)(fVar331 / fVar140 - auVar270._0_4_));
                auVar332 = (undefined1  [4])local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                fVar331 = -(1.0 / fVar140);
              }
              else {
                auVar118 = ZEXT416((uint)(fVar331 / fVar209 - fVar139));
                auVar332 = (undefined1  [4])local_8e8._0_4_;
                fVar331 = -(1.0 / fVar209);
              }
              auVar344._0_4_ = auVar118._0_4_ / (float)auVar332;
              auVar344._4_12_ = auVar118._4_12_;
              auVar122._0_16_ = vaddss_avx512f(auVar218,auVar344);
              FVar138 = -NAN;
              *puVar109 = 0xffffffff;
              (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar122._0_4_;
              *pfVar103 = fVar331 / (float)auVar332;
            }
            lVar107 = lVar107 + 1;
            pBVar108->eta = FVar138;
          } while (lVar107 != 3);
          puVar1 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
          uVar96 = (uint)SUB84(local_4b8._0_8_,4) >> 0xd ^ (uint)((ulong)local_4b8._0_8_ >> 0x1b);
          bVar100 = SUB81(local_4b8._0_8_,7) >> 3;
          auVar118 = vcvtusi2ss_avx512f(auVar218,uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
          aIStack_6d8[8].high = (float)((uint)((ulong)puVar1 >> 0x20) | 0x10000);
          fVar139 = aIStack_6d8[8].high;
          auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          in_ZMM4 = ZEXT1664(auVar118);
          local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
          aIStack_6d8[8].high = fVar4;
          fVar140 = (float)local_848._0_4_;
          while( true ) {
            lVar107 = (long)*(int *)(&DAT_0061fea0 +
                                    (ulong)((uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high < local_538.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            fVar256 = (&local_538.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107];
            uVar257 = *(undefined4 *)
                       (this_01[9].values.nAlloc +
                       (((long)(int)local_778.f.values.values[2] *
                         (long)*(int *)((long)&this_01[10].values.alloc.memoryResource + 4) +
                        (long)(int)local_778.f.values.values[1]) *
                        (long)*(int *)&this_01[10].values.alloc.memoryResource +
                       (long)(int)local_778.f.values.values[0]) * 4);
            auVar30._4_4_ = uVar257;
            auVar30._0_4_ = uVar257;
            auVar30._8_4_ = uVar257;
            auVar30._12_4_ = uVar257;
            auVar124._16_48_ = auVar122._16_48_;
            auVar124._0_16_ = vmulps_avx512vl(auVar324._0_16_,auVar30);
            in_ZmmResult = auVar124;
            if (0.0 < auVar124._0_4_) {
              local_5a8._0_4_ = fVar256;
              auVar118 = vsubss_avx512f(ZEXT416((uint)fVar256),auVar218);
              in_ZmmResult._16_48_ = auVar124._16_48_;
              in_ZmmResult._0_16_ = auVar218;
              local_8c8._0_4_ = in_ZMM4._0_4_;
              local_3e8._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
              local_3e8._8_4_ = auVar124._8_4_ ^ 0x80000000;
              local_3e8._12_4_ = auVar124._12_4_ ^ 0x80000000;
              unique0x1000f9f5 = auVar218;
              local_8b8 = auVar124._0_16_;
              fVar140 = expf(auVar118._0_4_ * -auVar124._0_4_);
              fVar140 = 1.0 - fVar140;
              if ((float)local_8c8._0_4_ < fVar140) {
                auVar239 = ZEXT1664(stack0xfffffffffffff728);
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(local_8b8,auVar31);
                _local_3f8 = in_ZmmResult._0_16_;
                do {
                  register0x00001240 = auVar239._0_16_;
                  fVar140 = logf(1.0 - (float)local_8c8._0_4_);
                  fVar140 = local_8e8._16_4_ - fVar140 / (float)local_8b8._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar140);
                  if ((float)local_848._0_4_ <= fVar140) {
                    local_650[0]._0_1_ = false;
                    local_650[1]._0_4_ = 1.0;
                    local_650[1]._4_4_ = 1.0;
                    local_650[2]._0_4_ = 1.0;
                    local_650[2]._4_4_ = 1.0;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)local_828,(MediumSample *)local_6e8);
                    goto LAB_0044a67a;
                  }
                  local_908._0_4_ = fVar140;
                  auVar118 = vinsertps_avx(ZEXT416((uint)(fVar140 * (float)local_738._0_4_ +
                                                         (float)local_4d8._0_4_)),
                                           ZEXT416((uint)(fVar140 * (float)local_5b8._0_4_ +
                                                         (float)local_408._0_4_)),0x10);
                  local_718.f.values.values[2] =
                       fVar140 * (float)local_7a8._0_4_ + (float)local_798._0_4_;
                  local_718.f.values.values._0_8_ = vmovlps_avx(auVar118);
                  fVar140 = fVar140 - local_8e8._16_4_;
                  auVar147._0_4_ = fVar140 * (float)local_3f8._0_4_;
                  auVar147._4_4_ = fVar140 * (float)local_3f8._4_4_;
                  auVar147._8_4_ = fVar140 * fStack_3f0;
                  auVar147._12_4_ = fVar140 * fStack_3ec;
                  auVar32._8_4_ = 0x3fb8aa3b;
                  auVar32._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar32._12_4_ = 0x3fb8aa3b;
                  auVar239._16_48_ = in_ZmmResult._16_48_;
                  auVar118 = vmulps_avx512vl(auVar147,auVar32);
                  _local_8c8 = vroundps_avx(auVar118,9);
                  auVar118 = vsubps_avx(auVar118,_local_8c8);
                  auVar255 = ZEXT856(auVar118._8_8_);
                  auVar217._8_4_ = 0x3da1d5b6;
                  auVar217._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar217._12_4_ = 0x3da1d5b6;
                  auVar33._8_4_ = 0x3e658299;
                  auVar33._0_8_ = 0x3e6582993e658299;
                  auVar33._12_4_ = 0x3e658299;
                  auVar119 = vfmadd213ps_avx512vl(auVar217,auVar118,auVar33);
                  auVar34._8_4_ = 0x3f3263b7;
                  auVar34._0_8_ = 0x3f3263b73f3263b7;
                  auVar34._12_4_ = 0x3f3263b7;
                  auVar119 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar34);
                  auVar35._8_4_ = 0x3f7ff3bf;
                  auVar35._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar35._12_4_ = 0x3f7ff3bf;
                  register0x000008fc = vfmadd213ps_avx512vl(auVar119,auVar118,auVar35);
                  auVar208 = ZEXT856(local_8e8._24_8_);
                  SVar347 = UniformGridMediumProvider::Density
                                      (*(UniformGridMediumProvider **)this_01,(Point3f *)&local_718,
                                       local_8f0);
                  auVar240._0_8_ = SVar347.values.values._8_8_;
                  auVar240._8_56_ = auVar208;
                  auVar169._0_8_ = SVar347.values.values._0_8_;
                  auVar169._8_56_ = auVar255;
                  local_788 = auVar169._0_16_;
                  local_728 = auVar240._0_16_;
                  SVar347 = UniformGridMediumProvider::Le
                                      (*(UniformGridMediumProvider **)this_01,(Point3f *)&local_718,
                                       local_8f0);
                  auVar241._0_8_ = SVar347.values.values._8_8_;
                  auVar241._8_56_ = auVar208;
                  auVar170._0_8_ = SVar347.values.values._0_8_;
                  auVar170._8_56_ = auVar255;
                  auVar271._0_4_ = (int)(float)local_8c8._0_4_;
                  auVar271._4_4_ = (int)(float)local_8c8._4_4_;
                  auVar271._8_4_ = (int)(float)uStack_8c0;
                  auVar271._12_4_ = (int)uStack_8c0._4_4_;
                  fVar140 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                  aIStack_6d8[1].low = (ray->super_Ray).time;
                  auVar118 = vunpcklpd_avx(local_788,local_728);
                  aIStack_6d8[9].low = auVar118._0_4_ * (float)local_418._0_4_;
                  aIStack_6d8[9].high = auVar118._4_4_ * (float)local_418._4_4_;
                  aIStack_6d8[10].low = auVar118._8_4_ * fStack_410;
                  aIStack_6d8[10].high = auVar118._12_4_ * fStack_40c;
                  in_ZMM4 = ZEXT1664(CONCAT412(aIStack_6d8[10].high,
                                               CONCAT48(aIStack_6d8[10].low,
                                                        CONCAT44(aIStack_6d8[9].high,
                                                                 aIStack_6d8[9].low))));
                  aIStack_6d8[0xb].low = auVar118._0_4_ * local_338;
                  aIStack_6d8[0xb].high = auVar118._4_4_ * fStack_334;
                  aIStack_6d8[0xc].low = auVar118._8_4_ * fStack_330;
                  aIStack_6d8[0xc].high = auVar118._12_4_ * fStack_32c;
                  auVar36._8_4_ = 0xffffffe1;
                  auVar36._0_8_ = 0xffffffe1ffffffe1;
                  auVar36._12_4_ = 0xffffffe1;
                  uVar97 = vpcmpgtd_avx512vl(auVar271,auVar36);
                  uVar97 = uVar97 & 0xf;
                  auVar37._8_4_ = 0x1e;
                  auVar37._0_8_ = 0x1e0000001e;
                  auVar37._12_4_ = 0x1e;
                  uVar101 = vpcmpgtd_avx512vl(auVar271,auVar37);
                  uVar101 = uVar101 & 0xf;
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[7].values.ptr +
                                                                     4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[7].values.ptr));
                  auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           (float)this_01[7].lambda_max)),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[7].lambda_min));
                  auVar294 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.alloc
                                                                             .memoryResource + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[6].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[6].values.nAlloc));
                  auVar267 = vfmadd231ss_fma(auVar118,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[7].values.nAlloc));
                  auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[7].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(auVar116,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[6].values.nStored));
                  auVar294 = vfmadd231ss_fma(auVar294,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[6].values.ptr));
                  auVar118 = vpslld_avx(auVar271,0x17);
                  auVar118 = vpaddd_avx(auVar118,stack0xfffffffffffff728);
                  fVar256 = auVar267._0_4_ + *(float *)((long)&this_01[7].values.nAlloc + 4);
                  fVar289 = auVar119._0_4_ +
                            *(float *)((long)&this_01[7].values.alloc.memoryResource + 4);
                  fVar112 = auVar116._0_4_ + *(float *)((long)&this_01[6].values.nStored + 4);
                  fVar209 = auVar294._0_4_ + *(float *)((long)&this_01[6].values.ptr + 4);
                  bVar27 = fVar256 == 1.0;
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar113 = (bool)((byte)uVar101 & 1);
                  auVar120._0_4_ =
                       (uint)bVar113 * auVar119._0_4_ |
                       (uint)!bVar113 * (uint)((byte)uVar97 & 1) * auVar118._0_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 1) & 1);
                  auVar120._4_4_ =
                       (uint)bVar113 * auVar119._4_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 2) & 1);
                  auVar120._8_4_ =
                       (uint)bVar113 * auVar119._8_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_;
                  bVar113 = SUB81(uVar101 >> 3,0);
                  auVar120._12_4_ =
                       (uint)bVar113 * auVar119._12_4_ |
                       (uint)!bVar113 * (uint)(byte)(uVar97 >> 3) * auVar118._12_4_;
                  auVar116 = vshufpd_avx(auVar120,auVar120,1);
                  iVar114 = (uint)bVar27 * (int)fVar289 + (uint)!bVar27 * (int)(fVar289 / fVar256);
                  fVar289 = fVar112 / fVar256;
                  iVar115 = (uint)bVar27 * (int)fVar209 + (uint)!bVar27 * (int)(fVar209 / fVar256);
                  auVar318._4_4_ = iVar115;
                  auVar318._0_4_ = iVar115;
                  auVar318._8_4_ = iVar115;
                  auVar318._12_4_ = iVar115;
                  auVar125._16_48_ = auVar239._16_48_;
                  auVar125._0_16_ = ZEXT416((uint)fVar289);
                  in_ZmmResult._4_60_ = auVar125._4_60_;
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar27 * (int)fVar112 + (uint)!bVar27 * (int)fVar289);
                  uVar10._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar10._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar309._8_8_ = 0;
                  auVar309._0_8_ = uVar10;
                  aIStack_6d8[5].low = 0.0;
                  auVar302._4_4_ = in_ZmmResult._0_4_;
                  auVar302._0_4_ = in_ZmmResult._0_4_;
                  auVar302._8_4_ = in_ZmmResult._0_4_;
                  auVar302._12_4_ = in_ZmmResult._0_4_;
                  auVar119 = vmovlhps_avx(auVar318,auVar302);
                  auVar319._4_4_ = iVar114;
                  auVar319._0_4_ = iVar114;
                  auVar319._8_4_ = iVar114;
                  auVar319._12_4_ = iVar114;
                  auVar327._0_4_ = (float)(undefined4)uVar10 * (float)(undefined4)uVar10;
                  auVar327._4_4_ = (float)uVar10._4_4_ * (float)uVar10._4_4_;
                  auVar327._8_8_ = 0;
                  auVar118 = vmovshdup_avx(auVar327);
                  auVar118 = vfmadd231ss_fma(auVar118,auVar309,auVar309);
                  auVar310._0_8_ = uVar10 ^ 0x8000000080000000;
                  auVar310._8_4_ = 0x80000000;
                  auVar310._12_4_ = 0x80000000;
                  auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar140),ZEXT416((uint)fVar140))
                  ;
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  auVar294 = vmovlhps_avx(auVar170._0_16_,auVar241._0_16_);
                  auVar116 = vunpcklpd_avx(auVar120,auVar116);
                  aIStack_6d8[2].high = auVar118._0_4_;
                  auVar328._4_4_ = aIStack_6d8[2].high;
                  auVar328._0_4_ = aIStack_6d8[2].high;
                  auVar328._8_4_ = aIStack_6d8[2].high;
                  auVar328._12_4_ = aIStack_6d8[2].high;
                  aIStack_6d8[2].high = -fVar140 / aIStack_6d8[2].high;
                  auVar118 = vdivps_avx(auVar310,auVar328);
                  aIStack_6d8[3].low = 0.0;
                  aIStack_6d8[3].high = 0.0;
                  aIStack_6d8[4].low = 0.0;
                  aIStack_6d8[4].high = 0.0;
                  aIStack_6d8[0xd] = local_8b8._0_8_;
                  uStack_668._0_4_ = local_8b8._8_4_;
                  uStack_668._4_4_ = local_8b8._12_4_;
                  local_650[0]._0_1_ = true;
                  local_6e8._0_4_ = auVar119._0_4_;
                  local_6e8._4_4_ = auVar119._4_4_;
                  IStack_6e0.low = auVar119._8_4_;
                  IStack_6e0.high = auVar119._12_4_;
                  uVar207 = vmovlps_avx(auVar319);
                  aIStack_6d8[0].low = (float)uVar207;
                  aIStack_6d8[0].high = (float)((ulong)uVar207 >> 0x20);
                  uVar207 = vmovlps_avx(auVar118);
                  aIStack_6d8[1].high = (float)uVar207;
                  aIStack_6d8[2].low = (float)((ulong)uVar207 >> 0x20);
                  aIStack_6d8[6].low = 0.0;
                  aIStack_6d8[6].high = 0.0;
                  aIStack_6d8[8].low = SUB84(puVar1,0);
                  uStack_660 = auVar294._0_4_;
                  uStack_65c._0_4_ = auVar294._4_4_;
                  stack0xfffffffffffff9a8 = auVar294._8_8_;
                  local_650[1]._0_4_ = auVar116._0_4_;
                  local_650[1]._4_4_ = auVar116._4_4_;
                  local_650[2]._0_4_ = auVar116._8_4_;
                  local_650[2]._4_4_ = auVar116._12_4_;
                  aIStack_6d8[7].low = fVar210;
                  aIStack_6d8[7].high = fVar206;
                  aIStack_6d8[8].high = fVar139;
                  bVar113 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)local_828,
                                       (MediumSample *)local_6e8);
                  if (!bVar113) goto LAB_0044a67a;
                  uVar96 = (uint)SUB84(local_4b8._0_8_,4) >> 0xd ^
                           (uint)((ulong)local_4b8._0_8_ >> 0x1b);
                  bVar100 = SUB81(local_4b8._0_8_,7) >> 3;
                  auVar118 = vcvtusi2ss_avx512f(auVar324._0_16_,
                                                uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
                  auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),
                                        ZEXT416(0x3f7fffff));
                  local_8c8._0_4_ = auVar118._0_4_;
                  local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
                  fVar140 = expf(((float)local_5a8._0_4_ - (float)local_908._0_4_) *
                                 (float)local_3e8._0_4_);
                  auVar239 = ZEXT464((uint)local_908._0_4_);
                  fVar140 = 1.0 - fVar140;
                } while ((float)local_8c8._0_4_ < fVar140);
              }
              auVar324 = ZEXT1664(local_348);
              auVar118 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                    ZEXT416((uint)(((float)local_8c8._0_4_ - fVar140) /
                                                  (1.0 - fVar140))));
              in_ZMM4 = ZEXT1664(auVar118);
              fVar256 = (float)local_5a8._0_4_;
              fVar140 = (float)local_848._0_4_;
            }
            if (fVar140 < fVar256) break;
            fVar289 = (float)((int)local_778.f.values.values[lVar107] +
                             *(int *)(local_3a8 + lVar107 * 4));
            local_778.f.values.values[lVar107] = fVar289;
            if (fVar289 == (&local_458.eta)[lVar107]) break;
            auVar122._16_48_ = in_ZmmResult._16_48_;
            auVar218 = ZEXT416((uint)fVar256);
            auVar122._0_16_ = auVar218;
            (&local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107] =
                 fVar256 + *(float *)(local_598 + lVar107 * 4);
          }
        }
        else {
          IStack_820 = (Interval<float>)&local_90a;
          IStack_818 = (Interval<float>)&local_898;
          pSStack_810 = &local_748;
          uStack_808 = (long)local_8e8 + 0xc;
          pSStack_7f8 = &local_838;
          uStack_7e8 = (RNG *)local_4b8;
          uStack_7d0 = &local_d0;
          local_7c8 = &local_1d8;
          local_7c0 = &local_909;
          local_7b8 = &local_90c;
          local_7b0 = &local_90b;
          uVar5 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar13 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          local_728._4_4_ = uVar13;
          local_728._0_4_ = uVar5;
          local_728._8_8_ = 0;
          local_798._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_848._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          local_7a8._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          local_5a8._0_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar207 = 0;
          _local_908 = ZEXT416((uint)this_01[3].lambda_min);
          SVar347 = DenselySampledSpectrum::Sample(this_01,local_8f0);
          auVar234._0_8_ = SVar347.values.values._8_8_;
          auVar234._8_56_ = auVar255;
          local_8b8._8_8_ = uVar207;
          local_8b8._0_8_ = SVar347.values.values._0_8_;
          _local_8c8 = auVar234._0_16_;
          auVar208 = (undefined1  [56])0x0;
          local_788 = ZEXT416((uint)this_01[3].lambda_min);
          SVar347 = DenselySampledSpectrum::Sample(this_01 + 1,local_8f0);
          auVar239._16_48_ = in_ZmmResult._16_48_;
          auVar235._0_8_ = SVar347.values.values._8_8_;
          auVar235._8_56_ = auVar255;
          auVar165._0_8_ = SVar347.values.values._0_8_;
          auVar165._8_56_ = auVar208;
          auVar118 = vpunpcklqdq_avx(auVar165._0_16_,auVar235._0_16_);
          auVar119 = vunpcklpd_avx(local_8b8,_local_8c8);
          auVar282._0_4_ = (float)local_908._0_4_ * auVar119._0_4_;
          auVar282._4_4_ = (float)local_908._0_4_ * auVar119._4_4_;
          auVar282._8_4_ = (float)local_908._0_4_ * auVar119._8_4_;
          auVar282._12_4_ = (float)local_908._0_4_ * auVar119._12_4_;
          fVar210 = (float)local_788._0_4_ * auVar118._0_4_;
          fVar206 = (float)local_788._0_4_ * auVar118._4_4_;
          fVar139 = (float)local_788._0_4_ * auVar118._8_4_;
          fVar140 = (float)local_788._0_4_ * auVar118._12_4_;
          auVar266._0_4_ = fVar210 + auVar282._0_4_;
          auVar266._4_4_ = fVar206 + auVar282._4_4_;
          auVar266._8_4_ = fVar139 + auVar282._8_4_;
          auVar266._12_4_ = fVar140 + auVar282._12_4_;
          if ((auVar266._0_4_ != 0.0) || (NAN(auVar266._0_4_))) {
            local_8c8._4_4_ = fVar206;
            local_8c8._0_4_ = fVar210;
            uStack_8c0._0_4_ = fVar139;
            uStack_8c0._4_4_ = fVar140;
            auVar144._0_4_ = local_728._0_4_ * local_728._0_4_;
            auVar144._4_4_ = local_728._4_4_ * local_728._4_4_;
            auVar144._8_4_ = local_728._8_4_ * local_728._8_4_;
            auVar144._12_4_ = local_728._12_4_ * local_728._12_4_;
            auVar118 = vmovshdup_avx(auVar144);
            uVar96 = (uint)SUB84(local_4b8._0_8_,4) >> 0xd ^ (uint)((ulong)local_4b8._0_8_ >> 0x1b);
            auVar118 = vfmadd231ss_fma(auVar118,local_728,local_728);
            bVar100 = SUB81(local_4b8._0_8_,7) >> 3;
            auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)local_798._0_4_),
                                       ZEXT416((uint)local_798._0_4_));
            local_788 = vsqrtss_avx(auVar118,auVar118);
            register0x00001200 = ZEXT416((uint)(local_788._0_4_ * (float)local_8e8._16_4_));
            auVar118 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,
                                          uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
            auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            _local_908 = auVar266;
            local_8b8 = auVar282;
            local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
            fVar210 = logf(1.0 - auVar118._0_4_);
            fVar210 = -fVar210 / (float)local_908._0_4_;
            fVar206 = local_8e8._16_4_;
            if (fVar206 <= fVar210) {
              local_650[0]._0_1_ = false;
              auVar152._0_4_ = (float)local_908._0_4_ * -fVar206;
              auVar152._4_4_ = (float)local_908._4_4_ * -fVar206;
              auVar152._8_4_ = fStack_900 * -fVar206;
              auVar152._12_4_ = fStack_8fc * -fVar206;
              auVar46._8_4_ = 0x3fb8aa3b;
              auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar46._12_4_ = 0x3fb8aa3b;
              auVar119 = vmulps_avx512vl(auVar152,auVar46);
              auVar278._8_4_ = 0x3da1d5b6;
              auVar278._0_8_ = 0x3da1d5b63da1d5b6;
              auVar278._12_4_ = 0x3da1d5b6;
              auVar118 = vroundps_avx(auVar119,9);
              auVar119 = vsubps_avx(auVar119,auVar118);
              auVar47._8_4_ = 0x3e658299;
              auVar47._0_8_ = 0x3e6582993e658299;
              auVar47._12_4_ = 0x3e658299;
              auVar294 = vfmadd213ps_avx512vl(auVar278,auVar119,auVar47);
              auVar223._0_4_ = (int)auVar118._0_4_;
              auVar223._4_4_ = (int)auVar118._4_4_;
              auVar223._8_4_ = (int)auVar118._8_4_;
              auVar223._12_4_ = (int)auVar118._12_4_;
              auVar48._8_4_ = 0xffffffe1;
              auVar48._0_8_ = 0xffffffe1ffffffe1;
              auVar48._12_4_ = 0xffffffe1;
              uVar97 = vpcmpgtd_avx512vl(auVar223,auVar48);
              uVar97 = uVar97 & 0xf;
              auVar49._8_4_ = 0x1e;
              auVar49._0_8_ = 0x1e0000001e;
              auVar49._12_4_ = 0x1e;
              uVar101 = vpcmpgtd_avx512vl(auVar223,auVar49);
              uVar101 = uVar101 & 0xf;
              auVar50._8_4_ = 0x3f3263b7;
              auVar50._0_8_ = 0x3f3263b73f3263b7;
              auVar50._12_4_ = 0x3f3263b7;
              auVar118 = vfmadd213ps_avx512vl(auVar294,auVar119,auVar50);
              auVar51._8_4_ = 0x3f7ff3bf;
              auVar51._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar51._12_4_ = 0x3f7ff3bf;
              auVar118 = vfmadd213ps_avx512vl(auVar118,auVar119,auVar51);
              auVar119 = vpslld_avx(auVar223,0x17);
              auVar118 = vpaddd_avx(auVar119,auVar118);
              auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar113 = (bool)((byte)uVar101 & 1);
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar113 * auVar119._0_4_ |
                          (uint)!bVar113 * (uint)((byte)uVar97 & 1) * auVar118._0_4_);
              bVar113 = (bool)((byte)(uVar101 >> 1) & 1);
              in_ZmmResult._4_4_ =
                   (float)((uint)bVar113 * auVar119._4_4_ |
                          (uint)!bVar113 * (uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_);
              bVar113 = (bool)((byte)(uVar101 >> 2) & 1);
              in_ZmmResult._8_4_ =
                   (float)((uint)bVar113 * auVar119._8_4_ |
                          (uint)!bVar113 * (uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_);
              bVar113 = SUB81(uVar101 >> 3,0);
              in_ZmmResult._12_4_ =
                   (float)((uint)bVar113 * auVar119._12_4_ |
                          (uint)!bVar113 * (uint)(byte)(uVar97 >> 3) * auVar118._12_4_);
              in_ZmmResult._16_48_ = auVar239._16_48_;
              local_650[1]._0_4_ = in_ZmmResult._0_4_;
              local_650[1]._4_4_ = in_ZmmResult._4_4_;
              local_650[2]._0_4_ = in_ZmmResult._8_4_;
              local_650[2]._4_4_ = in_ZmmResult._12_4_;
              Li::anon_class_128_16_8a10e554::operator()
                        ((anon_class_128_16_8a10e554 *)local_828,(MediumSample *)local_6e8);
            }
            else {
              stack0xfffffffffffff728 =
                   (Interval<float>)(CONCAT44(extraout_var_00._0_4_,fVar210) ^ 0x8000000000000000);
              uStack_8d0 = extraout_var_00._4_4_ ^ 0x80000000;
              uStack_8cc = extraout_var_00._8_4_ ^ 0x80000000;
              auVar145._0_4_ = (float)local_908._0_4_ * -fVar210;
              auVar145._4_4_ = (float)local_908._4_4_ * -fVar210;
              auVar145._8_4_ = fStack_900 * -fVar210;
              auVar145._12_4_ = fStack_8fc * -fVar210;
              auVar40._8_4_ = 0x3fb8aa3b;
              auVar40._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar40._12_4_ = 0x3fb8aa3b;
              auVar118 = vmulps_avx512vl(auVar145,auVar40);
              _local_5b8 = vroundps_avx(auVar118,9);
              auVar118 = vsubps_avx(auVar118,_local_5b8);
              auVar255 = ZEXT856(auVar118._8_8_);
              auVar215._8_4_ = 0x3da1d5b6;
              auVar215._0_8_ = 0x3da1d5b63da1d5b6;
              auVar215._12_4_ = 0x3da1d5b6;
              auVar41._8_4_ = 0x3e658299;
              auVar41._0_8_ = 0x3e6582993e658299;
              auVar41._12_4_ = 0x3e658299;
              auVar119 = vfmadd213ps_avx512vl(auVar215,auVar118,auVar41);
              auVar42._8_4_ = 0x3f3263b7;
              auVar42._0_8_ = 0x3f3263b73f3263b7;
              auVar42._12_4_ = 0x3f3263b7;
              auVar119 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar42);
              auVar43._8_4_ = 0x3f7ff3bf;
              auVar43._0_8_ = 0x3f7ff3bf3f7ff3bf;
              auVar43._12_4_ = 0x3f7ff3bf;
              local_738 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar43);
              auVar208 = ZEXT856(local_738._8_8_);
              SVar347 = DenselySampledSpectrum::Sample(this_01 + 2,local_8f0);
              auVar268 = _local_8c8;
              auVar236._0_8_ = SVar347.values.values._8_8_;
              auVar236._8_56_ = auVar208;
              auVar166._0_8_ = SVar347.values.values._0_8_;
              auVar166._8_56_ = auVar255;
              auVar293._0_4_ = (int)(float)local_5b8._0_4_;
              auVar293._4_4_ = (int)(float)local_5b8._4_4_;
              auVar293._8_4_ = (int)fStack_5b0;
              auVar293._12_4_ = (int)fStack_5ac;
              auVar119 = vmovlhps_avx(auVar166._0_16_,auVar236._0_16_);
              aIStack_6d8[7] = (Interval<float>)&this_01[0x66666666666].values.ptr;
              aIStack_6d8[8].high = (float)((uint)((ulong)&this_01[3].lambda_max >> 0x20) | 0x10000)
              ;
              auVar44._8_4_ = 0xffffffe1;
              auVar44._0_8_ = 0xffffffe1ffffffe1;
              auVar44._12_4_ = 0xffffffe1;
              uVar97 = vpcmpgtd_avx512vl(auVar293,auVar44);
              uVar97 = uVar97 & 0xf;
              auVar45._8_4_ = 0x1e;
              auVar45._0_8_ = 0x1e0000001e;
              auVar45._12_4_ = 0x1e;
              uVar101 = vpcmpgtd_avx512vl(auVar293,auVar45);
              uVar101 = uVar101 & 0xf;
              auVar283._4_4_ = local_788._0_4_;
              auVar283._0_4_ = local_788._0_4_;
              auVar283._8_4_ = local_788._0_4_;
              auVar283._12_4_ = local_788._0_4_;
              auVar118 = vshufpd_avx(local_8b8,local_8b8,1);
              auVar267 = vunpcklpd_avx(local_8b8,auVar118);
              auVar118 = vdivps_avx(local_728,auVar283);
              auVar294 = vpslld_avx(auVar293,0x17);
              auVar294 = vpaddd_avx(auVar294,local_738);
              auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar113 = (bool)((byte)uVar101 & 1);
              in_ZmmResult._0_4_ =
                   (float)((uint)bVar113 * auVar116._0_4_ |
                          (uint)!bVar113 * (uint)((byte)uVar97 & 1) * auVar294._0_4_);
              bVar113 = (bool)((byte)(uVar101 >> 1) & 1);
              in_ZmmResult._4_4_ =
                   (float)((uint)bVar113 * auVar116._4_4_ |
                          (uint)!bVar113 * (uint)((byte)(uVar97 >> 1) & 1) * auVar294._4_4_);
              bVar113 = (bool)((byte)(uVar101 >> 2) & 1);
              in_ZmmResult._8_4_ =
                   (float)((uint)bVar113 * auVar116._8_4_ |
                          (uint)!bVar113 * (uint)((byte)(uVar97 >> 2) & 1) * auVar294._8_4_);
              bVar113 = SUB81(uVar101 >> 3,0);
              in_ZmmResult._12_4_ =
                   (float)((uint)bVar113 * auVar116._12_4_ |
                          (uint)!bVar113 * (uint)(byte)(uVar97 >> 3) * auVar294._12_4_);
              in_ZmmResult._16_48_ = auVar239._16_48_;
              auVar116 = vshufpd_avx(_local_908,_local_908,1);
              auVar294 = vmovshdup_avx(auVar118);
              fVar210 = (float)local_8e8._16_4_ * auVar118._0_4_ + (float)local_848._0_4_;
              auVar284._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
              auVar284._8_4_ = auVar118._8_4_ ^ 0x80000000;
              auVar284._12_4_ = auVar118._12_4_ ^ 0x80000000;
              fVar206 = auVar294._0_4_ * (float)local_8e8._16_4_ + (float)local_7a8._0_4_;
              fVar139 = (float)local_8e8._16_4_ * ((float)local_798._0_4_ / (float)local_788._0_4_)
                        + (float)local_5a8._0_4_;
              aIStack_6d8[2].high = -((float)local_798._0_4_ / (float)local_788._0_4_);
              in_ZMM4 = ZEXT1664(CONCAT412(0x80000000,
                                           CONCAT48(0x80000000,
                                                    CONCAT44(0x80000000,aIStack_6d8[2].high))));
              aIStack_6d8[1].low = (ray->super_Ray).time;
              aIStack_6d8[5].low = 0.0;
              auVar300._4_4_ = fVar210;
              auVar300._0_4_ = fVar210;
              auVar300._8_4_ = fVar210;
              auVar300._12_4_ = fVar210;
              auVar306._4_4_ = fVar206;
              auVar306._0_4_ = fVar206;
              auVar306._8_4_ = fVar206;
              auVar306._12_4_ = fVar206;
              auVar118 = vmovlhps_avx(auVar300,auVar306);
              auVar307._4_4_ = fVar139;
              auVar307._0_4_ = fVar139;
              auVar307._8_4_ = fVar139;
              auVar307._12_4_ = fVar139;
              aIStack_6d8[3].low = 0.0;
              aIStack_6d8[3].high = 0.0;
              aIStack_6d8[4].low = 0.0;
              aIStack_6d8[4].high = 0.0;
              aIStack_6d8[0xb].low = (float)local_8c8._0_4_;
              aIStack_6d8[0xb].high = (float)local_8c8._4_4_;
              aIStack_6d8[0xc].low = (float)uStack_8c0;
              aIStack_6d8[0xc].high = uStack_8c0._4_4_;
              local_650[0]._0_1_ = true;
              local_6e8._0_4_ = auVar118._0_4_;
              local_6e8._4_4_ = auVar118._4_4_;
              IStack_6e0.low = auVar118._8_4_;
              IStack_6e0.high = auVar118._12_4_;
              uVar207 = vmovlps_avx(auVar307);
              aIStack_6d8[0].low = (float)uVar207;
              aIStack_6d8[0].high = (float)((ulong)uVar207 >> 0x20);
              uVar207 = vmovlps_avx(auVar284);
              aIStack_6d8[1].high = (float)uVar207;
              aIStack_6d8[2].low = (float)((ulong)uVar207 >> 0x20);
              auVar118 = vunpcklpd_avx(_local_908,auVar116);
              aIStack_6d8[6].low = 0.0;
              aIStack_6d8[6].high = 0.0;
              aIStack_6d8[8].low = SUB84(&this_01[3].lambda_max,0);
              aIStack_6d8[9].low = auVar267._0_4_;
              aIStack_6d8[9].high = auVar267._4_4_;
              aIStack_6d8[10].low = auVar267._8_4_;
              aIStack_6d8[10].high = auVar267._12_4_;
              aIStack_6d8[0xd] = auVar118._0_8_;
              uStack_668._0_4_ = auVar118._8_4_;
              uStack_668._4_4_ = auVar118._12_4_;
              uStack_660 = auVar119._0_4_;
              uStack_65c._0_4_ = auVar119._4_4_;
              stack0xfffffffffffff9a8 = auVar119._8_8_;
              _local_8c8 = auVar268;
              local_650[1]._0_4_ = in_ZmmResult._0_4_;
              local_650[1]._4_4_ = in_ZmmResult._4_4_;
              local_650[2]._0_4_ = in_ZmmResult._8_4_;
              local_650[2]._4_4_ = in_ZmmResult._12_4_;
              Li::anon_class_128_16_8a10e554::operator()
                        ((anon_class_128_16_8a10e554 *)local_828,(MediumSample *)local_6e8);
            }
          }
        }
      }
      else {
        _local_828 = (Interval<float>)&local_878;
        if ((uVar97 & 0xfffe000000000000) == 0x2000000000000) {
          IStack_820 = (Interval<float>)&local_90a;
          IStack_818 = (Interval<float>)&local_898;
          uStack_7e8 = (RNG *)local_4b8;
          pSStack_810 = &local_748;
          uStack_808 = (long)local_8e8 + 0xc;
          pSStack_7f8 = &local_838;
          uStack_7d0 = &local_d0;
          local_7c8 = &local_1d8;
          local_7b0 = &local_90b;
          local_7c0 = &local_909;
          local_7b8 = &local_90c;
          uVar9._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar9._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar213._8_8_ = 0;
          auVar213._0_8_ = uVar9;
          fVar139 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_598._8_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar18 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          uVar25 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar262._0_4_ = (float)(undefined4)uVar9 * (float)(undefined4)uVar9;
          auVar262._4_4_ = (float)uVar9._4_4_ * (float)uVar9._4_4_;
          auVar262._8_8_ = 0;
          auVar118 = vmovshdup_avx(auVar262);
          auVar118 = vfmadd231ss_fma(auVar118,auVar213,auVar213);
          auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
          local_8b8 = vsqrtss_avx(auVar118,auVar118);
          fVar140 = local_8b8._0_4_;
          auVar263._4_4_ = fVar140;
          auVar263._0_4_ = fVar140;
          auVar263._8_4_ = fVar140;
          auVar263._12_4_ = fVar140;
          local_908._0_4_ = fVar139 / fVar140;
          register0x00001204 = SUB6012((undefined1  [60])0x0,0);
          auVar118 = vdivps_avx(auVar213,auVar263);
          uVar207 = vmovlps_avx(auVar118);
          local_598._12_4_ = (undefined4)uVar207;
          local_598._16_4_ = (undefined4)((ulong)uVar207 >> 0x20);
          auVar143._4_4_ = uVar18;
          auVar143._0_4_ = uVar18;
          auVar143._8_4_ = uVar18;
          auVar143._12_4_ = uVar18;
          auVar214._4_4_ = uVar25;
          auVar214._0_4_ = uVar25;
          auVar214._8_4_ = uVar25;
          auVar214._12_4_ = uVar25;
          auVar264._4_4_ = local_598._8_4_;
          auVar264._0_4_ = local_598._8_4_;
          auVar264._8_4_ = local_598._8_4_;
          auVar264._12_4_ = local_598._8_4_;
          local_8c8._4_4_ = local_598._12_4_;
          local_8c8._0_4_ = local_598._8_4_;
          uStack_8c0._4_4_ = (float)local_908._0_4_;
          uStack_8c0._0_4_ = (float)local_598._16_4_;
          auVar118 = vmovlhps_avx(auVar143,auVar214);
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar118._0_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar118._4_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar118._8_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar118._12_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)vmovlps_avx(auVar264);
          local_598._0_4_ = uVar18;
          local_598._4_4_ = uVar25;
          local_598._20_4_ = local_908._0_4_;
          Transform::operator()((Point3fi *)local_6e8,this_00,&local_538);
          auVar118 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_max),
                                   ZEXT416(*(uint *)((long)&this_01[3].values.ptr + 4)),0x10);
          auVar119 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_min),
                                   ZEXT416(*(uint *)&this_01[3].values.ptr),0x10);
          fVar139 = (float)local_8b8._0_4_ * (float)local_8e8._16_4_;
          auVar294 = vinsertps_avx(ZEXT416(*(uint *)&this_01[3].values.alloc.memoryResource),
                                   ZEXT416((uint)this_01[3].values.nAlloc),0x10);
          auVar267 = vshufpd_avx(_local_8c8,_local_8c8,1);
          auVar116 = vmovshdup_avx(_local_8c8);
          auVar268 = vshufps_avx(_local_8c8,_local_8c8,0xaa);
          auVar265._0_4_ = auVar268._0_4_ * auVar118._0_4_;
          auVar265._4_4_ = auVar268._4_4_ * auVar118._4_4_;
          auVar265._8_4_ = auVar268._8_4_ * auVar118._8_4_;
          auVar265._12_4_ = auVar268._12_4_ * auVar118._12_4_;
          auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar267._0_4_ *
                                                   *(float *)((long)&this_01[3].values.nStored + 4))
                                            ),auVar116,ZEXT416((uint)this_01[3].values.nStored));
          auVar118 = vfmadd213ps_fma(auVar119,auVar116,auVar265);
          local_798 = vfmadd231ss_fma(auVar267,_local_908,ZEXT416((uint)this_01[4].lambda_min));
          uVar257 = local_908._0_4_;
          auVar326._4_4_ = uVar257;
          auVar326._0_4_ = uVar257;
          auVar326._8_4_ = uVar257;
          auVar326._12_4_ = uVar257;
          local_7a8 = vfmadd213ps_fma(auVar326,auVar294,auVar118);
          local_5a8 = vmovshdup_avx(local_7a8);
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_5a8._0_4_ * local_5a8._0_4_)),local_7a8,
                                     local_7a8);
          auVar118 = vfmadd231ss_fma(auVar118,local_798,local_798);
          if (auVar118._0_4_ <= 0.0) {
            auVar148._4_4_ = aIStack_6d8[0].high;
            auVar148._0_4_ = aIStack_6d8[0].low;
            auVar148._8_8_ = 0;
          }
          else {
            auVar281._8_4_ = 0x7fffffff;
            auVar281._0_8_ = 0x7fffffff7fffffff;
            auVar281._12_4_ = 0x7fffffff;
            local_728._0_4_ = fVar139;
            auVar119 = vandps_avx(local_5a8,auVar281);
            auVar294 = vandps_avx(local_7a8,auVar281);
            auVar116 = vandps_avx(local_798,auVar281);
            auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ * 0.0)),ZEXT816(0) << 0x20,
                                       auVar294);
            auVar119 = vfmadd231ss_fma(auVar119,ZEXT816(0) << 0x20,auVar116);
            fVar139 = auVar119._0_4_ / auVar118._0_4_;
            local_908._0_4_ = fVar139;
            fVar139 = local_7a8._0_4_ * fVar139;
            i_03.high = fVar139;
            i_03.low = fVar139;
            auVar162._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_6e8,i_03);
            auVar162._8_56_ = extraout_var_07;
            uVar207 = vmovlps_avx(auVar162._0_16_);
            local_6e8._0_4_ = (undefined4)uVar207;
            local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
            i_04.high = (float)local_908._0_4_ * (float)local_5a8._0_4_;
            i_04.low = (float)local_908._0_4_ * (float)local_5a8._0_4_;
            auVar163._0_8_ = Interval<float>::operator+<float>(&IStack_6e0,i_04);
            auVar163._8_56_ = extraout_var_08;
            uVar207 = vmovlps_avx(auVar163._0_16_);
            IStack_6e0.low = (float)uVar207;
            IStack_6e0.high = (float)((ulong)uVar207 >> 0x20);
            i_05.high = (float)local_908._0_4_ * (float)local_798._0_4_;
            i_05.low = (float)local_908._0_4_ * (float)local_798._0_4_;
            auVar164._0_8_ = Interval<float>::operator+<float>(aIStack_6d8,i_05);
            auVar164._8_56_ = extraout_var_09;
            auVar148 = auVar164._0_16_;
            fVar139 = (float)local_728._0_4_ - (float)local_908._0_4_;
          }
          auVar324 = ZEXT464((uint)fVar139);
          auVar82._4_4_ = local_6e8._4_4_;
          auVar82._0_4_ = local_6e8._0_4_;
          auVar82._8_4_ = IStack_6e0.low;
          auVar82._12_4_ = IStack_6e0.high;
          auVar118 = vhaddps_avx(auVar148,auVar148);
          fVar139 = auVar118._0_4_ * 0.5;
          auVar119 = ZEXT816(0) << 0x40;
          bVar113 = false;
          uVar96 = 0;
          auVar118 = vinsertps_avx(auVar82,ZEXT416((uint)IStack_6e0.high),0x10);
          fVar140 = 1.0 / local_5a8._0_4_;
          auVar219._0_4_ = (float)local_6e8._4_4_ + auVar118._0_4_;
          auVar219._4_4_ = IStack_6e0.low + auVar118._4_4_;
          auVar219._8_4_ = auVar118._8_4_ + 0.0;
          auVar219._12_4_ = auVar118._12_4_ + 0.0;
          auVar52._8_4_ = 0x3f000000;
          auVar52._0_8_ = 0x3f0000003f000000;
          auVar52._12_4_ = 0x3f000000;
          in_ZmmResult._0_16_ = vmulps_avx512vl(auVar219,auVar52);
          in_ZmmResult._16_48_ = auVar239._16_48_;
          fVar256 = 1.0 / local_7a8._0_4_;
          fVar289 = 1.0 / local_798._0_4_;
          in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar289));
          local_788._0_4_ = fVar139;
          auVar118 = vmovshdup_avx(in_ZmmResult._0_16_);
          auVar255 = (undefined1  [56])0x0;
          do {
            auVar294 = ZEXT416((uint)(fVar256 *
                                     (*(float *)&(this_01->values).alloc.memoryResource -
                                     in_ZmmResult._0_4_)));
            psVar106 = (size_t *)((long)&(this_01->values).ptr + 4);
            fVar112 = in_ZmmResult._0_4_;
            fVar209 = fVar256;
            if ((uVar96 != 0) &&
               (auVar294 = ZEXT416((uint)(fVar140 *
                                         (*(float *)((long)&(this_01->values).alloc.memoryResource +
                                                    4) - auVar118._0_4_))),
               psVar106 = &(this_01->values).nAlloc, fVar112 = auVar118._0_4_, fVar209 = fVar140,
               uVar96 != 1)) {
              auVar294 = ZEXT416((uint)(fVar289 * (*(float *)&(this_01->values).ptr - fVar139)));
              psVar106 = (size_t *)((long)&(this_01->values).nAlloc + 4);
              fVar112 = fVar139;
              fVar209 = fVar289;
            }
            auVar267 = ZEXT416((uint)((*(float *)psVar106 - fVar112) * fVar209));
            auVar116 = vminss_avx(auVar267,auVar294);
            auVar294 = vmaxss_avx(auVar294,auVar267);
            auVar119 = vmaxss_avx(auVar116,auVar119);
            auVar294 = vminss_avx(ZEXT416((uint)(auVar294._0_4_ * 1.0000004)),auVar324._0_16_);
            auVar324 = ZEXT1664(auVar294);
            if (auVar294._0_4_ < auVar119._0_4_) {
              if (!bVar113) goto LAB_0044a67a;
              break;
            }
            bVar113 = 1 < uVar96;
            uVar96 = uVar96 + 1;
          } while (uVar96 != 3);
          uVar207 = 0;
          local_728._0_4_ = auVar294._0_4_;
          _local_908 = ZEXT416((uint)this_01[2].values.nStored);
          unique0x1000f9c5 = auVar119;
          local_738 = in_ZmmResult._0_16_;
          local_3e8 = auVar118;
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,local_8f0);
          auVar242._0_8_ = SVar347.values.values._8_8_;
          auVar242._8_56_ = auVar255;
          local_8b8._8_8_ = uVar207;
          local_8b8._0_8_ = SVar347.values.values._0_8_;
          _local_8c8 = auVar242._0_16_;
          auVar208 = (undefined1  [56])0x0;
          local_848 = ZEXT416((uint)this_01[2].values.nStored);
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,local_8f0);
          uVar70 = local_4b8._0_8_;
          auVar218 = stack0xfffffffffffff728;
          auVar243._0_8_ = SVar347.values.values._8_8_;
          auVar243._8_56_ = auVar255;
          auVar171._0_8_ = SVar347.values.values._0_8_;
          auVar171._8_56_ = auVar208;
          fVar139 = *(float *)&(this_01->values).ptr;
          auVar294 = vpcmpeqd_avx(auVar294,auVar294);
          auVar150 = ZEXT816(0) << 0x40;
          uVar93 = local_908._0_4_;
          lVar107 = 0;
          local_908 = (undefined1  [8])&this_01[10].values;
          fVar256 = *(float *)((long)&(this_01->values).nAlloc + 4) - fVar139;
          auVar296._0_4_ = local_798._0_4_ / fVar256;
          auVar296._4_12_ = local_798._4_12_;
          local_8e8._0_4_ = auVar296._0_4_;
          auVar272._8_8_ = 0;
          auVar272._0_8_ = (this_01->values).alloc.memoryResource;
          auVar287._8_8_ = 0;
          auVar287._0_8_ = *(ulong *)((long)&(this_01->values).ptr + 4);
          iVar114 = *(int *)&this_01[10].values.ptr;
          auVar119 = vsubps_avx(auVar287,auVar272);
          auVar118 = vsubps_avx(local_738,auVar272);
          auVar118 = vdivps_avx(auVar118,auVar119);
          auVar119 = vdivps_avx(local_7a8,auVar119);
          auVar116 = vbroadcastss_avx512vl(stack0xfffffffffffff728);
          local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x = auVar119._0_4_;
          uVar257 = vextractps_avx(auVar119,1);
          local_868 = (undefined1  [4])uVar257;
          auVar273._0_4_ = auVar118._0_4_ + auVar116._0_4_ * auVar119._0_4_;
          auVar273._4_4_ = auVar118._4_4_ + auVar116._4_4_ * auVar119._4_4_;
          auVar273._8_4_ = auVar118._8_4_ + auVar116._8_4_ * auVar119._8_4_;
          auVar273._12_4_ = auVar118._12_4_ + auVar116._12_4_ * auVar119._12_4_;
          auVar303._8_8_ = 0;
          auVar303._0_8_ = this_01[10].values.alloc.memoryResource;
          auVar118 = vcvtdq2ps_avx(auVar303);
          auVar119 = vpaddd_avx(auVar294,auVar303);
          auVar119 = vcvtdq2ps_avx(auVar119);
          fVar140 = auVar118._0_4_;
          auVar311._0_4_ = auVar273._0_4_ * fVar140;
          auVar311._4_4_ = auVar273._4_4_ * auVar118._4_4_;
          auVar311._8_4_ = auVar273._8_4_ * auVar118._8_4_;
          auVar311._12_4_ = auVar273._12_4_ * auVar118._12_4_;
          auVar116 = vmovshdup_avx(auVar119);
          uVar97 = vcmpps_avx512vl(auVar119,auVar311,1);
          auVar267 = vmovshdup_avx(auVar311);
          uVar207 = vcmpss_avx512f(auVar267,auVar150,1);
          bVar100 = (byte)(uVar97 >> 1);
          auVar294 = vmovlhps_avx(auVar171._0_16_,auVar243._0_16_);
          auVar268 = vunpcklpd_avx(local_8b8,_local_8c8);
          local_3f8._0_4_ = (float)uVar93 * auVar268._0_4_;
          local_3f8._4_4_ = (float)uVar93 * auVar268._4_4_;
          fStack_3f0 = (float)uVar93 * auVar268._8_4_;
          fStack_3ec = (float)uVar93 * auVar268._12_4_;
          local_408._0_4_ = (float)local_848._0_4_ * auVar294._0_4_;
          local_408._4_4_ = (float)local_848._0_4_ * auVar294._4_4_;
          fStack_400 = (float)local_848._0_4_ * auVar294._8_4_;
          fStack_3fc = (float)local_848._0_4_ * auVar294._12_4_;
          auVar117 = vmulss_avx512f(stack0xfffffffffffff728,auVar296);
          auVar294 = vmovshdup_avx(auVar118);
          auVar268 = vmovshdup_avx(auVar273);
          local_418._0_4_ = (float)local_3f8._0_4_ + (float)local_408._0_4_;
          local_418._4_4_ = (float)local_3f8._4_4_ + (float)local_408._4_4_;
          fStack_410 = fStack_3f0 + fStack_400;
          fStack_40c = fStack_3ec + fStack_3fc;
          auVar324 = ZEXT1664(_local_418);
          fVar139 = ((float)local_788._0_4_ - fVar139) / fVar256 + auVar117._0_4_;
          auVar118 = vcvtsi2ss_avx512f(in_XMM17,iVar114);
          uVar28 = vcmpss_avx512f(auVar311,auVar150,1);
          auVar117 = vcvtsi2ss_avx512f(in_XMM17,iVar114 + -1);
          fVar289 = (float)(int)(float)((uint)!(bool)((byte)uVar207 & 1) *
                                       ((uint)(bVar100 & 1) * auVar116._0_4_ +
                                       (uint)!(bool)(bVar100 & 1) * auVar267._0_4_));
          fVar112 = (float)(int)(float)((uint)!(bool)((byte)uVar28 & 1) *
                                       ((uint)((byte)uVar97 & 1) * auVar119._0_4_ +
                                       (uint)!(bool)((byte)uVar97 & 1) * (int)auVar311._0_4_));
          fVar209 = auVar118._0_4_;
          auVar118 = vminss_avx(auVar117,ZEXT416((uint)(fVar139 * fVar209)));
          uVar207 = vcmpss_avx512f(ZEXT416((uint)(fVar139 * fVar209)),auVar150,1);
          auVar127._16_48_ = auVar239._16_48_;
          auVar127._0_16_ = auVar118;
          fVar256 = (float)((uint)!(bool)((byte)uVar207 & 1) * auVar118._0_4_);
          auVar126._4_60_ = auVar127._4_60_;
          auVar126._0_4_ = fVar256;
          fVar256 = (float)(int)fVar256;
          fVar333 = auVar294._0_4_;
          auVar320._0_4_ = -(1.0 / fVar140);
          auVar320._4_4_ = 0x80000000;
          auVar320._8_4_ = 0x80000000;
          auVar320._12_4_ = 0x80000000;
          auVar312._0_4_ = -(1.0 / fVar333);
          auVar312._4_4_ = 0x80000000;
          auVar312._8_4_ = 0x80000000;
          auVar312._12_4_ = 0x80000000;
          auVar323._0_4_ = -(1.0 / fVar209);
          auVar323._4_4_ = 0x80000000;
          auVar323._8_4_ = 0x80000000;
          auVar323._12_4_ = 0x80000000;
          IVar141 = aIStack_6d8[7];
          do {
            pBVar98 = &local_5d8;
            iVar114 = (int)lVar107;
            if (iVar114 != 0) {
              if (iVar114 == 1) {
                pBVar98 = (BSSRDFProbeSegment *)local_868;
              }
              else {
                pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              }
            }
            fVar4 = (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x;
            if ((fVar4 == 0.0) && (!NAN(fVar4))) {
              pBVar98 = &local_5d8;
              if (iVar114 != 0) {
                if (iVar114 == 1) {
                  pBVar98 = (BSSRDFProbeSegment *)local_868;
                }
                else {
                  pBVar98 = (BSSRDFProbeSegment *)local_8e8;
                }
              }
              aIStack_6d8[7] = IVar141;
              (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
              IVar141 = aIStack_6d8[7];
            }
            fVar4 = aIStack_6d8[8].high;
            sampler = (SamplerHandle *)local_850;
            if (iVar114 == 1) {
              local_778.f.values.values[1] = fVar289;
              pBVar108 = (BSDF *)&local_458.field_0x4;
              puVar109 = (undefined4 *)(local_3a8 + 4);
              pfVar103 = (float *)(local_598 + 4);
              pIVar110 = (Interval<float> *)
                         &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              pBVar98 = (BSSRDFProbeSegment *)local_868;
              fVar331 = fVar289;
            }
            else if (iVar114 == 0) {
              local_778.f.values.values[lVar107] = fVar112;
              pBVar108 = &local_458;
              puVar109 = (undefined4 *)local_3a8;
              pfVar103 = (float *)local_598;
              pIVar110 = (Interval<float> *)&local_538;
              pBVar98 = &local_5d8;
              fVar331 = fVar112;
            }
            else {
              pBVar108 = (BSDF *)&local_458.bxdf;
              puVar109 = auStack_3a0;
              pfVar103 = (float *)(local_598 + 8);
              pIVar110 = &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              local_778.f.values.values[lVar107] = fVar256;
              fVar331 = fVar256;
            }
            if (0.0 <= (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x) {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,(int)fVar331 + 1);
              fVar331 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar338._0_4_ = (fVar331 / fVar333 - auVar268._0_4_) / (float)local_868;
                auVar338._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar126._0_16_ = vaddss_avx512f(auVar218,auVar338);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar126._0_4_;
                auVar343 = ZEXT464((uint)((1.0 / fVar333) / (float)local_868));
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&this_01[10].values.alloc.memoryResource + 4);
              }
              else if (iVar114 == 0) {
                auVar337._0_4_ =
                     (fVar331 / fVar140 - auVar273._0_4_) /
                     local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                auVar337._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar126._0_16_ = vaddss_avx512f(auVar218,auVar337);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar126._0_4_;
                auVar343 = ZEXT464((uint)((1.0 / fVar140) /
                                         local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x));
                pvVar99 = &this_01[10].values;
              }
              else {
                auVar339._0_4_ = (fVar331 / fVar209 - fVar139) / (float)local_8e8._0_4_;
                auVar339._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar126._0_16_ = vaddss_avx512f(auVar218,auVar339);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar126._0_4_;
                auVar343 = ZEXT464((uint)((1.0 / fVar209) / (float)local_8e8._0_4_));
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          &this_01[10].values.ptr;
              }
              *pfVar103 = auVar343._0_4_;
              *puVar109 = 1;
              FVar138 = *(Float *)&(pvVar99->alloc).memoryResource;
            }
            else {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,fVar331);
              fVar331 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar119 = ZEXT416((uint)(fVar331 / fVar333 - auVar268._0_4_));
                auVar332 = local_868;
                auVar118 = auVar312;
              }
              else if (iVar114 == 0) {
                auVar119 = ZEXT416((uint)(fVar331 / fVar140 - auVar273._0_4_));
                auVar332 = (undefined1  [4])local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                auVar118 = auVar320;
              }
              else {
                auVar119 = ZEXT416((uint)(fVar331 / fVar209 - fVar139));
                auVar332 = (undefined1  [4])local_8e8._0_4_;
                auVar118 = auVar323;
              }
              auVar345._0_4_ = auVar119._0_4_ / (float)auVar332;
              auVar345._4_12_ = auVar119._4_12_;
              fVar331 = auVar118._0_4_ / (float)auVar332;
              auVar343 = ZEXT1664(CONCAT124(auVar118._4_12_,fVar331));
              auVar126._0_16_ = vaddss_avx512f(auVar218,auVar345);
              FVar138 = -NAN;
              *puVar109 = 0xffffffff;
              (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar126._0_4_;
              *pfVar103 = fVar331;
            }
            lVar107 = lVar107 + 1;
            pBVar108->eta = FVar138;
          } while (lVar107 != 3);
          puVar1 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
          uVar97 = (ulong)local_4b8._0_8_ >> 0x1b;
          local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
          uVar96 = (uint)SUB84(uVar70,4) >> 0xd ^ (uint)uVar97;
          bVar100 = SUB81(uVar70,7) >> 3;
          auVar118 = vcvtusi2ss_avx512f(auVar218,uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
          aIStack_6d8[7].high = (float)((uint)fVar206 | 0x30000);
          fVar206 = aIStack_6d8[7].high;
          auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          in_ZMM4 = ZEXT1664(auVar118);
          aIStack_6d8[8].high = (float)((uint)((ulong)puVar1 >> 0x20) | 0x10000);
          fVar139 = aIStack_6d8[8].high;
          aIStack_6d8[8].high = fVar4;
          fVar140 = (float)local_728._0_4_;
          aIStack_6d8[7] = IVar141;
          while( true ) {
            lVar107 = (long)*(int *)(&DAT_0061fea0 +
                                    (ulong)((uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high < local_538.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            fVar256 = (&local_538.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107];
            uVar257 = *(undefined4 *)
                       (this_01[9].values.nAlloc +
                       (((long)(int)local_778.f.values.values[2] *
                         (long)*(int *)((long)&this_01[10].values.alloc.memoryResource + 4) +
                        (long)(int)local_778.f.values.values[1]) *
                        (long)*(int *)&this_01[10].values.alloc.memoryResource +
                       (long)(int)local_778.f.values.values[0]) * 4);
            auVar53._4_4_ = uVar257;
            auVar53._0_4_ = uVar257;
            auVar53._8_4_ = uVar257;
            auVar53._12_4_ = uVar257;
            auVar128._16_48_ = auVar126._16_48_;
            auVar128._0_16_ = vmulps_avx512vl(auVar324._0_16_,auVar53);
            in_ZmmResult = auVar128;
            if (0.0 < auVar128._0_4_) {
              local_848._0_4_ = fVar256;
              local_8c8._0_4_ = in_ZMM4._0_4_;
              local_5b8 = auVar128._0_8_ ^ 0x8000000080000000;
              fStack_5b0 = (float)(auVar128._8_4_ ^ 0x80000000);
              fStack_5ac = (float)(auVar128._12_4_ ^ 0x80000000);
              in_ZmmResult._0_16_ = vsubss_avx512f(ZEXT416((uint)fVar256),auVar218);
              in_ZmmResult._16_48_ = auVar128._16_48_;
              unique0x1000f9d5 = auVar218;
              local_8b8 = auVar128._0_16_;
              fVar140 = expf(in_ZmmResult._0_4_ * -auVar128._0_4_);
              fVar140 = 1.0 - fVar140;
              if ((float)local_8c8._0_4_ < fVar140) {
                auVar239 = ZEXT1664(stack0xfffffffffffff728);
                auVar54._8_4_ = 0x80000000;
                auVar54._0_8_ = 0x8000000080000000;
                auVar54._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(local_8b8,auVar54);
                _local_4d8 = in_ZmmResult._0_16_;
                do {
                  register0x00001240 = auVar239._0_16_;
                  fVar140 = logf(1.0 - (float)local_8c8._0_4_);
                  fVar140 = local_8e8._16_4_ - fVar140 / (float)local_8b8._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar140);
                  if ((float)local_728._0_4_ <= fVar140) {
                    local_650[0]._0_1_ = false;
                    local_650[1]._0_4_ = 1.0;
                    local_650[1]._4_4_ = 1.0;
                    local_650[2]._0_4_ = 1.0;
                    local_650[2]._4_4_ = 1.0;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)local_828,(MediumSample *)local_6e8);
                    goto LAB_0044a67a;
                  }
                  local_908._0_4_ = fVar140;
                  auVar118 = vinsertps_avx(ZEXT416((uint)(fVar140 * (float)local_7a8._0_4_ +
                                                         (float)local_738._0_4_)),
                                           ZEXT416((uint)(fVar140 * (float)local_5a8._0_4_ +
                                                         (float)local_3e8._0_4_)),0x10);
                  local_718.f.values.values[2] =
                       fVar140 * (float)local_798._0_4_ + (float)local_788._0_4_;
                  local_718.f.values.values._0_8_ = vmovlps_avx(auVar118);
                  fVar140 = fVar140 - local_8e8._16_4_;
                  auVar149._0_4_ = fVar140 * (float)local_4d8._0_4_;
                  auVar149._4_4_ = fVar140 * (float)local_4d8._4_4_;
                  auVar149._8_4_ = fVar140 * fStack_4d0;
                  auVar149._12_4_ = fVar140 * fStack_4cc;
                  auVar55._8_4_ = 0x3fb8aa3b;
                  auVar55._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar55._12_4_ = 0x3fb8aa3b;
                  auVar239._16_48_ = in_ZmmResult._16_48_;
                  auVar118 = vmulps_avx512vl(auVar149,auVar55);
                  _local_8c8 = vroundps_avx(auVar118,9);
                  auVar118 = vsubps_avx(auVar118,_local_8c8);
                  auVar255 = ZEXT856(auVar118._8_8_);
                  auVar220._8_4_ = 0x3da1d5b6;
                  auVar220._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar220._12_4_ = 0x3da1d5b6;
                  auVar56._8_4_ = 0x3e658299;
                  auVar56._0_8_ = 0x3e6582993e658299;
                  auVar56._12_4_ = 0x3e658299;
                  auVar119 = vfmadd213ps_avx512vl(auVar220,auVar118,auVar56);
                  auVar57._8_4_ = 0x3f3263b7;
                  auVar57._0_8_ = 0x3f3263b73f3263b7;
                  auVar57._12_4_ = 0x3f3263b7;
                  auVar119 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar57);
                  auVar58._8_4_ = 0x3f7ff3bf;
                  auVar58._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar58._12_4_ = 0x3f7ff3bf;
                  register0x000008fc = vfmadd213ps_avx512vl(auVar119,auVar118,auVar58);
                  auVar208 = ZEXT856(local_8e8._24_8_);
                  SVar347 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_01,(Point3f *)&local_718,
                                       local_8f0);
                  auVar244._0_8_ = SVar347.values.values._8_8_;
                  auVar244._8_56_ = auVar208;
                  auVar172._0_8_ = SVar347.values.values._0_8_;
                  auVar172._8_56_ = auVar255;
                  auVar274._0_4_ = (int)(float)local_8c8._0_4_;
                  auVar274._4_4_ = (int)(float)local_8c8._4_4_;
                  auVar274._8_4_ = (int)(float)uStack_8c0;
                  auVar274._12_4_ = (int)uStack_8c0._4_4_;
                  auVar118 = vmovlhps_avx(auVar172._0_16_,auVar244._0_16_);
                  aIStack_6d8[9].low = auVar118._0_4_ * (float)local_3f8._0_4_;
                  aIStack_6d8[9].high = auVar118._4_4_ * (float)local_3f8._4_4_;
                  aIStack_6d8[10].low = auVar118._8_4_ * fStack_3f0;
                  aIStack_6d8[10].high = auVar118._12_4_ * fStack_3ec;
                  fVar140 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                  aIStack_6d8[0xb].low = auVar118._0_4_ * (float)local_408._0_4_;
                  aIStack_6d8[0xb].high = auVar118._4_4_ * (float)local_408._4_4_;
                  aIStack_6d8[0xc].low = auVar118._8_4_ * fStack_400;
                  aIStack_6d8[0xc].high = auVar118._12_4_ * fStack_3fc;
                  aIStack_6d8[1].low = (ray->super_Ray).time;
                  auVar59._8_4_ = 0xffffffe1;
                  auVar59._0_8_ = 0xffffffe1ffffffe1;
                  auVar59._12_4_ = 0xffffffe1;
                  uVar97 = vpcmpgtd_avx512vl(auVar274,auVar59);
                  uVar97 = uVar97 & 0xf;
                  auVar60._8_4_ = 0x1e;
                  auVar60._0_8_ = 0x1e0000001e;
                  auVar60._12_4_ = 0x1e;
                  uVar101 = vpcmpgtd_avx512vl(auVar274,auVar60);
                  uVar101 = uVar101 & 0xf;
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[7].values.ptr +
                                                                     4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[7].values.ptr));
                  auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           (float)this_01[7].lambda_max)),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[7].lambda_min));
                  auVar294 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.alloc
                                                                             .memoryResource + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[6].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[6].values.nAlloc));
                  auVar267 = vfmadd231ss_fma(auVar118,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[7].values.nAlloc));
                  auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[7].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(auVar116,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[6].values.nStored));
                  auVar294 = vfmadd231ss_fma(auVar294,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[6].values.ptr));
                  auVar118 = vpslld_avx(auVar274,0x17);
                  auVar118 = vpaddd_avx(auVar118,stack0xfffffffffffff728);
                  fVar256 = auVar267._0_4_ + *(float *)((long)&this_01[7].values.nAlloc + 4);
                  fVar289 = auVar119._0_4_ +
                            *(float *)((long)&this_01[7].values.alloc.memoryResource + 4);
                  fVar112 = auVar116._0_4_ + *(float *)((long)&this_01[6].values.nStored + 4);
                  fVar209 = auVar294._0_4_ + *(float *)((long)&this_01[6].values.ptr + 4);
                  bVar27 = fVar256 == 1.0;
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar113 = (bool)((byte)uVar101 & 1);
                  local_650[1]._0_4_ =
                       (uint)bVar113 * auVar119._0_4_ |
                       (uint)!bVar113 * (uint)((byte)uVar97 & 1) * auVar118._0_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 1) & 1);
                  local_650[1]._4_4_ =
                       (uint)bVar113 * auVar119._4_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 2) & 1);
                  local_650[2]._0_4_ =
                       (uint)bVar113 * auVar119._8_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_;
                  bVar113 = SUB81(uVar101 >> 3,0);
                  local_650[2]._4_4_ =
                       (uint)bVar113 * auVar119._12_4_ |
                       (uint)!bVar113 * (uint)(byte)(uVar97 >> 3) * auVar118._12_4_;
                  iVar114 = (uint)bVar27 * (int)fVar289 + (uint)!bVar27 * (int)(fVar289 / fVar256);
                  fVar289 = fVar112 / fVar256;
                  iVar115 = (uint)bVar27 * (int)fVar209 + (uint)!bVar27 * (int)(fVar209 / fVar256);
                  auVar297._4_4_ = iVar115;
                  auVar297._0_4_ = iVar115;
                  auVar297._8_4_ = iVar115;
                  auVar297._12_4_ = iVar115;
                  auVar129._16_48_ = auVar239._16_48_;
                  auVar129._0_16_ = ZEXT416((uint)fVar289);
                  in_ZmmResult._4_60_ = auVar129._4_60_;
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar27 * (int)fVar112 + (uint)!bVar27 * (int)fVar289);
                  uVar11._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar11._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar291._8_8_ = 0;
                  auVar291._0_8_ = uVar11;
                  aIStack_6d8[5].low = 0.0;
                  auVar290._4_4_ = in_ZmmResult._0_4_;
                  auVar290._0_4_ = in_ZmmResult._0_4_;
                  auVar290._8_4_ = in_ZmmResult._0_4_;
                  auVar290._12_4_ = in_ZmmResult._0_4_;
                  auVar119 = vmovlhps_avx(auVar297,auVar290);
                  in_ZMM4 = ZEXT1664(auVar119);
                  auVar298._4_4_ = iVar114;
                  auVar298._0_4_ = iVar114;
                  auVar298._8_4_ = iVar114;
                  auVar298._12_4_ = iVar114;
                  auVar313._0_4_ = (float)(undefined4)uVar11 * (float)(undefined4)uVar11;
                  auVar313._4_4_ = (float)uVar11._4_4_ * (float)uVar11._4_4_;
                  auVar313._8_8_ = 0;
                  auVar118 = vmovshdup_avx(auVar313);
                  auVar118 = vfmadd231ss_fma(auVar118,auVar291,auVar291);
                  auVar292._0_8_ = uVar11 ^ 0x8000000080000000;
                  auVar292._8_4_ = 0x80000000;
                  auVar292._12_4_ = 0x80000000;
                  auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar140),ZEXT416((uint)fVar140))
                  ;
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  aIStack_6d8[2].high = auVar118._0_4_;
                  auVar314._4_4_ = aIStack_6d8[2].high;
                  auVar314._0_4_ = aIStack_6d8[2].high;
                  auVar314._8_4_ = aIStack_6d8[2].high;
                  auVar314._12_4_ = aIStack_6d8[2].high;
                  aIStack_6d8[2].high = -fVar140 / aIStack_6d8[2].high;
                  auVar118 = vdivps_avx(auVar292,auVar314);
                  aIStack_6d8[3].low = 0.0;
                  aIStack_6d8[3].high = 0.0;
                  aIStack_6d8[4].low = 0.0;
                  aIStack_6d8[4].high = 0.0;
                  aIStack_6d8[0xd] = local_8b8._0_8_;
                  uStack_668._0_4_ = local_8b8._8_4_;
                  uStack_668._4_4_ = local_8b8._12_4_;
                  local_650[0]._0_1_ = true;
                  local_6e8._0_4_ = auVar119._0_4_;
                  local_6e8._4_4_ = auVar119._4_4_;
                  IStack_6e0.low = auVar119._8_4_;
                  IStack_6e0.high = auVar119._12_4_;
                  uVar207 = vmovlps_avx(auVar298);
                  aIStack_6d8[0].low = (float)uVar207;
                  aIStack_6d8[0].high = (float)((ulong)uVar207 >> 0x20);
                  uVar207 = vmovlps_avx(auVar118);
                  aIStack_6d8[1].high = (float)uVar207;
                  aIStack_6d8[2].low = (float)((ulong)uVar207 >> 0x20);
                  aIStack_6d8[6].low = 0.0;
                  aIStack_6d8[6].high = 0.0;
                  aIStack_6d8[8].low = SUB84(puVar1,0);
                  stack0xfffffffffffff9a8 = 0;
                  aIStack_6d8[7].low = fVar210;
                  aIStack_6d8[7].high = fVar206;
                  aIStack_6d8[8].high = fVar139;
                  uStack_660 = aIStack_6d8[3].low;
                  uStack_65c._0_4_ = aIStack_6d8[3].high;
                  bVar113 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)local_828,
                                       (MediumSample *)local_6e8);
                  if (!bVar113) goto LAB_0044a67a;
                  uVar96 = (uint)SUB84(local_4b8._0_8_,4) >> 0xd ^
                           (uint)((ulong)local_4b8._0_8_ >> 0x1b);
                  bVar100 = SUB81(local_4b8._0_8_,7) >> 3;
                  auVar118 = vcvtusi2ss_avx512f(auVar343._0_16_,
                                                uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
                  auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),
                                        ZEXT416(0x3f7fffff));
                  local_8c8._0_4_ = auVar118._0_4_;
                  local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
                  fVar140 = expf(((float)local_848._0_4_ - (float)local_908._0_4_) *
                                 (float)local_5b8._0_4_);
                  auVar239 = ZEXT464((uint)local_908._0_4_);
                  fVar140 = 1.0 - fVar140;
                } while ((float)local_8c8._0_4_ < fVar140);
              }
              auVar324 = ZEXT1664(_local_418);
              auVar118 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                    ZEXT416((uint)(((float)local_8c8._0_4_ - fVar140) /
                                                  (1.0 - fVar140))));
              in_ZMM4 = ZEXT1664(auVar118);
              fVar256 = (float)local_848._0_4_;
              fVar140 = (float)local_728._0_4_;
            }
            if (fVar140 < fVar256) break;
            fVar289 = (float)((int)local_778.f.values.values[lVar107] +
                             *(int *)(local_3a8 + lVar107 * 4));
            local_778.f.values.values[lVar107] = fVar289;
            if (fVar289 == (&local_458.eta)[lVar107]) break;
            auVar126._16_48_ = in_ZmmResult._16_48_;
            auVar218 = ZEXT416((uint)fVar256);
            auVar126._0_16_ = auVar218;
            (&local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107] =
                 fVar256 + *(float *)(local_598 + lVar107 * 4);
          }
        }
        else {
          IStack_820 = (Interval<float>)&local_90a;
          IStack_818 = (Interval<float>)&local_898;
          uStack_7e8 = (RNG *)local_4b8;
          pSStack_810 = &local_748;
          uStack_808 = (long)local_8e8 + 0xc;
          pSStack_7f8 = &local_838;
          uStack_7d0 = &local_d0;
          local_7c8 = &local_1d8;
          local_7b0 = &local_90b;
          local_7c0 = &local_909;
          local_7b8 = &local_90c;
          uVar97._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar97._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar119._8_8_ = 0;
          auVar119._0_8_ = uVar97;
          fVar210 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_598._8_4_ = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
          uVar19 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
          uVar26 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar116._0_4_ = (float)(undefined4)uVar97 * (float)(undefined4)uVar97;
          auVar116._4_4_ = (float)uVar97._4_4_ * (float)uVar97._4_4_;
          auVar116._8_8_ = 0;
          auVar118 = vmovshdup_avx(auVar116);
          auVar118 = vfmadd231ss_fma(auVar118,auVar119,auVar119);
          auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar210),ZEXT416((uint)fVar210));
          local_8b8 = vsqrtss_avx(auVar118,auVar118);
          fVar206 = local_8b8._0_4_;
          auVar267._4_4_ = fVar206;
          auVar267._0_4_ = fVar206;
          auVar267._8_4_ = fVar206;
          auVar267._12_4_ = fVar206;
          local_908._0_4_ = fVar210 / fVar206;
          register0x00001204 = SUB6012((undefined1  [60])0x0,0);
          auVar118 = vdivps_avx(auVar119,auVar267);
          uVar207 = vmovlps_avx(auVar118);
          local_598._12_4_ = (undefined4)uVar207;
          local_598._16_4_ = (undefined4)((ulong)uVar207 >> 0x20);
          auVar118._4_4_ = uVar19;
          auVar118._0_4_ = uVar19;
          auVar118._8_4_ = uVar19;
          auVar118._12_4_ = uVar19;
          auVar294._4_4_ = uVar26;
          auVar294._0_4_ = uVar26;
          auVar294._8_4_ = uVar26;
          auVar294._12_4_ = uVar26;
          auVar268._4_4_ = local_598._8_4_;
          auVar268._0_4_ = local_598._8_4_;
          auVar268._8_4_ = local_598._8_4_;
          auVar268._12_4_ = local_598._8_4_;
          local_8c8._4_4_ = local_598._12_4_;
          local_8c8._0_4_ = local_598._8_4_;
          uStack_8c0._4_4_ = (float)local_908._0_4_;
          uStack_8c0._0_4_ = (float)local_598._16_4_;
          auVar118 = vmovlhps_avx(auVar118,auVar294);
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = auVar118._0_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = auVar118._4_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = auVar118._8_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = auVar118._12_4_;
          local_538.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)vmovlps_avx(auVar268);
          local_598._0_4_ = uVar19;
          local_598._4_4_ = uVar26;
          local_598._20_4_ = local_908._0_4_;
          Transform::operator()((Point3fi *)local_6e8,this_00,&local_538);
          auVar118 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_max),
                                   ZEXT416(*(uint *)((long)&this_01[3].values.ptr + 4)),0x10);
          auVar119 = vinsertps_avx(ZEXT416((uint)this_01[3].lambda_min),
                                   ZEXT416(*(uint *)&this_01[3].values.ptr),0x10);
          fVar210 = (float)local_8b8._0_4_ * (float)local_8e8._16_4_;
          auVar294 = vinsertps_avx(ZEXT416(*(uint *)&this_01[3].values.alloc.memoryResource),
                                   ZEXT416((uint)this_01[3].values.nAlloc),0x10);
          auVar267 = vshufpd_avx(_local_8c8,_local_8c8,1);
          auVar116 = vmovshdup_avx(_local_8c8);
          auVar268 = vshufps_avx(_local_8c8,_local_8c8,0xaa);
          auVar117._0_4_ = auVar268._0_4_ * auVar118._0_4_;
          auVar117._4_4_ = auVar268._4_4_ * auVar118._4_4_;
          auVar117._8_4_ = auVar268._8_4_ * auVar118._8_4_;
          auVar117._12_4_ = auVar268._12_4_ * auVar118._12_4_;
          auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar267._0_4_ *
                                                   *(float *)((long)&this_01[3].values.nStored + 4))
                                            ),auVar116,ZEXT416((uint)this_01[3].values.nStored));
          auVar118 = vfmadd213ps_fma(auVar119,auVar116,auVar117);
          local_7a8 = vfmadd231ss_fma(auVar267,_local_908,ZEXT416((uint)this_01[4].lambda_min));
          uVar257 = local_908._0_4_;
          auVar218._4_4_ = uVar257;
          auVar218._0_4_ = uVar257;
          auVar218._8_4_ = uVar257;
          auVar218._12_4_ = uVar257;
          local_738 = vfmadd213ps_fma(auVar218,auVar294,auVar118);
          _local_5b8 = vmovshdup_avx(local_738);
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_5b8._0_4_ * local_5b8._0_4_)),local_738,
                                     local_738);
          auVar118 = vfmadd231ss_fma(auVar118,local_7a8,local_7a8);
          if (auVar118._0_4_ <= 0.0) {
            auVar150._4_4_ = aIStack_6d8[0].high;
            auVar150._0_4_ = aIStack_6d8[0].low;
            auVar150._8_8_ = 0;
          }
          else {
            auVar285._8_4_ = 0x7fffffff;
            auVar285._0_8_ = 0x7fffffff7fffffff;
            auVar285._12_4_ = 0x7fffffff;
            local_848._0_4_ = fVar210;
            auVar119 = vandps_avx(_local_5b8,auVar285);
            auVar294 = vandps_avx(local_738,auVar285);
            auVar116 = vandps_avx(local_7a8,auVar285);
            auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ * 0.0)),ZEXT816(0) << 0x20,
                                       auVar294);
            auVar119 = vfmadd231ss_fma(auVar119,ZEXT816(0) << 0x20,auVar116);
            fVar210 = auVar119._0_4_ / auVar118._0_4_;
            local_908._0_4_ = fVar210;
            fVar210 = local_738._0_4_ * fVar210;
            IVar141.high = fVar210;
            IVar141.low = fVar210;
            auVar324._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_6e8,IVar141)
            ;
            auVar324._8_56_ = extraout_var_10;
            uVar207 = vmovlps_avx(auVar324._0_16_);
            local_6e8._0_4_ = (undefined4)uVar207;
            local_6e8._4_4_ = (undefined4)((ulong)uVar207 >> 0x20);
            i_06.high = (float)local_908._0_4_ * (float)local_5b8._0_4_;
            i_06.low = (float)local_908._0_4_ * (float)local_5b8._0_4_;
            auVar343._0_8_ = Interval<float>::operator+<float>(&IStack_6e0,i_06);
            auVar343._8_56_ = extraout_var_11;
            uVar207 = vmovlps_avx(auVar343._0_16_);
            IStack_6e0.low = (float)uVar207;
            IStack_6e0.high = (float)((ulong)uVar207 >> 0x20);
            i_07.high = (float)local_908._0_4_ * (float)local_7a8._0_4_;
            i_07.low = (float)local_908._0_4_ * (float)local_7a8._0_4_;
            auVar167._0_8_ = Interval<float>::operator+<float>(aIStack_6d8,i_07);
            auVar167._8_56_ = extraout_var_12;
            auVar150 = auVar167._0_16_;
            fVar210 = (float)local_848._0_4_ - (float)local_908._0_4_;
          }
          auVar324 = ZEXT464((uint)fVar210);
          auVar83._4_4_ = local_6e8._4_4_;
          auVar83._0_4_ = local_6e8._0_4_;
          auVar83._8_4_ = IStack_6e0.low;
          auVar83._12_4_ = IStack_6e0.high;
          auVar118 = vhaddps_avx(auVar150,auVar150);
          fVar210 = auVar118._0_4_ * 0.5;
          auVar119 = ZEXT816(0) << 0x40;
          bVar113 = false;
          uVar96 = 0;
          auVar118 = vinsertps_avx(auVar83,ZEXT416((uint)IStack_6e0.high),0x10);
          fVar206 = 1.0 / local_5b8._0_4_;
          auVar221._0_4_ = (float)local_6e8._4_4_ + auVar118._0_4_;
          auVar221._4_4_ = IStack_6e0.low + auVar118._4_4_;
          auVar221._8_4_ = auVar118._8_4_ + 0.0;
          auVar221._12_4_ = auVar118._12_4_ + 0.0;
          auVar61._8_4_ = 0x3f000000;
          auVar61._0_8_ = 0x3f0000003f000000;
          auVar61._12_4_ = 0x3f000000;
          in_ZmmResult._0_16_ = vmulps_avx512vl(auVar221,auVar61);
          in_ZmmResult._16_48_ = auVar239._16_48_;
          fVar139 = 1.0 / local_738._0_4_;
          fVar140 = 1.0 / local_7a8._0_4_;
          in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar140));
          local_798._0_4_ = fVar210;
          auVar118 = vmovshdup_avx(in_ZmmResult._0_16_);
          auVar255 = (undefined1  [56])0x0;
          do {
            auVar294 = ZEXT416((uint)(fVar139 *
                                     (*(float *)&(this_01->values).alloc.memoryResource -
                                     in_ZmmResult._0_4_)));
            psVar106 = (size_t *)((long)&(this_01->values).ptr + 4);
            fVar256 = in_ZmmResult._0_4_;
            fVar289 = fVar139;
            if ((uVar96 != 0) &&
               (auVar294 = ZEXT416((uint)(fVar206 *
                                         (*(float *)((long)&(this_01->values).alloc.memoryResource +
                                                    4) - auVar118._0_4_))),
               psVar106 = &(this_01->values).nAlloc, fVar256 = auVar118._0_4_, fVar289 = fVar206,
               uVar96 != 1)) {
              auVar294 = ZEXT416((uint)(fVar140 * (*(float *)&(this_01->values).ptr - fVar210)));
              psVar106 = (size_t *)((long)&(this_01->values).nAlloc + 4);
              fVar256 = fVar210;
              fVar289 = fVar140;
            }
            auVar267 = ZEXT416((uint)((*(float *)psVar106 - fVar256) * fVar289));
            auVar116 = vminss_avx(auVar267,auVar294);
            auVar294 = vmaxss_avx(auVar294,auVar267);
            auVar119 = vmaxss_avx(auVar116,auVar119);
            auVar294 = vminss_avx(ZEXT416((uint)(auVar294._0_4_ * 1.0000004)),auVar324._0_16_);
            auVar324 = ZEXT1664(auVar294);
            if (auVar294._0_4_ < auVar119._0_4_) {
              if (!bVar113) goto LAB_0044a67a;
              break;
            }
            bVar113 = 1 < uVar96;
            uVar96 = uVar96 + 1;
          } while (uVar96 != 3);
          uVar207 = 0;
          local_848._0_4_ = auVar294._0_4_;
          _local_908 = ZEXT416((uint)this_01[2].values.nStored);
          unique0x1000f9a5 = auVar119;
          _local_4d8 = in_ZmmResult._0_16_;
          _local_408 = auVar118;
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_01->values).nStored,local_8f0);
          auVar245._0_8_ = SVar347.values.values._8_8_;
          auVar245._8_56_ = auVar255;
          local_8b8._8_8_ = uVar207;
          local_8b8._0_8_ = SVar347.values.values._0_8_;
          _local_8c8 = auVar245._0_16_;
          auVar208 = (undefined1  [56])0x0;
          local_788 = ZEXT416((uint)this_01[2].values.nStored);
          SVar347 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_01[1].values.nStored,local_8f0);
          uVar70 = local_4b8._0_8_;
          auVar218 = stack0xfffffffffffff728;
          auVar246._0_8_ = SVar347.values.values._8_8_;
          auVar246._8_56_ = auVar255;
          auVar173._0_8_ = SVar347.values.values._0_8_;
          auVar173._8_56_ = auVar208;
          fVar210 = *(float *)&(this_01->values).ptr;
          auVar294 = vpcmpeqd_avx(auVar294,auVar294);
          auVar150 = ZEXT816(0) << 0x40;
          lVar107 = 0;
          fVar139 = *(float *)((long)&(this_01->values).nAlloc + 4) - fVar210;
          auVar299._0_4_ = local_7a8._0_4_ / fVar139;
          auVar299._4_12_ = local_7a8._4_12_;
          local_8e8._0_4_ = auVar299._0_4_;
          auVar275._8_8_ = 0;
          auVar275._0_8_ = (this_01->values).alloc.memoryResource;
          auVar288._8_8_ = 0;
          auVar288._0_8_ = *(ulong *)((long)&(this_01->values).ptr + 4);
          iVar114 = *(int *)&this_01[10].values.ptr;
          auVar119 = vsubps_avx(auVar288,auVar275);
          auVar118 = vsubps_avx(_local_4d8,auVar275);
          auVar118 = vdivps_avx(auVar118,auVar119);
          auVar119 = vdivps_avx(local_738,auVar119);
          auVar116 = vbroadcastss_avx512vl(stack0xfffffffffffff728);
          local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x = auVar119._0_4_;
          uVar257 = vextractps_avx(auVar119,1);
          local_868 = (undefined1  [4])uVar257;
          auVar276._0_4_ = auVar118._0_4_ + auVar116._0_4_ * auVar119._0_4_;
          auVar276._4_4_ = auVar118._4_4_ + auVar116._4_4_ * auVar119._4_4_;
          auVar276._8_4_ = auVar118._8_4_ + auVar116._8_4_ * auVar119._8_4_;
          auVar276._12_4_ = auVar118._12_4_ + auVar116._12_4_ * auVar119._12_4_;
          auVar304._8_8_ = 0;
          auVar304._0_8_ = this_01[10].values.alloc.memoryResource;
          auVar118 = vcvtdq2ps_avx(auVar304);
          auVar119 = vpaddd_avx(auVar294,auVar304);
          auVar119 = vcvtdq2ps_avx(auVar119);
          fVar206 = auVar118._0_4_;
          auVar315._0_4_ = auVar276._0_4_ * fVar206;
          auVar315._4_4_ = auVar276._4_4_ * auVar118._4_4_;
          auVar315._8_4_ = auVar276._8_4_ * auVar118._8_4_;
          auVar315._12_4_ = auVar276._12_4_ * auVar118._12_4_;
          auVar116 = vmovshdup_avx(auVar119);
          uVar97 = vcmpps_avx512vl(auVar119,auVar315,1);
          auVar267 = vmovshdup_avx(auVar315);
          uVar207 = vcmpss_avx512f(auVar267,auVar150,1);
          bVar100 = (byte)(uVar97 >> 1);
          auVar294 = vmovlhps_avx(auVar173._0_16_,auVar246._0_16_);
          auVar268 = vunpcklpd_avx(local_8b8,_local_8c8);
          local_418._0_4_ = (float)local_908._0_4_ * auVar268._0_4_;
          local_418._4_4_ = (float)local_908._0_4_ * auVar268._4_4_;
          fStack_410 = (float)local_908._0_4_ * auVar268._8_4_;
          fStack_40c = (float)local_908._0_4_ * auVar268._12_4_;
          local_338 = (float)local_788._0_4_ * auVar294._0_4_;
          fStack_334 = (float)local_788._0_4_ * auVar294._4_4_;
          fStack_330 = (float)local_788._0_4_ * auVar294._8_4_;
          fStack_32c = (float)local_788._0_4_ * auVar294._12_4_;
          auVar117 = vmulss_avx512f(stack0xfffffffffffff728,auVar299);
          auVar294 = vmovshdup_avx(auVar118);
          auVar268 = vmovshdup_avx(auVar276);
          local_348._0_4_ = (float)local_418._0_4_ + local_338;
          local_348._4_4_ = (float)local_418._4_4_ + fStack_334;
          local_348._8_4_ = fStack_410 + fStack_330;
          local_348._12_4_ = fStack_40c + fStack_32c;
          auVar324 = ZEXT1664(local_348);
          fVar210 = ((float)local_798._0_4_ - fVar210) / fVar139 + auVar117._0_4_;
          auVar118 = vcvtsi2ss_avx512f(in_XMM17,iVar114);
          uVar28 = vcmpss_avx512f(auVar315,auVar150,1);
          auVar117 = vcvtsi2ss_avx512f(in_XMM17,iVar114 + -1);
          fVar140 = (float)(int)(float)((uint)!(bool)((byte)uVar207 & 1) *
                                       ((uint)(bVar100 & 1) * auVar116._0_4_ +
                                       (uint)!(bool)(bVar100 & 1) * auVar267._0_4_));
          fVar256 = (float)(int)(float)((uint)!(bool)((byte)uVar28 & 1) *
                                       ((uint)((byte)uVar97 & 1) * auVar119._0_4_ +
                                       (uint)!(bool)((byte)uVar97 & 1) * (int)auVar315._0_4_));
          fVar289 = auVar118._0_4_;
          auVar118 = vminss_avx(auVar117,ZEXT416((uint)(fVar210 * fVar289)));
          uVar207 = vcmpss_avx512f(ZEXT416((uint)(fVar210 * fVar289)),auVar150,1);
          auVar131._16_48_ = auVar239._16_48_;
          auVar131._0_16_ = auVar118;
          fVar139 = (float)((uint)!(bool)((byte)uVar207 & 1) * auVar118._0_4_);
          auVar130._4_60_ = auVar131._4_60_;
          auVar130._0_4_ = fVar139;
          fVar139 = (float)(int)fVar139;
          fVar112 = auVar294._0_4_;
          IVar141 = aIStack_6d8[7];
          do {
            pBVar98 = &local_5d8;
            iVar114 = (int)lVar107;
            if (iVar114 != 0) {
              if (iVar114 == 1) {
                pBVar98 = (BSSRDFProbeSegment *)local_868;
              }
              else {
                pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              }
            }
            fVar209 = (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x;
            if ((fVar209 == 0.0) && (!NAN(fVar209))) {
              pBVar98 = &local_5d8;
              if (iVar114 != 0) {
                if (iVar114 == 1) {
                  pBVar98 = (BSSRDFProbeSegment *)local_868;
                }
                else {
                  pBVar98 = (BSSRDFProbeSegment *)local_8e8;
                }
              }
              aIStack_6d8[7] = IVar141;
              (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
              IVar141 = aIStack_6d8[7];
            }
            fVar209 = aIStack_6d8[8].high;
            sampler = (SamplerHandle *)local_850;
            if (iVar114 == 1) {
              local_778.f.values.values[1] = fVar140;
              pBVar108 = (BSDF *)&local_458.field_0x4;
              puVar109 = (undefined4 *)(local_3a8 + 4);
              pfVar103 = (float *)(local_598 + 4);
              pIVar110 = (Interval<float> *)
                         &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              pBVar98 = (BSSRDFProbeSegment *)local_868;
              fVar333 = fVar140;
            }
            else if (iVar114 == 0) {
              local_778.f.values.values[lVar107] = fVar256;
              pBVar108 = &local_458;
              puVar109 = (undefined4 *)local_3a8;
              pfVar103 = (float *)local_598;
              pIVar110 = (Interval<float> *)&local_538;
              pBVar98 = &local_5d8;
              fVar333 = fVar256;
            }
            else {
              pBVar108 = (BSDF *)&local_458.bxdf;
              puVar109 = auStack_3a0;
              pfVar103 = (float *)(local_598 + 8);
              pIVar110 = &local_538.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
              pBVar98 = (BSSRDFProbeSegment *)local_8e8;
              local_778.f.values.values[lVar107] = fVar139;
              fVar333 = fVar139;
            }
            if (0.0 <= (pBVar98->p0).super_Tuple3<pbrt::Point3,_float>.x) {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,(int)fVar333 + 1);
              fVar333 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar341._0_4_ = (fVar333 / fVar112 - auVar268._0_4_) / (float)local_868;
                auVar341._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar130._0_16_ = vaddss_avx512f(auVar218,auVar341);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar130._0_4_;
                fVar333 = (1.0 / fVar112) / (float)local_868;
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&this_01[10].values.alloc.memoryResource + 4);
              }
              else if (iVar114 == 0) {
                auVar340._0_4_ =
                     (fVar333 / fVar206 - auVar276._0_4_) /
                     local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                auVar340._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar130._0_16_ = vaddss_avx512f(auVar218,auVar340);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar130._0_4_;
                fVar333 = (1.0 / fVar206) / local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                pvVar99 = &this_01[10].values;
              }
              else {
                auVar342._0_4_ = (fVar333 / fVar289 - fVar210) / (float)local_8e8._0_4_;
                auVar342._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar130._0_16_ = vaddss_avx512f(auVar218,auVar342);
                (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar130._0_4_;
                fVar333 = (1.0 / fVar289) / (float)local_8e8._0_4_;
                pvVar99 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          &this_01[10].values.ptr;
              }
              *pfVar103 = fVar333;
              *puVar109 = 1;
              FVar138 = *(Float *)&(pvVar99->alloc).memoryResource;
            }
            else {
              auVar118 = vcvtsi2ss_avx512f(in_XMM17,fVar333);
              fVar333 = auVar118._0_4_;
              if (iVar114 == 1) {
                auVar118 = ZEXT416((uint)(fVar333 / fVar112 - auVar268._0_4_));
                auVar332 = local_868;
                fVar333 = -(1.0 / fVar112);
              }
              else if (iVar114 == 0) {
                auVar118 = ZEXT416((uint)(fVar333 / fVar206 - auVar276._0_4_));
                auVar332 = (undefined1  [4])local_5d8.p0.super_Tuple3<pbrt::Point3,_float>.x;
                fVar333 = -(1.0 / fVar206);
              }
              else {
                auVar118 = ZEXT416((uint)(fVar333 / fVar289 - fVar210));
                auVar332 = (undefined1  [4])local_8e8._0_4_;
                fVar333 = -(1.0 / fVar289);
              }
              auVar346._0_4_ = auVar118._0_4_ / (float)auVar332;
              auVar346._4_12_ = auVar118._4_12_;
              auVar130._0_16_ = vaddss_avx512f(auVar218,auVar346);
              *puVar109 = 0xffffffff;
              FVar138 = -NAN;
              (((Point3<pbrt::Interval<float>_> *)&pIVar110->low)->
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>).x.low = auVar130._0_4_;
              *pfVar103 = fVar333 / (float)auVar332;
            }
            lVar107 = lVar107 + 1;
            pBVar108->eta = FVar138;
          } while (lVar107 != 3);
          aIStack_6d8[7].high = (float)((uint)((ulong)this_01 >> 0x20) | 0x40000);
          fVar210 = aIStack_6d8[7].high;
          puVar1 = (undefined1 *)((long)&this_01[2].values.nStored + 4);
          uVar97 = (ulong)local_4b8._0_8_ >> 0x1b;
          local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
          uVar96 = (uint)SUB84(uVar70,4) >> 0xd ^ (uint)uVar97;
          bVar100 = SUB81(uVar70,7) >> 3;
          auVar118 = vcvtusi2ss_avx512f(auVar218,uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
          aIStack_6d8[8].high = (float)((uint)((ulong)puVar1 >> 0x20) | 0x10000);
          fVar206 = aIStack_6d8[8].high;
          auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
          ;
          in_ZMM4 = ZEXT1664(auVar118);
          aIStack_6d8[8].high = fVar209;
          fVar139 = (float)local_848._0_4_;
          aIStack_6d8[7] = IVar141;
          while( true ) {
            lVar107 = (long)*(int *)(&DAT_0061fea0 +
                                    (ulong)((uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high < local_538.
                                                            super_Point3<pbrt::Interval<float>_>.
                                                                                                                        
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) |
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high) * 4 +
                                           (uint)(local_538.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low < local_538.
                                                           super_Point3<pbrt::Interval<float>_>.
                                                                                                                      
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low) * 2) * 4);
            fVar140 = (&local_538.super_Point3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107];
            uVar257 = *(undefined4 *)
                       (this_01[9].values.nAlloc +
                       (((long)(int)local_778.f.values.values[2] *
                         (long)*(int *)((long)&this_01[10].values.alloc.memoryResource + 4) +
                        (long)(int)local_778.f.values.values[1]) *
                        (long)*(int *)&this_01[10].values.alloc.memoryResource +
                       (long)(int)local_778.f.values.values[0]) * 4);
            auVar62._4_4_ = uVar257;
            auVar62._0_4_ = uVar257;
            auVar62._8_4_ = uVar257;
            auVar62._12_4_ = uVar257;
            auVar132._16_48_ = auVar130._16_48_;
            auVar132._0_16_ = vmulps_avx512vl(auVar324._0_16_,auVar62);
            in_ZmmResult = auVar132;
            if (0.0 < auVar132._0_4_) {
              local_5a8._0_4_ = fVar140;
              auVar118 = vsubss_avx512f(ZEXT416((uint)fVar140),auVar218);
              in_ZmmResult._16_48_ = auVar132._16_48_;
              in_ZmmResult._0_16_ = auVar218;
              local_8c8._0_4_ = in_ZMM4._0_4_;
              local_3e8._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
              local_3e8._8_4_ = auVar132._8_4_ ^ 0x80000000;
              local_3e8._12_4_ = auVar132._12_4_ ^ 0x80000000;
              unique0x1000f9b5 = auVar218;
              local_8b8 = auVar132._0_16_;
              fVar139 = expf(auVar118._0_4_ * -auVar132._0_4_);
              fVar139 = 1.0 - fVar139;
              if ((float)local_8c8._0_4_ < fVar139) {
                auVar239 = ZEXT1664(stack0xfffffffffffff728);
                auVar63._8_4_ = 0x80000000;
                auVar63._0_8_ = 0x8000000080000000;
                auVar63._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(local_8b8,auVar63);
                _local_3f8 = in_ZmmResult._0_16_;
                do {
                  register0x00001240 = auVar239._0_16_;
                  fVar139 = logf(1.0 - (float)local_8c8._0_4_);
                  fVar139 = local_8e8._16_4_ - fVar139 / (float)local_8b8._0_4_;
                  in_ZMM4 = ZEXT464((uint)fVar139);
                  if ((float)local_848._0_4_ <= fVar139) {
                    local_650[0]._0_1_ = false;
                    local_650[1]._0_4_ = 1.0;
                    local_650[1]._4_4_ = 1.0;
                    local_650[2]._0_4_ = 1.0;
                    local_650[2]._4_4_ = 1.0;
                    Li::anon_class_128_16_8a10e554::operator()
                              ((anon_class_128_16_8a10e554 *)local_828,(MediumSample *)local_6e8);
                    goto LAB_0044a67a;
                  }
                  local_908._0_4_ = fVar139;
                  auVar118 = vinsertps_avx(ZEXT416((uint)(fVar139 * (float)local_738._0_4_ +
                                                         (float)local_4d8._0_4_)),
                                           ZEXT416((uint)(fVar139 * (float)local_5b8._0_4_ +
                                                         (float)local_408._0_4_)),0x10);
                  local_718.f.values.values[2] =
                       fVar139 * (float)local_7a8._0_4_ + (float)local_798._0_4_;
                  local_718.f.values.values._0_8_ = vmovlps_avx(auVar118);
                  fVar139 = fVar139 - local_8e8._16_4_;
                  auVar151._0_4_ = fVar139 * (float)local_3f8._0_4_;
                  auVar151._4_4_ = fVar139 * (float)local_3f8._4_4_;
                  auVar151._8_4_ = fVar139 * fStack_3f0;
                  auVar151._12_4_ = fVar139 * fStack_3ec;
                  auVar64._8_4_ = 0x3fb8aa3b;
                  auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar64._12_4_ = 0x3fb8aa3b;
                  auVar239._16_48_ = in_ZmmResult._16_48_;
                  auVar118 = vmulps_avx512vl(auVar151,auVar64);
                  _local_8c8 = vroundps_avx(auVar118,9);
                  auVar118 = vsubps_avx(auVar118,_local_8c8);
                  auVar255 = ZEXT856(auVar118._8_8_);
                  auVar222._8_4_ = 0x3da1d5b6;
                  auVar222._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar222._12_4_ = 0x3da1d5b6;
                  auVar65._8_4_ = 0x3e658299;
                  auVar65._0_8_ = 0x3e6582993e658299;
                  auVar65._12_4_ = 0x3e658299;
                  auVar119 = vfmadd213ps_avx512vl(auVar222,auVar118,auVar65);
                  auVar66._8_4_ = 0x3f3263b7;
                  auVar66._0_8_ = 0x3f3263b73f3263b7;
                  auVar66._12_4_ = 0x3f3263b7;
                  auVar119 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar66);
                  auVar67._8_4_ = 0x3f7ff3bf;
                  auVar67._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar67._12_4_ = 0x3f7ff3bf;
                  register0x000008fc = vfmadd213ps_avx512vl(auVar119,auVar118,auVar67);
                  auVar208 = ZEXT856(local_8e8._24_8_);
                  SVar347 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_718,
                                       local_8f0);
                  auVar247._0_8_ = SVar347.values.values._8_8_;
                  auVar247._8_56_ = auVar208;
                  auVar174._0_8_ = SVar347.values.values._0_8_;
                  auVar174._8_56_ = auVar255;
                  local_788 = auVar174._0_16_;
                  local_728 = auVar247._0_16_;
                  SVar347 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_01,(Point3f *)&local_718,
                                       local_8f0);
                  auVar248._0_8_ = SVar347.values.values._8_8_;
                  auVar248._8_56_ = auVar208;
                  auVar175._0_8_ = SVar347.values.values._0_8_;
                  auVar175._8_56_ = auVar255;
                  auVar277._0_4_ = (int)(float)local_8c8._0_4_;
                  auVar277._4_4_ = (int)(float)local_8c8._4_4_;
                  auVar277._8_4_ = (int)(float)uStack_8c0;
                  auVar277._12_4_ = (int)uStack_8c0._4_4_;
                  fVar139 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
                  aIStack_6d8[1].low = (ray->super_Ray).time;
                  auVar118 = vunpcklpd_avx(local_788,local_728);
                  aIStack_6d8[9].low = auVar118._0_4_ * (float)local_418._0_4_;
                  aIStack_6d8[9].high = auVar118._4_4_ * (float)local_418._4_4_;
                  aIStack_6d8[10].low = auVar118._8_4_ * fStack_410;
                  aIStack_6d8[10].high = auVar118._12_4_ * fStack_40c;
                  in_ZMM4 = ZEXT1664(CONCAT412(aIStack_6d8[10].high,
                                               CONCAT48(aIStack_6d8[10].low,
                                                        CONCAT44(aIStack_6d8[9].high,
                                                                 aIStack_6d8[9].low))));
                  aIStack_6d8[0xb].low = auVar118._0_4_ * local_338;
                  aIStack_6d8[0xb].high = auVar118._4_4_ * fStack_334;
                  aIStack_6d8[0xc].low = auVar118._8_4_ * fStack_330;
                  aIStack_6d8[0xc].high = auVar118._12_4_ * fStack_32c;
                  auVar68._8_4_ = 0xffffffe1;
                  auVar68._0_8_ = 0xffffffe1ffffffe1;
                  auVar68._12_4_ = 0xffffffe1;
                  uVar97 = vpcmpgtd_avx512vl(auVar277,auVar68);
                  uVar97 = uVar97 & 0xf;
                  auVar69._8_4_ = 0x1e;
                  auVar69._0_8_ = 0x1e0000001e;
                  auVar69._12_4_ = 0x1e;
                  uVar101 = vpcmpgtd_avx512vl(auVar277,auVar69);
                  uVar101 = uVar101 & 0xf;
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[7].values.ptr +
                                                                     4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[7].values.ptr));
                  auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           (float)this_01[7].lambda_max)),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[7].lambda_min));
                  auVar294 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.alloc
                                                                             .memoryResource + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416(*(uint *)&this_01[6].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(local_718.f.values.values[1] *
                                                           *(float *)((long)&this_01[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_718.f.values.values[0]),
                                             ZEXT416((uint)this_01[6].values.nAlloc));
                  auVar267 = vfmadd231ss_fma(auVar118,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[7].values.nAlloc));
                  auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[7].values.alloc.
                                                               memoryResource));
                  auVar116 = vfmadd231ss_fma(auVar116,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416((uint)this_01[6].values.nStored));
                  auVar294 = vfmadd231ss_fma(auVar294,ZEXT416((uint)local_718.f.values.values[2]),
                                             ZEXT416(*(uint *)&this_01[6].values.ptr));
                  auVar118 = vpslld_avx(auVar277,0x17);
                  auVar118 = vpaddd_avx(auVar118,stack0xfffffffffffff728);
                  fVar140 = auVar267._0_4_ + *(float *)((long)&this_01[7].values.nAlloc + 4);
                  fVar256 = auVar119._0_4_ +
                            *(float *)((long)&this_01[7].values.alloc.memoryResource + 4);
                  fVar289 = auVar116._0_4_ + *(float *)((long)&this_01[6].values.nStored + 4);
                  fVar112 = auVar294._0_4_ + *(float *)((long)&this_01[6].values.ptr + 4);
                  bVar27 = fVar140 == 1.0;
                  auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar113 = (bool)((byte)uVar101 & 1);
                  auVar121._0_4_ =
                       (uint)bVar113 * auVar119._0_4_ |
                       (uint)!bVar113 * (uint)((byte)uVar97 & 1) * auVar118._0_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 1) & 1);
                  auVar121._4_4_ =
                       (uint)bVar113 * auVar119._4_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 1) & 1) * auVar118._4_4_;
                  bVar113 = (bool)((byte)(uVar101 >> 2) & 1);
                  auVar121._8_4_ =
                       (uint)bVar113 * auVar119._8_4_ |
                       (uint)!bVar113 * (uint)((byte)(uVar97 >> 2) & 1) * auVar118._8_4_;
                  bVar113 = SUB81(uVar101 >> 3,0);
                  auVar121._12_4_ =
                       (uint)bVar113 * auVar119._12_4_ |
                       (uint)!bVar113 * (uint)(byte)(uVar97 >> 3) * auVar118._12_4_;
                  auVar116 = vshufpd_avx(auVar121,auVar121,1);
                  iVar114 = (uint)bVar27 * (int)fVar256 + (uint)!bVar27 * (int)(fVar256 / fVar140);
                  fVar256 = fVar289 / fVar140;
                  iVar115 = (uint)bVar27 * (int)fVar112 + (uint)!bVar27 * (int)(fVar112 / fVar140);
                  auVar321._4_4_ = iVar115;
                  auVar321._0_4_ = iVar115;
                  auVar321._8_4_ = iVar115;
                  auVar321._12_4_ = iVar115;
                  auVar133._16_48_ = auVar239._16_48_;
                  auVar133._0_16_ = ZEXT416((uint)fVar256);
                  in_ZmmResult._4_60_ = auVar133._4_60_;
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar27 * (int)fVar289 + (uint)!bVar27 * (int)fVar256);
                  uVar101._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
                  uVar101._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
                  auVar316._8_8_ = 0;
                  auVar316._0_8_ = uVar101;
                  aIStack_6d8[5].low = 0.0;
                  auVar305._4_4_ = in_ZmmResult._0_4_;
                  auVar305._0_4_ = in_ZmmResult._0_4_;
                  auVar305._8_4_ = in_ZmmResult._0_4_;
                  auVar305._12_4_ = in_ZmmResult._0_4_;
                  auVar119 = vmovlhps_avx(auVar321,auVar305);
                  auVar322._4_4_ = iVar114;
                  auVar322._0_4_ = iVar114;
                  auVar322._8_4_ = iVar114;
                  auVar322._12_4_ = iVar114;
                  auVar329._0_4_ = (float)(undefined4)uVar101 * (float)(undefined4)uVar101;
                  auVar329._4_4_ = (float)uVar101._4_4_ * (float)uVar101._4_4_;
                  auVar329._8_8_ = 0;
                  auVar118 = vmovshdup_avx(auVar329);
                  auVar118 = vfmadd231ss_fma(auVar118,auVar316,auVar316);
                  auVar317._0_8_ = uVar101 ^ 0x8000000080000000;
                  auVar317._8_4_ = 0x80000000;
                  auVar317._12_4_ = 0x80000000;
                  auVar118 = vfmadd231ss_fma(auVar118,ZEXT416((uint)fVar139),ZEXT416((uint)fVar139))
                  ;
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  auVar294 = vmovlhps_avx(auVar175._0_16_,auVar248._0_16_);
                  auVar116 = vunpcklpd_avx(auVar121,auVar116);
                  aIStack_6d8[2].high = auVar118._0_4_;
                  auVar330._4_4_ = aIStack_6d8[2].high;
                  auVar330._0_4_ = aIStack_6d8[2].high;
                  auVar330._8_4_ = aIStack_6d8[2].high;
                  auVar330._12_4_ = aIStack_6d8[2].high;
                  aIStack_6d8[2].high = -fVar139 / aIStack_6d8[2].high;
                  auVar118 = vdivps_avx(auVar317,auVar330);
                  aIStack_6d8[3].low = 0.0;
                  aIStack_6d8[3].high = 0.0;
                  aIStack_6d8[4].low = 0.0;
                  aIStack_6d8[4].high = 0.0;
                  aIStack_6d8[0xd] = local_8b8._0_8_;
                  uStack_668._0_4_ = local_8b8._8_4_;
                  uStack_668._4_4_ = local_8b8._12_4_;
                  local_650[0]._0_1_ = true;
                  local_6e8._0_4_ = auVar119._0_4_;
                  local_6e8._4_4_ = auVar119._4_4_;
                  IStack_6e0.low = auVar119._8_4_;
                  IStack_6e0.high = auVar119._12_4_;
                  uVar207 = vmovlps_avx(auVar322);
                  aIStack_6d8[0].low = (float)uVar207;
                  aIStack_6d8[0].high = (float)((ulong)uVar207 >> 0x20);
                  uVar207 = vmovlps_avx(auVar118);
                  aIStack_6d8[1].high = (float)uVar207;
                  aIStack_6d8[2].low = (float)((ulong)uVar207 >> 0x20);
                  aIStack_6d8[6].low = 0.0;
                  aIStack_6d8[6].high = 0.0;
                  aIStack_6d8[7].low = SUB84(this_01,0);
                  aIStack_6d8[8].low = SUB84(puVar1,0);
                  uStack_660 = auVar294._0_4_;
                  uStack_65c._0_4_ = auVar294._4_4_;
                  stack0xfffffffffffff9a8 = auVar294._8_8_;
                  local_650[1]._0_4_ = auVar116._0_4_;
                  local_650[1]._4_4_ = auVar116._4_4_;
                  local_650[2]._0_4_ = auVar116._8_4_;
                  local_650[2]._4_4_ = auVar116._12_4_;
                  aIStack_6d8[7].high = fVar210;
                  aIStack_6d8[8].high = fVar206;
                  bVar113 = Li::anon_class_128_16_8a10e554::operator()
                                      ((anon_class_128_16_8a10e554 *)local_828,
                                       (MediumSample *)local_6e8);
                  if (!bVar113) goto LAB_0044a67a;
                  uVar96 = (uint)SUB84(local_4b8._0_8_,4) >> 0xd ^
                           (uint)((ulong)local_4b8._0_8_ >> 0x1b);
                  bVar100 = SUB81(local_4b8._0_8_,7) >> 3;
                  auVar118 = vcvtusi2ss_avx512f(auVar324._0_16_,
                                                uVar96 >> bVar100 | uVar96 << 0x20 - bVar100);
                  auVar118 = vminss_avx(ZEXT416((uint)(auVar118._0_4_ * 2.3283064e-10)),
                                        ZEXT416(0x3f7fffff));
                  local_8c8._0_4_ = auVar118._0_4_;
                  local_4b8._0_8_ = local_4b8._0_8_ * 0x5851f42d4c957f2d + local_4b8._8_8_;
                  fVar139 = expf(((float)local_5a8._0_4_ - (float)local_908._0_4_) *
                                 (float)local_3e8._0_4_);
                  auVar239 = ZEXT464((uint)local_908._0_4_);
                  fVar139 = 1.0 - fVar139;
                } while ((float)local_8c8._0_4_ < fVar139);
              }
              auVar324 = ZEXT1664(local_348);
              auVar118 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                    ZEXT416((uint)(((float)local_8c8._0_4_ - fVar139) /
                                                  (1.0 - fVar139))));
              in_ZMM4 = ZEXT1664(auVar118);
              fVar140 = (float)local_5a8._0_4_;
              fVar139 = (float)local_848._0_4_;
            }
            if (fVar139 < fVar140) break;
            fVar256 = (float)((int)local_778.f.values.values[lVar107] +
                             *(int *)(local_3a8 + lVar107 * 4));
            local_778.f.values.values[lVar107] = fVar256;
            if (fVar256 == (&local_458.eta)[lVar107]) break;
            auVar130._16_48_ = in_ZmmResult._16_48_;
            auVar218 = ZEXT416((uint)fVar140);
            auVar130._0_16_ = auVar218;
            (&local_538.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low)[lVar107] =
                 fVar140 + *(float *)(local_598 + lVar107 * 4);
          }
        }
      }
LAB_0044a67a:
      bVar113 = true;
      this_02 = local_880;
      if ((local_90a & 1U) == 0) goto LAB_0044a68a;
    }
LAB_0044bdc0:
    if (bVar113) {
      return (array<float,_4>)(array<float,_4>)local_838;
    }
  } while( true );
}

Assistant:

SampledSpectrum VolPathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                      SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                      VisibleSurface *visibleSurface) const {
    // Declare state variables for volumetric path
    // NOTE: beta means something different here...
    SampledSpectrum L(0.f), beta(1.f), pdfUni(1.f), pdfNEE(1.f);
    bool specularBounce = false, anyNonSpecularBounces = false;
    Float etaScale = 1;
    pstd::optional<SurfaceInteraction> prevSurfaceIntr;
    pstd::optional<MediumInteraction> prevMediumIntr;
    int depth = 0;

    while (true) {
        // Sample segment of volumetric scattering path
        PBRT_DBG("%s\n", StringPrintf("Path tracer depth %d, current L = %s, beta = %s\n",
                                      depth, L, beta)
                             .c_str());
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        bool scattered = false, terminated = false;
        if (ray.medium) {
            // Sample the participating medium
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(sampler.Get1D()), Hash(sampler.Get1D()));
            ray.medium.SampleTmaj(
                ray, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Handle medium scattering event for ray
                    if (!beta) {
                        terminated = true;
                        return false;
                    }
                    rescale(beta, pdfUni, pdfNEE);
                    if (!mediumSample.intr) {
                        // Update _beta_ and _pdfUni_ for ray that escaped the medium
                        // FIXME: review this, esp the pdf...
                        beta *= mediumSample.Tmaj;
                        pdfUni *= mediumSample.Tmaj;
                        return false;
                    }
                    ++volumeInteractions;
                    const MediumInteraction &intr = *mediumSample.intr;
                    const SampledSpectrum &sigma_a = intr.sigma_a,
                                          &sigma_s = intr.sigma_s;
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    // Add emission from medium scattering event
                    if (depth < maxDepth)
                        L += SafeDiv(
                            beta * intr.Le * sigma_a,
                            (intr.sigma_maj[0] * pdfUni.Average()) * lambda.PDF());

                    // Compute medium event probabilities for interaction
                    Float pAbsorb = sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    CHECK_GE(1 - pAbsorb - pScatter, -1e-6);
                    // Sample medium scattering event type and update path
                    Float um = rng.Uniform<Float>();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption along ray path
                        // beta *= Tmaj * sigma_a;
                        // pdfUni *= Tmaj * sigma_a;
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering along ray path
                        if (depth++ >= maxDepth) {
                            terminated = true;
                            return false;
                        }
                        beta *= Tmaj * sigma_s;
                        pdfUni *= Tmaj * sigma_s;
                        // Sample direct lighting at volume scattering event
                        L += SafeDiv(
                            SampleLd(intr, nullptr, lambda, sampler, beta, pdfUni),
                            lambda.PDF());

                        // Sample indirect lighting at volume scattering event
                        PhaseFunctionSample ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps) {
                            terminated = true;
                            return false;
                        }
                        // Update ray path state for indirect volume scattering
                        beta *= ps.p;
                        pdfNEE = pdfUni;
                        pdfUni *= ps.pdf;
                        prevMediumIntr = intr;
                        prevSurfaceIntr.reset();
                        scattered = true;
                        ray = intr.SpawnRay(ps.wi);
                        specularBounce = false;
                        anyNonSpecularBounces = true;

                        return false;

                    } else {
                        // Handle null scattering along ray path
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= Tmaj * sigma_n;
                        pdfUni *= Tmaj * sigma_n;
                        pdfNEE *= Tmaj * intr.sigma_maj;
                        rescale(beta, pdfUni, pdfNEE);
                        return true;
                    }
                });
        }
        if (terminated)
            return L;
        if (scattered)
            continue;
        // Handle scattering at point on surface for volumetric path tracer
        ++surfaceInteractions;
        if (depth > 0)
            CHECK(prevSurfaceIntr.has_value() ^ prevMediumIntr.has_value());
        // Add emitted light at volume path vertex or from the environment
        if (!si) {
            // Accumulate contributions from infinite light sources
            for (const auto &light : infiniteLights) {
                SampledSpectrum Le = light.Le(ray, lambda);
                if (Le) {
                    if (depth == 0 || specularBounce)
                        L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
                    else {
                        // Add infinite light contribution using both PDFs with MIS
                        LightSampleContext prevIntrContext;
                        if (prevSurfaceIntr)
                            prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                        else
                            prevIntrContext = LightSampleContext(*prevMediumIntr);
                        Float lightPDF = lightSampler.PDF(prevIntrContext, light) *
                                         light.PDF_Li(prevIntrContext, ray.d,
                                                      LightSamplingMode::WithMIS);
                        pdfNEE *= lightPDF;
                        L += SafeDiv(beta * Le,
                                     (pdfUni + pdfNEE).Average() * lambda.PDF());
                    }
                }
            }

            break;
        }
        SurfaceInteraction &isect = si->intr;
        SampledSpectrum Le = isect.Le(-ray.d, lambda);
        if (Le) {
            // Add contribution of emission from intersected surface
            if (depth == 0 || specularBounce)
                L += SafeDiv(beta * Le, pdfUni.Average() * lambda.PDF());
            else {
                // Add surface light contribution using both PDFs with MIS
                LightHandle areaLight(isect.areaLight);
                LightSampleContext prevIntrContext;
                if (prevSurfaceIntr)
                    prevIntrContext = LightSampleContext(*prevSurfaceIntr);
                else
                    prevIntrContext = LightSampleContext(*prevMediumIntr);
                Float lightPDF =
                    lightSampler.PDF(prevIntrContext, areaLight) *
                    areaLight.PDF_Li(prevIntrContext, ray.d, LightSamplingMode::WithMIS);
                pdfNEE *= lightPDF;
                L += SafeDiv(beta * Le, (pdfUni + pdfNEE).Average() * lambda.PDF());
            }
        }

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        prevSurfaceIntr = isect;
        prevMediumIntr.reset();
        // Terminate path if maximum depth reached
        if (depth++ >= maxDepth)
            return L;

        // Possibly regularize BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }
        ++totalBSDFs;

        // Sample illumination from lights to find attenuated path contribution
        if (bsdf.IsNonSpecular()) {
            L += SafeDiv(SampleLd(isect, &bsdf, lambda, sampler, beta, pdfUni),
                         lambda.PDF());
            DCHECK(IsInf(L.y(lambda)) == false);
        }

        // Sample BSDF to get new volumetric path direction
        Vector3f wo = -ray.d;
        Float u = sampler.Get1D();
        BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
        if (!bs)
            break;
        // Update _beta_ and PDFs for BSDF scattering
        beta *= bs.f * AbsDot(bs.wi, isect.shading.n);
        pdfNEE = pdfUni;
        if (bsdf.SampledPDFIsProportional()) {
            Float pdf = bsdf.PDF(wo, bs.wi);
            beta *= pdf / bs.pdf;
            pdfUni *= pdf;
        } else
            pdfUni *= bs.pdf;
        rescale(beta, pdfUni, pdfNEE);

        PBRT_DBG("%s\n", StringPrintf("Sampled BSDF, f = %s, pdf = %f -> beta = %s", bs.f,
                                      bs.pdf, beta)
                             .c_str());
        DCHECK(IsInf(beta.y(lambda)) == false);
        specularBounce = bs.IsSpecular();
        anyNonSpecularBounces |= !bs.IsSpecular();
        if (bs.IsTransmission())
            etaScale *= Sqr(bsdf.eta);
        ray = isect.SpawnRay(ray, bsdf, bs.wi, bs.flags);

        // Account for attenuated subsurface scattering, if applicable
        BSSRDFHandle bssrdf = isect.GetBSSRDF(ray, lambda, camera, scratchBuffer);
        if (bssrdf && bs.IsTransmission()) {
            // Sample BSSRDF probe segment to find exit point
            BSSRDFProbeSegment probeSeg = bssrdf.Sample(sampler.Get1D(), sampler.Get2D());
            if (!probeSeg)
                break;

            // Sample random intersection along BSSRDF probe segment
            uint64_t seed = MixBits(FloatToBits(sampler.Get1D()));
            WeightedReservoirSampler<SubsurfaceInteraction> interactionSampler(seed);
            // Intersect BSSRDF sampling ray against the scene geometry
            Interaction base(probeSeg.p0, probeSeg.time, (MediumHandle) nullptr);
            while (true) {
                Ray r = base.SpawnRayTo(probeSeg.p1);
                if (r.d == Vector3f(0, 0, 0))
                    break;
                pstd::optional<ShapeIntersection> si = Intersect(r, 1);
                if (!si)
                    break;
                base = si->intr;
                if (si->intr.material == isect.material)
                    interactionSampler.Add(SubsurfaceInteraction(si->intr), 1.f);
            }

            if (!interactionSampler.HasSample())
                break;

            // Convert probe intersection to _BSSRDFSample_ and update _beta_
            SubsurfaceInteraction ssi = interactionSampler.GetSample();
            BSSRDFSample bssrdfSample =
                bssrdf.ProbeIntersectionToSample(ssi, scratchBuffer);
            if (!bssrdfSample.S || bssrdfSample.pdf == 0)
                break;
            // Can ignore path pdf here as well since bssrdfSample.pdf
            // is non-spectral.
            beta *= bssrdfSample.S * interactionSampler.WeightSum() / bssrdfSample.pdf;
            SurfaceInteraction pi = ssi;
            BSDF &bsdf = bssrdfSample.bsdf;
            pi.wo = bssrdfSample.wo;

            // Possibly regularize subsurface BSDF and update _prevSurfaceIntr_
            anyNonSpecularBounces = true;
            if (regularize) {
                ++regularizedBSDFs;
                bsdf.Regularize();
            } else
                ++totalBSDFs;
            prevSurfaceIntr = pi;
            CHECK(!prevMediumIntr.has_value());

            // Account for attenuated direct subsurface scattering
            L +=
                SafeDiv(SampleLd(pi, &bsdf, lambda, sampler, beta, pdfUni), lambda.PDF());

            // Sample ray for indirect subsurface scattering
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(pi.wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, pi.shading.n);
            pdfNEE = pdfUni;
            pdfUni *= bs.pdf;
            // don't increment depth this time...
            DCHECK(!IsInf(beta.y(lambda)));
            specularBounce = bs.IsSpecular();
            ray = RayDifferential(pi.SpawnRay(bs.wi));
        }

        // Possibly terminate volumetric path with Russian roulette
        if (!beta)
            break;
        SampledSpectrum rrBeta = beta * etaScale / pdfUni.Average();
        PBRT_DBG("%s\n",
                 StringPrintf("etaScale %f -> rrBeta %s", etaScale, rrBeta).c_str());
        if (rrBeta.MaxComponentValue() < rrThreshold && depth > 1) {
            Float q = std::max<Float>(0, 1 - rrBeta.MaxComponentValue());
            if (sampler.Get1D() < q)
                break;
            pdfUni *= 1 - q;
            pdfNEE *= 1 - q;
        }
    }
    return L;
}